

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx::CurveNvIntersectorK<8,4>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  float *pfVar2;
  undefined1 (*pauVar3) [28];
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Primitive PVar17;
  uint uVar18;
  uint uVar19;
  undefined4 uVar20;
  Geometry *pGVar21;
  RTCFilterFunctionN p_Var22;
  long lVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  long lVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [28];
  undefined1 auVar125 [28];
  undefined1 auVar126 [28];
  undefined1 auVar127 [28];
  undefined1 auVar128 [28];
  undefined1 auVar129 [28];
  undefined1 auVar130 [28];
  undefined1 auVar131 [24];
  uint uVar132;
  uint uVar133;
  uint uVar134;
  ulong uVar135;
  long lVar136;
  Primitive *pPVar137;
  undefined1 auVar138 [8];
  LinearSpace3fa *pLVar139;
  ulong uVar140;
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar159;
  float fVar160;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar161;
  float fVar165;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  float fVar166;
  float fVar167;
  float fVar183;
  float fVar185;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar184;
  float fVar186;
  float fVar187;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar205;
  undefined1 auVar203 [32];
  float fVar206;
  undefined1 auVar204 [32];
  float fVar207;
  float fVar222;
  undefined1 auVar208 [16];
  undefined1 auVar210 [16];
  float fVar220;
  float fVar221;
  float fVar224;
  float fVar226;
  float fVar228;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar209 [16];
  undefined1 auVar214 [32];
  float fVar223;
  float fVar225;
  float fVar227;
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  float fVar229;
  float fVar240;
  float fVar242;
  float fVar244;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar230;
  float fVar231;
  undefined1 auVar234 [16];
  float fVar241;
  float fVar243;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar249;
  float fVar257;
  float fVar258;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar252 [32];
  float fVar259;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar263;
  float fVar272;
  float fVar273;
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  float fVar274;
  float fVar278;
  float fVar279;
  undefined1 auVar271 [32];
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  float fVar295;
  float fVar296;
  float fVar303;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar310;
  float fVar312;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  float fVar308;
  float fVar309;
  float fVar311;
  float fVar313;
  undefined1 auVar300 [32];
  float fVar304;
  undefined1 auVar301 [32];
  undefined1 auVar302 [64];
  float fVar314;
  float fVar315;
  float fVar323;
  float fVar325;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  float fVar324;
  float fVar326;
  undefined1 auVar322 [64];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  float fVar339;
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [64];
  float in_register_0000151c;
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  float fVar352;
  float fVar353;
  float fVar354;
  float in_register_0000159c;
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar355 [16];
  float in_register_000015dc;
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined1 local_810 [16];
  LinearSpace3fa *local_7f8;
  Precalculations *local_7f0;
  Primitive *local_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [16];
  undefined1 local_790 [8];
  undefined8 uStack_788;
  undefined1 local_780 [8];
  undefined8 uStack_778;
  RTCFilterFunctionNArguments local_770;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 auStack_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 auStack_6b0 [8];
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  undefined1 (*local_670) [16];
  RayHitK<4> *local_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [8];
  undefined8 uStack_638;
  undefined1 auStack_630 [8];
  float fStack_628;
  undefined1 local_620 [48];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [2] [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  RTCHitN local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined4 local_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [8];
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [8];
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  uint local_280;
  uint local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [32];
  
  PVar17 = prim[1];
  uVar140 = (ulong)(byte)PVar17;
  lVar136 = uVar140 * 5;
  lVar118 = uVar140 * 0x19;
  auVar234 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar234 = vinsertps_avx(auVar234,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar195 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar195 = vinsertps_avx(auVar195,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar207 = *(float *)(prim + lVar118 + 0x12);
  auVar234 = vsubps_avx(auVar234,*(undefined1 (*) [16])(prim + lVar118 + 6));
  auVar168._0_4_ = fVar207 * auVar234._0_4_;
  auVar168._4_4_ = fVar207 * auVar234._4_4_;
  auVar168._8_4_ = fVar207 * auVar234._8_4_;
  auVar168._12_4_ = fVar207 * auVar234._12_4_;
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 4 + 6)));
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 4 + 10)));
  auVar250._0_4_ = fVar207 * auVar195._0_4_;
  auVar250._4_4_ = fVar207 * auVar195._4_4_;
  auVar250._8_4_ = fVar207 * auVar195._8_4_;
  auVar250._12_4_ = fVar207 * auVar195._12_4_;
  auVar150._16_16_ = auVar210;
  auVar150._0_16_ = auVar234;
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar136 + 6)));
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar136 + 10)));
  auVar200._16_16_ = auVar195;
  auVar200._0_16_ = auVar234;
  auVar25 = vcvtdq2ps_avx(auVar200);
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 6 + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 6 + 10)));
  auVar211._16_16_ = auVar195;
  auVar211._0_16_ = auVar234;
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0xb + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0xb + 10)));
  auVar26 = vcvtdq2ps_avx(auVar211);
  auVar212._16_16_ = auVar195;
  auVar212._0_16_ = auVar234;
  auVar27 = vcvtdq2ps_avx(auVar212);
  uVar135 = (ulong)((uint)(byte)PVar17 * 0xc);
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 + 10)));
  auVar266._16_16_ = auVar195;
  auVar266._0_16_ = auVar234;
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 + uVar140 + 6)));
  auVar28 = vcvtdq2ps_avx(auVar266);
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 + uVar140 + 10)));
  auVar280._16_16_ = auVar195;
  auVar280._0_16_ = auVar234;
  lVar23 = uVar140 * 9;
  uVar135 = (ulong)(uint)((int)lVar23 * 2);
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar280);
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 + 10)));
  auVar281._16_16_ = auVar195;
  auVar281._0_16_ = auVar234;
  auVar30 = vcvtdq2ps_avx(auVar281);
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 + uVar140 + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 + uVar140 + 10)));
  auVar316._16_16_ = auVar195;
  auVar316._0_16_ = auVar234;
  uVar135 = (ulong)(uint)((int)lVar136 << 2);
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 + 6)));
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 + 10)));
  auVar31 = vcvtdq2ps_avx(auVar316);
  auVar331._16_16_ = auVar195;
  auVar331._0_16_ = auVar234;
  auVar32 = vcvtdq2ps_avx(auVar331);
  auVar234 = vshufps_avx(auVar250,auVar250,0);
  auVar195 = vshufps_avx(auVar250,auVar250,0x55);
  auVar210 = vshufps_avx(auVar250,auVar250,0xaa);
  fVar207 = auVar210._0_4_;
  fVar220 = auVar210._4_4_;
  fVar221 = auVar210._8_4_;
  fVar222 = auVar210._12_4_;
  fVar224 = auVar195._0_4_;
  fVar226 = auVar195._4_4_;
  fVar228 = auVar195._8_4_;
  fVar229 = auVar195._12_4_;
  fVar240 = auVar234._0_4_;
  fVar242 = auVar234._4_4_;
  fVar244 = auVar234._8_4_;
  fVar246 = auVar234._12_4_;
  auVar340._0_4_ = fVar240 * auVar150._0_4_ + fVar224 * auVar25._0_4_ + fVar207 * auVar26._0_4_;
  auVar340._4_4_ = fVar242 * auVar150._4_4_ + fVar226 * auVar25._4_4_ + fVar220 * auVar26._4_4_;
  auVar340._8_4_ = fVar244 * auVar150._8_4_ + fVar228 * auVar25._8_4_ + fVar221 * auVar26._8_4_;
  auVar340._12_4_ = fVar246 * auVar150._12_4_ + fVar229 * auVar25._12_4_ + fVar222 * auVar26._12_4_;
  auVar340._16_4_ = fVar240 * auVar150._16_4_ + fVar224 * auVar25._16_4_ + fVar207 * auVar26._16_4_;
  auVar340._20_4_ = fVar242 * auVar150._20_4_ + fVar226 * auVar25._20_4_ + fVar220 * auVar26._20_4_;
  auVar340._24_4_ = fVar244 * auVar150._24_4_ + fVar228 * auVar25._24_4_ + fVar221 * auVar26._24_4_;
  auVar340._28_4_ = fVar229 + in_register_000015dc + in_register_0000151c;
  auVar335._0_4_ = fVar240 * auVar27._0_4_ + fVar224 * auVar28._0_4_ + auVar29._0_4_ * fVar207;
  auVar335._4_4_ = fVar242 * auVar27._4_4_ + fVar226 * auVar28._4_4_ + auVar29._4_4_ * fVar220;
  auVar335._8_4_ = fVar244 * auVar27._8_4_ + fVar228 * auVar28._8_4_ + auVar29._8_4_ * fVar221;
  auVar335._12_4_ = fVar246 * auVar27._12_4_ + fVar229 * auVar28._12_4_ + auVar29._12_4_ * fVar222;
  auVar335._16_4_ = fVar240 * auVar27._16_4_ + fVar224 * auVar28._16_4_ + auVar29._16_4_ * fVar207;
  auVar335._20_4_ = fVar242 * auVar27._20_4_ + fVar226 * auVar28._20_4_ + auVar29._20_4_ * fVar220;
  auVar335._24_4_ = fVar244 * auVar27._24_4_ + fVar228 * auVar28._24_4_ + auVar29._24_4_ * fVar221;
  auVar335._28_4_ = fVar229 + in_register_000015dc + in_register_0000159c;
  auVar252._0_4_ = fVar240 * auVar30._0_4_ + fVar224 * auVar31._0_4_ + auVar32._0_4_ * fVar207;
  auVar252._4_4_ = fVar242 * auVar30._4_4_ + fVar226 * auVar31._4_4_ + auVar32._4_4_ * fVar220;
  auVar252._8_4_ = fVar244 * auVar30._8_4_ + fVar228 * auVar31._8_4_ + auVar32._8_4_ * fVar221;
  auVar252._12_4_ = fVar246 * auVar30._12_4_ + fVar229 * auVar31._12_4_ + auVar32._12_4_ * fVar222;
  auVar252._16_4_ = fVar240 * auVar30._16_4_ + fVar224 * auVar31._16_4_ + auVar32._16_4_ * fVar207;
  auVar252._20_4_ = fVar242 * auVar30._20_4_ + fVar226 * auVar31._20_4_ + auVar32._20_4_ * fVar220;
  auVar252._24_4_ = fVar244 * auVar30._24_4_ + fVar228 * auVar31._24_4_ + auVar32._24_4_ * fVar221;
  auVar252._28_4_ = fVar246 + fVar229 + fVar222;
  auVar234 = vshufps_avx(auVar168,auVar168,0);
  auVar195 = vshufps_avx(auVar168,auVar168,0x55);
  auVar210 = vshufps_avx(auVar168,auVar168,0xaa);
  fVar220 = auVar210._0_4_;
  fVar221 = auVar210._4_4_;
  fVar222 = auVar210._8_4_;
  fVar224 = auVar210._12_4_;
  fVar242 = auVar195._0_4_;
  fVar244 = auVar195._4_4_;
  fVar246 = auVar195._8_4_;
  fVar247 = auVar195._12_4_;
  fVar226 = auVar234._0_4_;
  fVar228 = auVar234._4_4_;
  fVar229 = auVar234._8_4_;
  fVar240 = auVar234._12_4_;
  fVar207 = auVar150._28_4_;
  auVar267._0_4_ = fVar226 * auVar150._0_4_ + fVar242 * auVar25._0_4_ + fVar220 * auVar26._0_4_;
  auVar267._4_4_ = fVar228 * auVar150._4_4_ + fVar244 * auVar25._4_4_ + fVar221 * auVar26._4_4_;
  auVar267._8_4_ = fVar229 * auVar150._8_4_ + fVar246 * auVar25._8_4_ + fVar222 * auVar26._8_4_;
  auVar267._12_4_ = fVar240 * auVar150._12_4_ + fVar247 * auVar25._12_4_ + fVar224 * auVar26._12_4_;
  auVar267._16_4_ = fVar226 * auVar150._16_4_ + fVar242 * auVar25._16_4_ + fVar220 * auVar26._16_4_;
  auVar267._20_4_ = fVar228 * auVar150._20_4_ + fVar244 * auVar25._20_4_ + fVar221 * auVar26._20_4_;
  auVar267._24_4_ = fVar229 * auVar150._24_4_ + fVar246 * auVar25._24_4_ + fVar222 * auVar26._24_4_;
  auVar267._28_4_ = fVar207 + auVar25._28_4_ + auVar26._28_4_;
  auVar172._0_4_ = fVar226 * auVar27._0_4_ + auVar29._0_4_ * fVar220 + fVar242 * auVar28._0_4_;
  auVar172._4_4_ = fVar228 * auVar27._4_4_ + auVar29._4_4_ * fVar221 + fVar244 * auVar28._4_4_;
  auVar172._8_4_ = fVar229 * auVar27._8_4_ + auVar29._8_4_ * fVar222 + fVar246 * auVar28._8_4_;
  auVar172._12_4_ = fVar240 * auVar27._12_4_ + auVar29._12_4_ * fVar224 + fVar247 * auVar28._12_4_;
  auVar172._16_4_ = fVar226 * auVar27._16_4_ + auVar29._16_4_ * fVar220 + fVar242 * auVar28._16_4_;
  auVar172._20_4_ = fVar228 * auVar27._20_4_ + auVar29._20_4_ * fVar221 + fVar244 * auVar28._20_4_;
  auVar172._24_4_ = fVar229 * auVar27._24_4_ + auVar29._24_4_ * fVar222 + fVar246 * auVar28._24_4_;
  auVar172._28_4_ = fVar207 + auVar29._28_4_ + auVar26._28_4_;
  auVar282._8_4_ = 0x7fffffff;
  auVar282._0_8_ = 0x7fffffff7fffffff;
  auVar282._12_4_ = 0x7fffffff;
  auVar282._16_4_ = 0x7fffffff;
  auVar282._20_4_ = 0x7fffffff;
  auVar282._24_4_ = 0x7fffffff;
  auVar282._28_4_ = 0x7fffffff;
  auVar201._8_4_ = 0x219392ef;
  auVar201._0_8_ = 0x219392ef219392ef;
  auVar201._12_4_ = 0x219392ef;
  auVar201._16_4_ = 0x219392ef;
  auVar201._20_4_ = 0x219392ef;
  auVar201._24_4_ = 0x219392ef;
  auVar201._28_4_ = 0x219392ef;
  auVar150 = vandps_avx(auVar340,auVar282);
  auVar150 = vcmpps_avx(auVar150,auVar201,1);
  auVar25 = vblendvps_avx(auVar340,auVar201,auVar150);
  auVar150 = vandps_avx(auVar335,auVar282);
  auVar150 = vcmpps_avx(auVar150,auVar201,1);
  auVar26 = vblendvps_avx(auVar335,auVar201,auVar150);
  auVar150 = vandps_avx(auVar252,auVar282);
  auVar150 = vcmpps_avx(auVar150,auVar201,1);
  auVar150 = vblendvps_avx(auVar252,auVar201,auVar150);
  auVar202._0_4_ = fVar242 * auVar31._0_4_ + auVar32._0_4_ * fVar220 + fVar226 * auVar30._0_4_;
  auVar202._4_4_ = fVar244 * auVar31._4_4_ + auVar32._4_4_ * fVar221 + fVar228 * auVar30._4_4_;
  auVar202._8_4_ = fVar246 * auVar31._8_4_ + auVar32._8_4_ * fVar222 + fVar229 * auVar30._8_4_;
  auVar202._12_4_ = fVar247 * auVar31._12_4_ + auVar32._12_4_ * fVar224 + fVar240 * auVar30._12_4_;
  auVar202._16_4_ = fVar242 * auVar31._16_4_ + auVar32._16_4_ * fVar220 + fVar226 * auVar30._16_4_;
  auVar202._20_4_ = fVar244 * auVar31._20_4_ + auVar32._20_4_ * fVar221 + fVar228 * auVar30._20_4_;
  auVar202._24_4_ = fVar246 * auVar31._24_4_ + auVar32._24_4_ * fVar222 + fVar229 * auVar30._24_4_;
  auVar202._28_4_ = auVar28._28_4_ + fVar224 + fVar207;
  auVar27 = vrcpps_avx(auVar25);
  fVar207 = auVar27._0_4_;
  fVar220 = auVar27._4_4_;
  auVar28._4_4_ = auVar25._4_4_ * fVar220;
  auVar28._0_4_ = auVar25._0_4_ * fVar207;
  fVar221 = auVar27._8_4_;
  auVar28._8_4_ = auVar25._8_4_ * fVar221;
  fVar222 = auVar27._12_4_;
  auVar28._12_4_ = auVar25._12_4_ * fVar222;
  fVar224 = auVar27._16_4_;
  auVar28._16_4_ = auVar25._16_4_ * fVar224;
  fVar226 = auVar27._20_4_;
  auVar28._20_4_ = auVar25._20_4_ * fVar226;
  fVar228 = auVar27._24_4_;
  auVar28._24_4_ = auVar25._24_4_ * fVar228;
  auVar28._28_4_ = auVar25._28_4_;
  auVar297._8_4_ = 0x3f800000;
  auVar297._0_8_ = 0x3f8000003f800000;
  auVar297._12_4_ = 0x3f800000;
  auVar297._16_4_ = 0x3f800000;
  auVar297._20_4_ = 0x3f800000;
  auVar297._24_4_ = 0x3f800000;
  auVar297._28_4_ = 0x3f800000;
  auVar28 = vsubps_avx(auVar297,auVar28);
  auVar25 = vrcpps_avx(auVar26);
  fVar207 = fVar207 + fVar207 * auVar28._0_4_;
  fVar220 = fVar220 + fVar220 * auVar28._4_4_;
  fVar221 = fVar221 + fVar221 * auVar28._8_4_;
  fVar222 = fVar222 + fVar222 * auVar28._12_4_;
  fVar224 = fVar224 + fVar224 * auVar28._16_4_;
  fVar226 = fVar226 + fVar226 * auVar28._20_4_;
  fVar228 = fVar228 + fVar228 * auVar28._24_4_;
  fVar249 = auVar25._0_4_;
  fVar257 = auVar25._4_4_;
  auVar29._4_4_ = fVar257 * auVar26._4_4_;
  auVar29._0_4_ = fVar249 * auVar26._0_4_;
  fVar258 = auVar25._8_4_;
  auVar29._8_4_ = fVar258 * auVar26._8_4_;
  fVar259 = auVar25._12_4_;
  auVar29._12_4_ = fVar259 * auVar26._12_4_;
  fVar260 = auVar25._16_4_;
  auVar29._16_4_ = fVar260 * auVar26._16_4_;
  fVar261 = auVar25._20_4_;
  auVar29._20_4_ = fVar261 * auVar26._20_4_;
  fVar262 = auVar25._24_4_;
  auVar29._24_4_ = fVar262 * auVar26._24_4_;
  auVar29._28_4_ = auVar27._28_4_;
  auVar25 = vsubps_avx(auVar297,auVar29);
  fVar249 = fVar249 + fVar249 * auVar25._0_4_;
  fVar257 = fVar257 + fVar257 * auVar25._4_4_;
  fVar258 = fVar258 + fVar258 * auVar25._8_4_;
  fVar259 = fVar259 + fVar259 * auVar25._12_4_;
  fVar260 = fVar260 + fVar260 * auVar25._16_4_;
  fVar261 = fVar261 + fVar261 * auVar25._20_4_;
  fVar262 = fVar262 + fVar262 * auVar25._24_4_;
  auVar25 = vrcpps_avx(auVar150);
  fVar229 = auVar25._0_4_;
  fVar240 = auVar25._4_4_;
  auVar30._4_4_ = fVar240 * auVar150._4_4_;
  auVar30._0_4_ = fVar229 * auVar150._0_4_;
  fVar242 = auVar25._8_4_;
  auVar30._8_4_ = fVar242 * auVar150._8_4_;
  fVar244 = auVar25._12_4_;
  auVar30._12_4_ = fVar244 * auVar150._12_4_;
  fVar246 = auVar25._16_4_;
  auVar30._16_4_ = fVar246 * auVar150._16_4_;
  fVar247 = auVar25._20_4_;
  auVar30._20_4_ = fVar247 * auVar150._20_4_;
  fVar248 = auVar25._24_4_;
  auVar30._24_4_ = fVar248 * auVar150._24_4_;
  auVar30._28_4_ = auVar26._28_4_;
  auVar150 = vsubps_avx(auVar297,auVar30);
  fVar229 = fVar229 + fVar229 * auVar150._0_4_;
  fVar240 = fVar240 + fVar240 * auVar150._4_4_;
  fVar242 = fVar242 + fVar242 * auVar150._8_4_;
  fVar244 = fVar244 + fVar244 * auVar150._12_4_;
  fVar246 = fVar246 + fVar246 * auVar150._16_4_;
  fVar247 = fVar247 + fVar247 * auVar150._20_4_;
  fVar248 = fVar248 + fVar248 * auVar150._24_4_;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = *(ulong *)(prim + uVar140 * 7 + 6);
  auVar234 = vpmovsxwd_avx(auVar234);
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + uVar140 * 7 + 0xe);
  auVar195 = vpmovsxwd_avx(auVar195);
  auVar144._16_16_ = auVar195;
  auVar144._0_16_ = auVar234;
  auVar150 = vcvtdq2ps_avx(auVar144);
  auVar150 = vsubps_avx(auVar150,auVar267);
  auVar142._0_4_ = fVar207 * auVar150._0_4_;
  auVar142._4_4_ = fVar220 * auVar150._4_4_;
  auVar142._8_4_ = fVar221 * auVar150._8_4_;
  auVar142._12_4_ = fVar222 * auVar150._12_4_;
  auVar26._16_4_ = fVar224 * auVar150._16_4_;
  auVar26._0_16_ = auVar142;
  auVar26._20_4_ = fVar226 * auVar150._20_4_;
  auVar26._24_4_ = fVar228 * auVar150._24_4_;
  auVar26._28_4_ = auVar150._28_4_;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = *(ulong *)(prim + lVar23 + 6);
  auVar234 = vpmovsxwd_avx(auVar210);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + lVar23 + 0xe);
  auVar195 = vpmovsxwd_avx(auVar197);
  auVar283._16_16_ = auVar195;
  auVar283._0_16_ = auVar234;
  auVar150 = vcvtdq2ps_avx(auVar283);
  auVar150 = vsubps_avx(auVar150,auVar267);
  auVar208._0_4_ = fVar207 * auVar150._0_4_;
  auVar208._4_4_ = fVar220 * auVar150._4_4_;
  auVar208._8_4_ = fVar221 * auVar150._8_4_;
  auVar208._12_4_ = fVar222 * auVar150._12_4_;
  auVar31._16_4_ = fVar224 * auVar150._16_4_;
  auVar31._0_16_ = auVar208;
  auVar31._20_4_ = fVar226 * auVar150._20_4_;
  auVar31._24_4_ = fVar228 * auVar150._24_4_;
  auVar31._28_4_ = auVar27._28_4_ + auVar28._28_4_;
  lVar136 = (ulong)(byte)PVar17 * 0x10;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + lVar136 + 6);
  auVar234 = vpmovsxwd_avx(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar136 + 0xe);
  auVar195 = vpmovsxwd_avx(auVar10);
  lVar136 = lVar136 + uVar140 * -2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + lVar136 + 6);
  auVar210 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar136 + 0xe);
  auVar197 = vpmovsxwd_avx(auVar12);
  auVar268._16_16_ = auVar197;
  auVar268._0_16_ = auVar210;
  auVar150 = vcvtdq2ps_avx(auVar268);
  auVar150 = vsubps_avx(auVar150,auVar172);
  auVar264._0_4_ = fVar249 * auVar150._0_4_;
  auVar264._4_4_ = fVar257 * auVar150._4_4_;
  auVar264._8_4_ = fVar258 * auVar150._8_4_;
  auVar264._12_4_ = fVar259 * auVar150._12_4_;
  auVar27._16_4_ = fVar260 * auVar150._16_4_;
  auVar27._0_16_ = auVar264;
  auVar27._20_4_ = fVar261 * auVar150._20_4_;
  auVar27._24_4_ = fVar262 * auVar150._24_4_;
  auVar27._28_4_ = auVar150._28_4_;
  auVar284._16_16_ = auVar195;
  auVar284._0_16_ = auVar234;
  auVar150 = vcvtdq2ps_avx(auVar284);
  auVar150 = vsubps_avx(auVar150,auVar172);
  auVar169._0_4_ = fVar249 * auVar150._0_4_;
  auVar169._4_4_ = fVar257 * auVar150._4_4_;
  auVar169._8_4_ = fVar258 * auVar150._8_4_;
  auVar169._12_4_ = fVar259 * auVar150._12_4_;
  auVar32._16_4_ = fVar260 * auVar150._16_4_;
  auVar32._0_16_ = auVar169;
  auVar32._20_4_ = fVar261 * auVar150._20_4_;
  auVar32._24_4_ = fVar262 * auVar150._24_4_;
  auVar32._28_4_ = auVar150._28_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar135 + uVar140 + 6);
  auVar234 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar135 + uVar140 + 0xe);
  auVar195 = vpmovsxwd_avx(auVar14);
  auVar253._16_16_ = auVar195;
  auVar253._0_16_ = auVar234;
  auVar150 = vcvtdq2ps_avx(auVar253);
  auVar150 = vsubps_avx(auVar150,auVar202);
  auVar251._0_4_ = fVar229 * auVar150._0_4_;
  auVar251._4_4_ = fVar240 * auVar150._4_4_;
  auVar251._8_4_ = fVar242 * auVar150._8_4_;
  auVar251._12_4_ = fVar244 * auVar150._12_4_;
  auVar24._16_4_ = fVar246 * auVar150._16_4_;
  auVar24._0_16_ = auVar251;
  auVar24._20_4_ = fVar247 * auVar150._20_4_;
  auVar24._24_4_ = fVar248 * auVar150._24_4_;
  auVar24._28_4_ = auVar150._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar140 * 0x17 + 6);
  auVar234 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar140 * 0x17 + 0xe);
  auVar195 = vpmovsxwd_avx(auVar16);
  auVar285._16_16_ = auVar195;
  auVar285._0_16_ = auVar234;
  auVar150 = vcvtdq2ps_avx(auVar285);
  auVar150 = vsubps_avx(auVar150,auVar202);
  auVar191._0_4_ = fVar229 * auVar150._0_4_;
  auVar191._4_4_ = fVar240 * auVar150._4_4_;
  auVar191._8_4_ = fVar242 * auVar150._8_4_;
  auVar191._12_4_ = fVar244 * auVar150._12_4_;
  auVar33._16_4_ = fVar246 * auVar150._16_4_;
  auVar33._0_16_ = auVar191;
  auVar33._20_4_ = fVar247 * auVar150._20_4_;
  auVar33._24_4_ = fVar248 * auVar150._24_4_;
  auVar33._28_4_ = auVar150._28_4_;
  auVar234 = vpminsd_avx(auVar26._16_16_,auVar31._16_16_);
  auVar195 = vpminsd_avx(auVar142,auVar208);
  auVar298._16_16_ = auVar234;
  auVar298._0_16_ = auVar195;
  auVar234 = vpminsd_avx(auVar27._16_16_,auVar32._16_16_);
  auVar195 = vpminsd_avx(auVar264,auVar169);
  auVar336._16_16_ = auVar234;
  auVar336._0_16_ = auVar195;
  auVar150 = vmaxps_avx(auVar298,auVar336);
  auVar234 = vpminsd_avx(auVar24._16_16_,auVar33._16_16_);
  auVar195 = vpminsd_avx(auVar251,auVar191);
  auVar346._16_16_ = auVar234;
  auVar346._0_16_ = auVar195;
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar349._4_4_ = uVar7;
  auVar349._0_4_ = uVar7;
  auVar349._8_4_ = uVar7;
  auVar349._12_4_ = uVar7;
  auVar349._16_4_ = uVar7;
  auVar349._20_4_ = uVar7;
  auVar349._24_4_ = uVar7;
  auVar349._28_4_ = uVar7;
  auVar25 = vmaxps_avx(auVar346,auVar349);
  auVar150 = vmaxps_avx(auVar150,auVar25);
  local_80._4_4_ = auVar150._4_4_ * 0.99999964;
  local_80._0_4_ = auVar150._0_4_ * 0.99999964;
  local_80._8_4_ = auVar150._8_4_ * 0.99999964;
  local_80._12_4_ = auVar150._12_4_ * 0.99999964;
  local_80._16_4_ = auVar150._16_4_ * 0.99999964;
  local_80._20_4_ = auVar150._20_4_ * 0.99999964;
  local_80._24_4_ = auVar150._24_4_ * 0.99999964;
  local_80._28_4_ = auVar150._28_4_;
  auVar302 = ZEXT3264(local_80);
  auVar234 = vpmaxsd_avx(auVar26._16_16_,auVar31._16_16_);
  auVar195 = vpmaxsd_avx(auVar142,auVar208);
  auVar145._16_16_ = auVar234;
  auVar145._0_16_ = auVar195;
  auVar234 = vpmaxsd_avx(auVar27._16_16_,auVar32._16_16_);
  auVar195 = vpmaxsd_avx(auVar264,auVar169);
  auVar173._16_16_ = auVar234;
  auVar173._0_16_ = auVar195;
  auVar150 = vminps_avx(auVar145,auVar173);
  auVar234 = vpmaxsd_avx(auVar24._16_16_,auVar33._16_16_);
  auVar195 = vpmaxsd_avx(auVar251,auVar191);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar213._4_4_ = uVar7;
  auVar213._0_4_ = uVar7;
  auVar213._8_4_ = uVar7;
  auVar213._12_4_ = uVar7;
  auVar213._16_4_ = uVar7;
  auVar213._20_4_ = uVar7;
  auVar213._24_4_ = uVar7;
  auVar213._28_4_ = uVar7;
  auVar174._16_16_ = auVar234;
  auVar174._0_16_ = auVar195;
  auVar25 = vminps_avx(auVar174,auVar213);
  auVar150 = vminps_avx(auVar150,auVar25);
  auVar25._4_4_ = auVar150._4_4_ * 1.0000004;
  auVar25._0_4_ = auVar150._0_4_ * 1.0000004;
  auVar25._8_4_ = auVar150._8_4_ * 1.0000004;
  auVar25._12_4_ = auVar150._12_4_ * 1.0000004;
  auVar25._16_4_ = auVar150._16_4_ * 1.0000004;
  auVar25._20_4_ = auVar150._20_4_ * 1.0000004;
  auVar25._24_4_ = auVar150._24_4_ * 1.0000004;
  auVar25._28_4_ = auVar150._28_4_;
  auVar150 = vcmpps_avx(local_80,auVar25,2);
  auVar234 = vpshufd_avx(ZEXT116((byte)PVar17),0);
  auVar175._16_16_ = auVar234;
  auVar175._0_16_ = auVar234;
  auVar25 = vcvtdq2ps_avx(auVar175);
  auVar25 = vcmpps_avx(_DAT_01faff40,auVar25,1);
  auVar150 = vandps_avx(auVar150,auVar25);
  uVar134 = vmovmskps_avx(auVar150);
  if (uVar134 != 0) {
    uVar134 = uVar134 & 0xff;
    pLVar139 = pre->ray_space + k;
    local_560[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_560[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_560[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_560[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_670 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    pPVar137 = prim;
    local_7f8 = pLVar139;
    local_7f0 = pre;
    local_7e8 = prim;
    do {
      uVar140 = (ulong)uVar134;
      auVar150 = auVar302._0_32_;
      lVar136 = 0;
      if (uVar140 != 0) {
        for (; (uVar134 >> lVar136 & 1) == 0; lVar136 = lVar136 + 1) {
        }
      }
      uVar140 = uVar140 - 1 & uVar140;
      uVar134 = *(uint *)(pPVar137 + lVar136 * 4 + 6);
      lVar136 = lVar136 * 0x40;
      lVar23 = 0;
      if (uVar140 != 0) {
        for (; (uVar140 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
        }
      }
      uVar18 = *(uint *)(pPVar137 + 2);
      pGVar21 = (context->scene->geometries).items[uVar18].ptr;
      auVar234 = *(undefined1 (*) [16])(prim + lVar136 + lVar118 + 0x16);
      if (((uVar140 != 0) && (uVar135 = uVar140 - 1 & uVar140, uVar135 != 0)) &&
         (lVar23 = 0, uVar135 != 0)) {
        for (; (uVar135 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
        }
      }
      auVar195 = *(undefined1 (*) [16])(prim + lVar136 + lVar118 + 0x26);
      _local_780 = *(undefined1 (*) [16])(prim + lVar136 + lVar118 + 0x36);
      _local_790 = *(undefined1 (*) [16])(prim + lVar136 + lVar118 + 0x46);
      uVar19 = (uint)pGVar21[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar210 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar10 = vinsertps_avx(auVar210,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar9 = vsubps_avx(auVar234,auVar10);
      auVar210 = vshufps_avx(auVar9,auVar9,0);
      auVar197 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      fVar207 = (pLVar139->vx).field_0.m128[0];
      fVar220 = (pLVar139->vx).field_0.m128[1];
      fVar221 = (pLVar139->vx).field_0.m128[2];
      fVar222 = (pLVar139->vx).field_0.m128[3];
      fVar224 = (pLVar139->vy).field_0.m128[0];
      fVar226 = (pLVar139->vy).field_0.m128[1];
      fVar228 = (pLVar139->vy).field_0.m128[2];
      fVar229 = (pLVar139->vy).field_0.m128[3];
      fVar240 = (pLVar139->vz).field_0.m128[0];
      fVar242 = (pLVar139->vz).field_0.m128[1];
      fVar244 = (pLVar139->vz).field_0.m128[2];
      fVar246 = (pLVar139->vz).field_0.m128[3];
      auVar232._0_8_ =
           CONCAT44(auVar210._4_4_ * fVar220 + auVar197._4_4_ * fVar226 + fVar242 * auVar9._4_4_,
                    auVar210._0_4_ * fVar207 + auVar197._0_4_ * fVar224 + fVar240 * auVar9._0_4_);
      auVar232._8_4_ = auVar210._8_4_ * fVar221 + auVar197._8_4_ * fVar228 + fVar244 * auVar9._8_4_;
      auVar232._12_4_ =
           auVar210._12_4_ * fVar222 + auVar197._12_4_ * fVar229 + fVar246 * auVar9._12_4_;
      auVar210 = vblendps_avx(auVar232,auVar234,8);
      auVar11 = vsubps_avx(auVar195,auVar10);
      auVar197 = vshufps_avx(auVar11,auVar11,0);
      auVar9 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar355._0_4_ = auVar197._0_4_ * fVar207 + auVar9._0_4_ * fVar224 + fVar240 * auVar11._0_4_;
      auVar355._4_4_ = auVar197._4_4_ * fVar220 + auVar9._4_4_ * fVar226 + fVar242 * auVar11._4_4_;
      auVar355._8_4_ = auVar197._8_4_ * fVar221 + auVar9._8_4_ * fVar228 + fVar244 * auVar11._8_4_;
      auVar355._12_4_ =
           auVar197._12_4_ * fVar222 + auVar9._12_4_ * fVar229 + fVar246 * auVar11._12_4_;
      auVar197 = vblendps_avx(auVar355,auVar195,8);
      auVar12 = vsubps_avx(_local_780,auVar10);
      auVar9 = vshufps_avx(auVar12,auVar12,0);
      auVar11 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar233._0_4_ = auVar9._0_4_ * fVar207 + auVar11._0_4_ * fVar224 + fVar240 * auVar12._0_4_;
      auVar233._4_4_ = auVar9._4_4_ * fVar220 + auVar11._4_4_ * fVar226 + fVar242 * auVar12._4_4_;
      auVar233._8_4_ = auVar9._8_4_ * fVar221 + auVar11._8_4_ * fVar228 + fVar244 * auVar12._8_4_;
      auVar233._12_4_ =
           auVar9._12_4_ * fVar222 + auVar11._12_4_ * fVar229 + fVar246 * auVar12._12_4_;
      auVar9 = vblendps_avx(auVar233,_local_780,8);
      auVar12 = vsubps_avx(_local_790,auVar10);
      auVar10 = vshufps_avx(auVar12,auVar12,0);
      auVar11 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar265._0_4_ = auVar10._0_4_ * fVar207 + auVar11._0_4_ * fVar224 + fVar240 * auVar12._0_4_;
      auVar265._4_4_ = auVar10._4_4_ * fVar220 + auVar11._4_4_ * fVar226 + fVar242 * auVar12._4_4_;
      auVar265._8_4_ = auVar10._8_4_ * fVar221 + auVar11._8_4_ * fVar228 + fVar244 * auVar12._8_4_;
      auVar265._12_4_ =
           auVar10._12_4_ * fVar222 + auVar11._12_4_ * fVar229 + fVar246 * auVar12._12_4_;
      auVar10 = vblendps_avx(auVar265,_local_790,8);
      auVar209._8_4_ = 0x7fffffff;
      auVar209._0_8_ = 0x7fffffff7fffffff;
      auVar209._12_4_ = 0x7fffffff;
      auVar210 = vandps_avx(auVar210,auVar209);
      auVar197 = vandps_avx(auVar197,auVar209);
      auVar11 = vmaxps_avx(auVar210,auVar197);
      auVar210 = vandps_avx(auVar9,auVar209);
      auVar197 = vandps_avx(auVar10,auVar209);
      auVar210 = vmaxps_avx(auVar210,auVar197);
      auVar210 = vmaxps_avx(auVar11,auVar210);
      auVar197 = vmovshdup_avx(auVar210);
      auVar197 = vmaxss_avx(auVar197,auVar210);
      auVar210 = vshufpd_avx(auVar210,auVar210,1);
      auVar210 = vmaxss_avx(auVar210,auVar197);
      lVar136 = (long)(int)uVar19 * 0x44;
      fVar207 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar136 + 0x908);
      fVar220 = *(float *)(bezier_basis0 + lVar136 + 0x90c);
      fVar221 = *(float *)(bezier_basis0 + lVar136 + 0x910);
      fVar222 = *(float *)(bezier_basis0 + lVar136 + 0x914);
      fVar224 = *(float *)(bezier_basis0 + lVar136 + 0x918);
      fVar226 = *(float *)(bezier_basis0 + lVar136 + 0x91c);
      fVar228 = *(float *)(bezier_basis0 + lVar136 + 0x920);
      auVar125 = *(undefined1 (*) [28])(bezier_basis0 + lVar136 + 0x908);
      auVar197 = vshufps_avx(auVar233,auVar233,0);
      local_720._16_16_ = auVar197;
      local_720._0_16_ = auVar197;
      auVar9 = vshufps_avx(auVar233,auVar233,0x55);
      register0x00001310 = auVar9;
      _local_700 = auVar9;
      fVar229 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar136 + 0xd8c);
      fVar240 = *(float *)(bezier_basis0 + lVar136 + 0xd90);
      fVar242 = *(float *)(bezier_basis0 + lVar136 + 0xd94);
      fVar244 = *(float *)(bezier_basis0 + lVar136 + 0xd98);
      fVar246 = *(float *)(bezier_basis0 + lVar136 + 0xd9c);
      fVar247 = *(float *)(bezier_basis0 + lVar136 + 0xda0);
      fVar248 = *(float *)(bezier_basis0 + lVar136 + 0xda4);
      auVar124 = *(undefined1 (*) [28])(bezier_basis0 + lVar136 + 0xd8c);
      fVar249 = *(float *)(bezier_basis0 + lVar136 + 0xda8);
      auVar10 = vshufps_avx(auVar265,auVar265,0);
      register0x00001350 = auVar10;
      _local_440 = auVar10;
      auVar11 = vshufps_avx(auVar265,auVar265,0x55);
      register0x00001390 = auVar11;
      _local_5a0 = auVar11;
      fVar163 = auVar10._0_4_;
      fVar164 = auVar10._4_4_;
      fVar165 = auVar10._8_4_;
      fVar167 = auVar10._12_4_;
      fVar166 = auVar197._0_4_;
      fVar183 = auVar197._4_4_;
      fVar185 = auVar197._8_4_;
      fVar141 = auVar197._12_4_;
      fVar184 = auVar11._0_4_;
      fVar186 = auVar11._4_4_;
      fVar187 = auVar11._8_4_;
      fVar188 = auVar11._12_4_;
      fVar230 = auVar9._0_4_;
      fVar241 = auVar9._4_4_;
      fVar243 = auVar9._8_4_;
      fVar245 = auVar9._12_4_;
      auVar197 = vshufps_avx(_local_780,_local_780,0xff);
      register0x00001550 = auVar197;
      _local_160 = auVar197;
      auVar9 = vshufps_avx(_local_790,_local_790,0xff);
      register0x00001410 = auVar9;
      _local_180 = auVar9;
      fVar295 = auVar9._0_4_;
      fVar303 = auVar9._4_4_;
      fVar189 = auVar9._8_4_;
      fVar190 = auVar9._12_4_;
      fVar273 = auVar197._0_4_;
      fVar274 = auVar197._4_4_;
      fVar275 = auVar197._8_4_;
      fVar276 = auVar197._12_4_;
      auVar197 = vshufps_avx(auVar355,auVar355,0);
      register0x00001490 = auVar197;
      _local_a0 = auVar197;
      fVar257 = *(float *)(bezier_basis0 + lVar136 + 0x484);
      fVar258 = *(float *)(bezier_basis0 + lVar136 + 0x488);
      fVar259 = *(float *)(bezier_basis0 + lVar136 + 0x48c);
      fVar260 = *(float *)(bezier_basis0 + lVar136 + 0x490);
      fStack_4b0 = *(float *)(bezier_basis0 + lVar136 + 0x494);
      fStack_4ac = *(float *)(bezier_basis0 + lVar136 + 0x498);
      fStack_4a8 = *(float *)(bezier_basis0 + lVar136 + 0x49c);
      fStack_4a4 = *(float *)(bezier_basis0 + lVar136 + 0x4a0);
      fVar308 = auVar197._0_4_;
      fVar311 = auVar197._4_4_;
      fVar313 = auVar197._8_4_;
      fVar314 = auVar197._12_4_;
      auVar9 = vshufps_avx(auVar355,auVar355,0x55);
      register0x000015d0 = auVar9;
      _local_c0 = auVar9;
      fVar293 = auVar9._0_4_;
      fVar294 = auVar9._4_4_;
      fVar315 = auVar9._8_4_;
      fVar324 = auVar9._12_4_;
      auVar9 = vpermilps_avx(auVar195,0xff);
      register0x00001590 = auVar9;
      _local_e0 = auVar9;
      fVar277 = auVar9._0_4_;
      fVar279 = auVar9._4_4_;
      fVar291 = auVar9._8_4_;
      fVar292 = auVar9._12_4_;
      auVar119._8_4_ = auVar232._8_4_;
      auVar119._0_8_ = auVar232._0_8_;
      auVar119._12_4_ = auVar232._12_4_;
      auVar9 = vshufps_avx(auVar119,auVar119,0);
      register0x00001310 = auVar9;
      _local_420 = auVar9;
      fVar261 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar136);
      fVar262 = *(float *)(bezier_basis0 + lVar136 + 4);
      fVar339 = *(float *)(bezier_basis0 + lVar136 + 8);
      fVar296 = *(float *)(bezier_basis0 + lVar136 + 0xc);
      fVar223 = *(float *)(bezier_basis0 + lVar136 + 0x10);
      fVar307 = *(float *)(bezier_basis0 + lVar136 + 0x14);
      fVar304 = *(float *)(bezier_basis0 + lVar136 + 0x18);
      auVar126 = *(undefined1 (*) [28])(bezier_basis0 + lVar136);
      fVar159 = auVar9._0_4_;
      fVar160 = auVar9._4_4_;
      fVar161 = auVar9._8_4_;
      fVar162 = auVar9._12_4_;
      auVar337._0_4_ = fVar159 * fVar261 + fVar308 * fVar257 + fVar166 * fVar207 + fVar163 * fVar229
      ;
      auVar337._4_4_ = fVar160 * fVar262 + fVar311 * fVar258 + fVar183 * fVar220 + fVar164 * fVar240
      ;
      auVar337._8_4_ = fVar161 * fVar339 + fVar313 * fVar259 + fVar185 * fVar221 + fVar165 * fVar242
      ;
      auVar337._12_4_ =
           fVar162 * fVar296 + fVar314 * fVar260 + fVar141 * fVar222 + fVar167 * fVar244;
      auVar337._16_4_ =
           fVar159 * fVar223 + fVar308 * fStack_4b0 + fVar166 * fVar224 + fVar163 * fVar246;
      auVar337._20_4_ =
           fVar160 * fVar307 + fVar311 * fStack_4ac + fVar183 * fVar226 + fVar164 * fVar247;
      auVar337._24_4_ =
           fVar161 * fVar304 + fVar313 * fStack_4a8 + fVar185 * fVar228 + fVar165 * fVar248;
      auVar337._28_4_ = fVar249 + fVar141 + 0.0 + 0.0;
      auVar9 = vshufps_avx(auVar119,auVar119,0x55);
      local_300._16_16_ = auVar9;
      local_300._0_16_ = auVar9;
      fVar323 = auVar9._0_4_;
      fVar325 = auVar9._4_4_;
      fVar263 = auVar9._8_4_;
      fVar272 = auVar9._12_4_;
      auVar269._0_4_ = fVar323 * fVar261 + fVar293 * fVar257 + fVar230 * fVar207 + fVar184 * fVar229
      ;
      auVar269._4_4_ = fVar325 * fVar262 + fVar294 * fVar258 + fVar241 * fVar220 + fVar186 * fVar240
      ;
      auVar269._8_4_ = fVar263 * fVar339 + fVar315 * fVar259 + fVar243 * fVar221 + fVar187 * fVar242
      ;
      auVar269._12_4_ =
           fVar272 * fVar296 + fVar324 * fVar260 + fVar245 * fVar222 + fVar188 * fVar244;
      auVar269._16_4_ =
           fVar323 * fVar223 + fVar293 * fStack_4b0 + fVar230 * fVar224 + fVar184 * fVar246;
      auVar269._20_4_ =
           fVar325 * fVar307 + fVar294 * fStack_4ac + fVar241 * fVar226 + fVar186 * fVar247;
      auVar269._24_4_ =
           fVar263 * fVar304 + fVar315 * fStack_4a8 + fVar243 * fVar228 + fVar187 * fVar248;
      auVar269._28_4_ = fVar141 + 0.0 + 0.0 + 0.0;
      auVar9 = vpermilps_avx(auVar234,0xff);
      register0x00001450 = auVar9;
      _local_1a0 = auVar9;
      fVar206 = auVar9._0_4_;
      fVar278 = auVar9._4_4_;
      fVar231 = auVar9._8_4_;
      local_7c0._0_4_ =
           fVar206 * fVar261 + fVar277 * fVar257 + fVar273 * fVar207 + fVar295 * fVar229;
      local_7c0._4_4_ =
           fVar278 * fVar262 + fVar279 * fVar258 + fVar274 * fVar220 + fVar303 * fVar240;
      fStack_7b8 = fVar231 * fVar339 + fVar291 * fVar259 + fVar275 * fVar221 + fVar189 * fVar242;
      fStack_7b4 = auVar9._12_4_ * fVar296 +
                   fVar292 * fVar260 + fVar276 * fVar222 + fVar190 * fVar244;
      fStack_7b0 = fVar206 * fVar223 + fVar277 * fStack_4b0 + fVar273 * fVar224 + fVar295 * fVar246;
      fStack_7ac = fVar278 * fVar307 + fVar279 * fStack_4ac + fVar274 * fVar226 + fVar303 * fVar247;
      fStack_7a8 = fVar231 * fVar304 + fVar291 * fStack_4a8 + fVar275 * fVar228 + fVar189 * fVar248;
      fStack_7a4 = *(float *)(bezier_basis0 + lVar136 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar229 = *(float *)(bezier_basis1 + lVar136 + 0x908);
      fVar240 = *(float *)(bezier_basis1 + lVar136 + 0x90c);
      fVar242 = *(float *)(bezier_basis1 + lVar136 + 0x910);
      fVar244 = *(float *)(bezier_basis1 + lVar136 + 0x914);
      fVar246 = *(float *)(bezier_basis1 + lVar136 + 0x918);
      fVar247 = *(float *)(bezier_basis1 + lVar136 + 0x91c);
      fVar248 = *(float *)(bezier_basis1 + lVar136 + 0x920);
      fVar207 = *(float *)*(undefined1 (*) [28])(bezier_basis1 + lVar136 + 0xd8c);
      fVar220 = *(float *)(bezier_basis1 + lVar136 + 0xd90);
      fVar221 = *(float *)(bezier_basis1 + lVar136 + 0xd94);
      fVar222 = *(float *)(bezier_basis1 + lVar136 + 0xd98);
      fVar224 = *(float *)(bezier_basis1 + lVar136 + 0xd9c);
      fVar226 = *(float *)(bezier_basis1 + lVar136 + 0xda0);
      fVar228 = *(float *)(bezier_basis1 + lVar136 + 0xda4);
      auVar127 = *(undefined1 (*) [28])(bezier_basis1 + lVar136 + 0xd8c);
      fVar261 = *(float *)(bezier_basis1 + lVar136 + 0x484);
      fVar262 = *(float *)(bezier_basis1 + lVar136 + 0x488);
      fVar339 = *(float *)(bezier_basis1 + lVar136 + 0x48c);
      fVar296 = *(float *)(bezier_basis1 + lVar136 + 0x490);
      fVar223 = *(float *)(bezier_basis1 + lVar136 + 0x494);
      fVar307 = *(float *)(bezier_basis1 + lVar136 + 0x498);
      fVar304 = *(float *)(bezier_basis1 + lVar136 + 0x49c);
      fVar205 = fVar276 + fVar249 + 0.0;
      fVar305 = *(float *)(bezier_basis1 + lVar136);
      fVar225 = *(float *)(bezier_basis1 + lVar136 + 4);
      fVar310 = *(float *)(bezier_basis1 + lVar136 + 8);
      fVar306 = *(float *)(bezier_basis1 + lVar136 + 0xc);
      fVar309 = *(float *)(bezier_basis1 + lVar136 + 0x10);
      fVar227 = *(float *)(bezier_basis1 + lVar136 + 0x14);
      fVar312 = *(float *)(bezier_basis1 + lVar136 + 0x18);
      auVar235._0_4_ = fVar305 * fVar159 + fVar308 * fVar261 + fVar229 * fVar166 + fVar163 * fVar207
      ;
      auVar235._4_4_ = fVar225 * fVar160 + fVar311 * fVar262 + fVar240 * fVar183 + fVar164 * fVar220
      ;
      auVar235._8_4_ = fVar310 * fVar161 + fVar313 * fVar339 + fVar242 * fVar185 + fVar165 * fVar221
      ;
      auVar235._12_4_ =
           fVar306 * fVar162 + fVar314 * fVar296 + fVar244 * fVar141 + fVar167 * fVar222;
      auVar235._16_4_ =
           fVar309 * fVar159 + fVar308 * fVar223 + fVar246 * fVar166 + fVar163 * fVar224;
      auVar235._20_4_ =
           fVar227 * fVar160 + fVar311 * fVar307 + fVar247 * fVar183 + fVar164 * fVar226;
      auVar235._24_4_ =
           fVar312 * fVar161 + fVar313 * fVar304 + fVar248 * fVar185 + fVar165 * fVar228;
      auVar235._28_4_ = fVar292 + fVar205;
      local_4a0._0_4_ =
           fVar323 * fVar305 + fVar293 * fVar261 + fVar229 * fVar230 + fVar207 * fVar184;
      local_4a0._4_4_ =
           fVar325 * fVar225 + fVar294 * fVar262 + fVar240 * fVar241 + fVar220 * fVar186;
      fStack_498 = fVar263 * fVar310 + fVar315 * fVar339 + fVar242 * fVar243 + fVar221 * fVar187;
      fStack_494 = fVar272 * fVar306 + fVar324 * fVar296 + fVar244 * fVar245 + fVar222 * fVar188;
      fStack_490 = fVar323 * fVar309 + fVar293 * fVar223 + fVar246 * fVar230 + fVar224 * fVar184;
      fStack_48c = fVar325 * fVar227 + fVar294 * fVar307 + fVar247 * fVar241 + fVar226 * fVar186;
      fStack_488 = fVar263 * fVar312 + fVar315 * fVar304 + fVar248 * fVar243 + fVar228 * fVar187;
      fStack_484 = fVar205 + fVar276 + fVar249 + 0.0;
      auVar254._0_4_ = fVar277 * fVar261 + fVar273 * fVar229 + fVar295 * fVar207 + fVar206 * fVar305
      ;
      auVar254._4_4_ = fVar279 * fVar262 + fVar274 * fVar240 + fVar303 * fVar220 + fVar278 * fVar225
      ;
      auVar254._8_4_ = fVar291 * fVar339 + fVar275 * fVar242 + fVar189 * fVar221 + fVar231 * fVar310
      ;
      auVar254._12_4_ =
           fVar292 * fVar296 + fVar276 * fVar244 + fVar190 * fVar222 + auVar9._12_4_ * fVar306;
      auVar254._16_4_ =
           fVar277 * fVar223 + fVar273 * fVar246 + fVar295 * fVar224 + fVar206 * fVar309;
      auVar254._20_4_ =
           fVar279 * fVar307 + fVar274 * fVar247 + fVar303 * fVar226 + fVar278 * fVar227;
      auVar254._24_4_ =
           fVar291 * fVar304 + fVar275 * fVar248 + fVar189 * fVar228 + fVar231 * fVar312;
      auVar254._28_4_ = fVar276 + fVar190 + fVar249 + fVar205;
      auVar27 = vsubps_avx(auVar235,auVar337);
      auVar28 = vsubps_avx(_local_4a0,auVar269);
      fVar249 = auVar27._0_4_;
      fVar295 = auVar27._4_4_;
      auVar34._4_4_ = fVar295 * auVar269._4_4_;
      auVar34._0_4_ = fVar249 * auVar269._0_4_;
      fVar303 = auVar27._8_4_;
      auVar34._8_4_ = fVar303 * auVar269._8_4_;
      fVar189 = auVar27._12_4_;
      auVar34._12_4_ = fVar189 * auVar269._12_4_;
      fVar190 = auVar27._16_4_;
      auVar34._16_4_ = fVar190 * auVar269._16_4_;
      fVar206 = auVar27._20_4_;
      auVar34._20_4_ = fVar206 * auVar269._20_4_;
      fVar278 = auVar27._24_4_;
      auVar34._24_4_ = fVar278 * auVar269._24_4_;
      auVar34._28_4_ = fVar205;
      fVar207 = auVar28._0_4_;
      fVar220 = auVar28._4_4_;
      auVar35._4_4_ = auVar337._4_4_ * fVar220;
      auVar35._0_4_ = auVar337._0_4_ * fVar207;
      fVar221 = auVar28._8_4_;
      auVar35._8_4_ = auVar337._8_4_ * fVar221;
      fVar222 = auVar28._12_4_;
      auVar35._12_4_ = auVar337._12_4_ * fVar222;
      fVar224 = auVar28._16_4_;
      auVar35._16_4_ = auVar337._16_4_ * fVar224;
      fVar226 = auVar28._20_4_;
      auVar35._20_4_ = auVar337._20_4_ * fVar226;
      fVar228 = auVar28._24_4_;
      auVar35._24_4_ = auVar337._24_4_ * fVar228;
      auVar35._28_4_ = fStack_484;
      auVar26 = vsubps_avx(auVar34,auVar35);
      auVar25 = vmaxps_avx(_local_7c0,auVar254);
      auVar36._4_4_ = auVar25._4_4_ * auVar25._4_4_ * (fVar295 * fVar295 + fVar220 * fVar220);
      auVar36._0_4_ = auVar25._0_4_ * auVar25._0_4_ * (fVar249 * fVar249 + fVar207 * fVar207);
      auVar36._8_4_ = auVar25._8_4_ * auVar25._8_4_ * (fVar303 * fVar303 + fVar221 * fVar221);
      auVar36._12_4_ = auVar25._12_4_ * auVar25._12_4_ * (fVar189 * fVar189 + fVar222 * fVar222);
      auVar36._16_4_ = auVar25._16_4_ * auVar25._16_4_ * (fVar190 * fVar190 + fVar224 * fVar224);
      auVar36._20_4_ = auVar25._20_4_ * auVar25._20_4_ * (fVar206 * fVar206 + fVar226 * fVar226);
      auVar36._24_4_ = auVar25._24_4_ * auVar25._24_4_ * (fVar278 * fVar278 + fVar228 * fVar228);
      auVar36._28_4_ = auVar28._28_4_ + fStack_484;
      auVar37._4_4_ = auVar26._4_4_ * auVar26._4_4_;
      auVar37._0_4_ = auVar26._0_4_ * auVar26._0_4_;
      auVar37._8_4_ = auVar26._8_4_ * auVar26._8_4_;
      auVar37._12_4_ = auVar26._12_4_ * auVar26._12_4_;
      auVar37._16_4_ = auVar26._16_4_ * auVar26._16_4_;
      auVar37._20_4_ = auVar26._20_4_ * auVar26._20_4_;
      auVar37._24_4_ = auVar26._24_4_ * auVar26._24_4_;
      auVar37._28_4_ = auVar26._28_4_;
      auVar25 = vcmpps_avx(auVar37,auVar36,2);
      local_5f0._0_4_ = (undefined4)(int)uVar19;
      local_5f0._4_12_ = auVar197._4_12_;
      auVar197 = vshufps_avx(local_5f0,local_5f0,0);
      auVar214._16_16_ = auVar197;
      auVar214._0_16_ = auVar197;
      auVar26 = vcmpps_avx(_DAT_01faff40,auVar214,1);
      auVar219 = ZEXT3264(auVar26);
      auVar120._8_4_ = auVar232._8_4_;
      auVar120._0_8_ = auVar232._0_8_;
      auVar120._12_4_ = auVar232._12_4_;
      auVar197 = vpermilps_avx(auVar120,0xaa);
      auVar317._16_16_ = auVar197;
      auVar317._0_16_ = auVar197;
      auVar9 = vpermilps_avx(auVar355,0xaa);
      register0x00001550 = auVar9;
      _local_480 = auVar9;
      auVar10 = vpermilps_avx(auVar233,0xaa);
      register0x00001590 = auVar10;
      _local_100 = auVar10;
      auVar11 = vpermilps_avx(auVar265,0xaa);
      register0x00001310 = auVar11;
      _local_7e0 = auVar11;
      auVar29 = auVar26 & auVar25;
      uVar8 = *(uint *)(ray + k * 4 + 0x30);
      auVar210 = ZEXT416((uint)(auVar210._0_4_ * 4.7683716e-07));
      local_620._0_16_ = auVar210;
      local_850._0_4_ = auVar234._0_4_;
      fVar207 = (float)local_850;
      local_850._4_4_ = auVar234._4_4_;
      fVar220 = local_850._4_4_;
      uStack_848._0_4_ = auVar234._8_4_;
      fVar221 = (float)uStack_848;
      uStack_848._4_4_ = auVar234._12_4_;
      fVar222 = uStack_848._4_4_;
      local_850 = auVar234._0_8_;
      uStack_848 = auVar234._8_8_;
      local_820._0_4_ = auVar195._0_4_;
      fVar224 = (float)local_820;
      local_820._4_4_ = auVar195._4_4_;
      fVar226 = local_820._4_4_;
      uStack_818._0_4_ = auVar195._8_4_;
      fVar228 = (float)uStack_818;
      uStack_818._4_4_ = auVar195._12_4_;
      fVar249 = uStack_818._4_4_;
      local_820 = auVar195._0_8_;
      uStack_818 = auVar195._8_8_;
      fVar205 = fVar230;
      fVar295 = fVar241;
      fVar303 = fVar243;
      if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar29 >> 0x7f,0) == '\0') &&
            (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar29 >> 0xbf,0) == '\0') &&
          (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar29[0x1f])
      {
        auVar302 = ZEXT3264(auVar150);
        auVar338 = ZEXT3264(local_720);
      }
      else {
        local_7a0._0_8_ = pGVar21;
        local_320 = vandps_avx(auVar25,auVar26);
        fVar277 = auVar197._0_4_;
        fVar279 = auVar197._4_4_;
        fVar291 = auVar197._8_4_;
        fVar292 = auVar197._12_4_;
        fVar326 = auVar9._0_4_;
        fVar327 = auVar9._4_4_;
        fVar328 = auVar9._8_4_;
        fVar329 = auVar9._12_4_;
        fVar330 = auVar10._0_4_;
        fVar352 = auVar10._4_4_;
        fVar353 = auVar10._8_4_;
        fVar354 = auVar10._12_4_;
        local_500._0_4_ = auVar127._0_4_;
        local_500._4_4_ = auVar127._4_4_;
        fStack_4f8 = auVar127._8_4_;
        fStack_4f4 = auVar127._12_4_;
        fStack_4f0 = auVar127._16_4_;
        fStack_4ec = auVar127._20_4_;
        fStack_4e8 = auVar127._24_4_;
        fVar231 = auVar11._0_4_;
        fVar273 = auVar11._4_4_;
        fVar274 = auVar11._8_4_;
        fVar275 = auVar11._12_4_;
        local_500._0_4_ =
             fVar277 * fVar305 +
             fVar326 * fVar261 + fVar330 * fVar229 + fVar231 * (float)local_500._0_4_;
        local_500._4_4_ =
             fVar279 * fVar225 +
             fVar327 * fVar262 + fVar352 * fVar240 + fVar273 * (float)local_500._4_4_;
        fStack_4f8 = fVar291 * fVar310 +
                     fVar328 * fVar339 + fVar353 * fVar242 + fVar274 * fStack_4f8;
        fStack_4f4 = fVar292 * fVar306 +
                     fVar329 * fVar296 + fVar354 * fVar244 + fVar275 * fStack_4f4;
        fStack_4f0 = fVar277 * fVar309 +
                     fVar326 * fVar223 + fVar330 * fVar246 + fVar231 * fStack_4f0;
        fStack_4ec = fVar279 * fVar227 +
                     fVar327 * fVar307 + fVar352 * fVar247 + fVar273 * fStack_4ec;
        fStack_4e8 = fVar291 * fVar312 +
                     fVar328 * fVar304 + fVar353 * fVar248 + fVar274 * fStack_4e8;
        fStack_4e4 = local_320._28_4_ +
                     auVar26._28_4_ + *(float *)(bezier_basis1 + lVar136 + 0x924) + 0.0;
        local_4e0._0_4_ = auVar126._0_4_;
        local_4e0._4_4_ = auVar126._4_4_;
        fStack_4d8 = auVar126._8_4_;
        fStack_4d4 = auVar126._12_4_;
        fStack_4d0 = auVar126._16_4_;
        fStack_4cc = auVar126._20_4_;
        fStack_4c8 = auVar126._24_4_;
        local_5e0._0_4_ = auVar125._0_4_;
        local_5e0._4_4_ = auVar125._4_4_;
        fStack_5d8 = auVar125._8_4_;
        fStack_5d4 = auVar125._12_4_;
        fStack_5d0 = auVar125._16_4_;
        fStack_5cc = auVar125._20_4_;
        fStack_5c8 = auVar125._24_4_;
        local_660._0_4_ = auVar124._0_4_;
        local_660._4_4_ = auVar124._4_4_;
        fStack_658 = auVar124._8_4_;
        fStack_654 = auVar124._12_4_;
        fStack_650 = auVar124._16_4_;
        fStack_64c = auVar124._20_4_;
        fStack_648 = auVar124._24_4_;
        local_5e0._0_4_ =
             fVar277 * (float)local_4e0._0_4_ +
             fVar326 * fVar257 + fVar330 * (float)local_5e0._0_4_ + fVar231 * (float)local_660._0_4_
        ;
        local_5e0._4_4_ =
             fVar279 * (float)local_4e0._4_4_ +
             fVar327 * fVar258 + fVar352 * (float)local_5e0._4_4_ + fVar273 * (float)local_660._4_4_
        ;
        fStack_5d8 = fVar291 * fStack_4d8 +
                     fVar328 * fVar259 + fVar353 * fStack_5d8 + fVar274 * fStack_658;
        fStack_5d4 = fVar292 * fStack_4d4 +
                     fVar329 * fVar260 + fVar354 * fStack_5d4 + fVar275 * fStack_654;
        fStack_5d0 = fVar277 * fStack_4d0 +
                     fVar326 * fStack_4b0 + fVar330 * fStack_5d0 + fVar231 * fStack_650;
        fStack_5cc = fVar279 * fStack_4cc +
                     fVar327 * fStack_4ac + fVar352 * fStack_5cc + fVar273 * fStack_64c;
        fStack_5c8 = fVar291 * fStack_4c8 +
                     fVar328 * fStack_4a8 + fVar353 * fStack_5c8 + fVar274 * fStack_648;
        fStack_5c4 = fVar272 + fStack_4e4 + local_320._28_4_ + auVar26._28_4_;
        fVar229 = *(float *)(bezier_basis0 + lVar136 + 0x1210);
        fVar240 = *(float *)(bezier_basis0 + lVar136 + 0x1214);
        fVar242 = *(float *)(bezier_basis0 + lVar136 + 0x1218);
        fVar244 = *(float *)(bezier_basis0 + lVar136 + 0x121c);
        fVar246 = *(float *)(bezier_basis0 + lVar136 + 0x1220);
        fVar247 = *(float *)(bezier_basis0 + lVar136 + 0x1224);
        fVar248 = *(float *)(bezier_basis0 + lVar136 + 0x1228);
        fVar257 = *(float *)(bezier_basis0 + lVar136 + 0x1694);
        fVar258 = *(float *)(bezier_basis0 + lVar136 + 0x1698);
        fVar259 = *(float *)(bezier_basis0 + lVar136 + 0x169c);
        fVar260 = *(float *)(bezier_basis0 + lVar136 + 0x16a0);
        fVar261 = *(float *)(bezier_basis0 + lVar136 + 0x16a4);
        fVar262 = *(float *)(bezier_basis0 + lVar136 + 0x16a8);
        fVar339 = *(float *)(bezier_basis0 + lVar136 + 0x16ac);
        fVar296 = *(float *)(bezier_basis0 + lVar136 + 0x1b18);
        fVar223 = *(float *)(bezier_basis0 + lVar136 + 0x1b1c);
        fVar307 = *(float *)(bezier_basis0 + lVar136 + 0x1b20);
        fVar304 = *(float *)(bezier_basis0 + lVar136 + 0x1b24);
        fVar305 = *(float *)(bezier_basis0 + lVar136 + 0x1b28);
        fVar225 = *(float *)(bezier_basis0 + lVar136 + 0x1b2c);
        fVar310 = *(float *)(bezier_basis0 + lVar136 + 0x1b30);
        fVar306 = *(float *)(bezier_basis0 + lVar136 + 0x1f9c);
        fVar309 = *(float *)(bezier_basis0 + lVar136 + 0x1fa0);
        fVar227 = *(float *)(bezier_basis0 + lVar136 + 0x1fa4);
        fVar312 = *(float *)(bezier_basis0 + lVar136 + 0x1fa8);
        fVar189 = *(float *)(bezier_basis0 + lVar136 + 0x1fac);
        fVar190 = *(float *)(bezier_basis0 + lVar136 + 0x1fb0);
        fVar206 = *(float *)(bezier_basis0 + lVar136 + 0x1fb4);
        fVar278 = *(float *)(bezier_basis0 + lVar136 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar136 + 0x1fb8);
        fVar276 = *(float *)(bezier_basis0 + lVar136 + 0x16b0) + fVar278;
        local_4c0 = fVar159 * fVar229 + fVar308 * fVar257 + fVar166 * fVar296 + fVar163 * fVar306;
        fStack_4bc = fVar160 * fVar240 + fVar311 * fVar258 + fVar183 * fVar223 + fVar164 * fVar309;
        fStack_4b8 = fVar161 * fVar242 + fVar313 * fVar259 + fVar185 * fVar307 + fVar165 * fVar227;
        fStack_4b4 = fVar162 * fVar244 + fVar314 * fVar260 + fVar141 * fVar304 + fVar167 * fVar312;
        fStack_4b0 = fVar159 * fVar246 + fVar308 * fVar261 + fVar166 * fVar305 + fVar163 * fVar189;
        fStack_4ac = fVar160 * fVar247 + fVar311 * fVar262 + fVar183 * fVar225 + fVar164 * fVar190;
        fStack_4a8 = fVar161 * fVar248 + fVar313 * fVar339 + fVar185 * fVar310 + fVar165 * fVar206;
        fStack_4a4 = *(float *)(bezier_basis0 + lVar136 + 0x16b0) +
                     *(float *)(bezier_basis0 + lVar136 + 0x1fb8) +
                     fVar292 + *(float *)(bezier_basis1 + lVar136 + 0x4a0);
        auVar286._0_4_ =
             fVar323 * fVar229 + fVar230 * fVar296 + fVar184 * fVar306 + fVar293 * fVar257;
        auVar286._4_4_ =
             fVar325 * fVar240 + fVar241 * fVar223 + fVar186 * fVar309 + fVar294 * fVar258;
        auVar286._8_4_ =
             fVar263 * fVar242 + fVar243 * fVar307 + fVar187 * fVar227 + fVar315 * fVar259;
        auVar286._12_4_ =
             fVar272 * fVar244 + fVar245 * fVar304 + fVar188 * fVar312 + fVar324 * fVar260;
        auVar286._16_4_ =
             fVar323 * fVar246 + fVar230 * fVar305 + fVar184 * fVar189 + fVar293 * fVar261;
        auVar286._20_4_ =
             fVar325 * fVar247 + fVar241 * fVar225 + fVar186 * fVar190 + fVar294 * fVar262;
        auVar286._24_4_ =
             fVar263 * fVar248 + fVar243 * fVar310 + fVar187 * fVar206 + fVar315 * fVar339;
        auVar286._28_4_ =
             fVar278 + fVar292 + *(float *)(bezier_basis1 + lVar136 + 0x1c) +
                       fVar292 + *(float *)(bezier_basis1 + lVar136 + 0x4a0);
        local_4e0._4_4_ =
             fVar327 * fVar258 + fVar352 * fVar223 + fVar273 * fVar309 + fVar279 * fVar240;
        local_4e0._0_4_ =
             fVar326 * fVar257 + fVar330 * fVar296 + fVar231 * fVar306 + fVar277 * fVar229;
        fStack_4d8 = fVar328 * fVar259 + fVar353 * fVar307 + fVar274 * fVar227 + fVar291 * fVar242;
        fStack_4d4 = fVar329 * fVar260 + fVar354 * fVar304 + fVar275 * fVar312 + fVar292 * fVar244;
        fStack_4d0 = fVar326 * fVar261 + fVar330 * fVar305 + fVar231 * fVar189 + fVar277 * fVar246;
        fStack_4cc = fVar327 * fVar262 + fVar352 * fVar225 + fVar273 * fVar190 + fVar279 * fVar247;
        fStack_4c8 = fVar328 * fVar339 + fVar353 * fVar310 + fVar274 * fVar206 + fVar291 * fVar248;
        fStack_4c4 = fVar276 + *(float *)(bezier_basis0 + lVar136 + 0x122c);
        fVar229 = *(float *)(bezier_basis1 + lVar136 + 0x1b18);
        fVar240 = *(float *)(bezier_basis1 + lVar136 + 0x1b1c);
        fVar242 = *(float *)(bezier_basis1 + lVar136 + 0x1b20);
        fVar244 = *(float *)(bezier_basis1 + lVar136 + 0x1b24);
        fVar246 = *(float *)(bezier_basis1 + lVar136 + 0x1b28);
        fVar247 = *(float *)(bezier_basis1 + lVar136 + 0x1b2c);
        fVar248 = *(float *)(bezier_basis1 + lVar136 + 0x1b30);
        fVar257 = *(float *)(bezier_basis1 + lVar136 + 0x1f9c);
        fVar258 = *(float *)(bezier_basis1 + lVar136 + 0x1fa0);
        fVar259 = *(float *)(bezier_basis1 + lVar136 + 0x1fa4);
        fVar260 = *(float *)(bezier_basis1 + lVar136 + 0x1fa8);
        fVar261 = *(float *)(bezier_basis1 + lVar136 + 0x1fac);
        fVar262 = *(float *)(bezier_basis1 + lVar136 + 0x1fb0);
        fVar339 = *(float *)(bezier_basis1 + lVar136 + 0x1fb4);
        fVar296 = *(float *)(bezier_basis1 + lVar136 + 0x1694);
        fVar223 = *(float *)(bezier_basis1 + lVar136 + 0x1698);
        fVar307 = *(float *)(bezier_basis1 + lVar136 + 0x169c);
        fVar304 = *(float *)(bezier_basis1 + lVar136 + 0x16a0);
        fVar305 = *(float *)(bezier_basis1 + lVar136 + 0x16a4);
        fVar225 = *(float *)(bezier_basis1 + lVar136 + 0x16a8);
        fVar310 = *(float *)(bezier_basis1 + lVar136 + 0x16ac);
        fVar306 = *(float *)(bezier_basis1 + lVar136 + 0x1210);
        fVar309 = *(float *)(bezier_basis1 + lVar136 + 0x1214);
        fVar227 = *(float *)(bezier_basis1 + lVar136 + 0x1218);
        fVar312 = *(float *)(bezier_basis1 + lVar136 + 0x121c);
        fVar189 = *(float *)(bezier_basis1 + lVar136 + 0x1220);
        fVar190 = *(float *)(bezier_basis1 + lVar136 + 0x1224);
        fVar206 = *(float *)(bezier_basis1 + lVar136 + 0x1228);
        auVar299._0_4_ =
             fVar159 * fVar306 + fVar308 * fVar296 + fVar166 * fVar229 + fVar163 * fVar257;
        auVar299._4_4_ =
             fVar160 * fVar309 + fVar311 * fVar223 + fVar183 * fVar240 + fVar164 * fVar258;
        auVar299._8_4_ =
             fVar161 * fVar227 + fVar313 * fVar307 + fVar185 * fVar242 + fVar165 * fVar259;
        auVar299._12_4_ =
             fVar162 * fVar312 + fVar314 * fVar304 + fVar141 * fVar244 + fVar167 * fVar260;
        auVar299._16_4_ =
             fVar159 * fVar189 + fVar308 * fVar305 + fVar166 * fVar246 + fVar163 * fVar261;
        auVar299._20_4_ =
             fVar160 * fVar190 + fVar311 * fVar225 + fVar183 * fVar247 + fVar164 * fVar262;
        auVar299._24_4_ =
             fVar161 * fVar206 + fVar313 * fVar310 + fVar185 * fVar248 + fVar165 * fVar339;
        auVar299._28_4_ = fVar245 + fVar245 + fVar292 + fVar276;
        auVar318._0_4_ =
             fVar323 * fVar306 + fVar293 * fVar296 + fVar230 * fVar229 + fVar184 * fVar257;
        auVar318._4_4_ =
             fVar325 * fVar309 + fVar294 * fVar223 + fVar241 * fVar240 + fVar186 * fVar258;
        auVar318._8_4_ =
             fVar263 * fVar227 + fVar315 * fVar307 + fVar243 * fVar242 + fVar187 * fVar259;
        auVar318._12_4_ =
             fVar272 * fVar312 + fVar324 * fVar304 + fVar245 * fVar244 + fVar188 * fVar260;
        auVar318._16_4_ =
             fVar323 * fVar189 + fVar293 * fVar305 + fVar230 * fVar246 + fVar184 * fVar261;
        auVar318._20_4_ =
             fVar325 * fVar190 + fVar294 * fVar225 + fVar241 * fVar247 + fVar186 * fVar262;
        auVar318._24_4_ =
             fVar263 * fVar206 + fVar315 * fVar310 + fVar243 * fVar248 + fVar187 * fVar339;
        auVar318._28_4_ = fVar245 + fVar245 + fVar245 + fVar292;
        auVar203._0_4_ =
             fVar277 * fVar306 + fVar326 * fVar296 + fVar330 * fVar229 + fVar257 * fVar231;
        auVar203._4_4_ =
             fVar279 * fVar309 + fVar327 * fVar223 + fVar352 * fVar240 + fVar258 * fVar273;
        auVar203._8_4_ =
             fVar291 * fVar227 + fVar328 * fVar307 + fVar353 * fVar242 + fVar259 * fVar274;
        auVar203._12_4_ =
             fVar292 * fVar312 + fVar329 * fVar304 + fVar354 * fVar244 + fVar260 * fVar275;
        auVar203._16_4_ =
             fVar277 * fVar189 + fVar326 * fVar305 + fVar330 * fVar246 + fVar261 * fVar231;
        auVar203._20_4_ =
             fVar279 * fVar190 + fVar327 * fVar225 + fVar352 * fVar247 + fVar262 * fVar273;
        auVar203._24_4_ =
             fVar291 * fVar206 + fVar328 * fVar310 + fVar353 * fVar248 + fVar339 * fVar274;
        auVar203._28_4_ =
             *(float *)(bezier_basis1 + lVar136 + 0x122c) +
             *(float *)(bezier_basis1 + lVar136 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar136 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar136 + 0x1fb8);
        auVar236._8_4_ = 0x7fffffff;
        auVar236._0_8_ = 0x7fffffff7fffffff;
        auVar236._12_4_ = 0x7fffffff;
        auVar236._16_4_ = 0x7fffffff;
        auVar236._20_4_ = 0x7fffffff;
        auVar236._24_4_ = 0x7fffffff;
        auVar236._28_4_ = 0x7fffffff;
        auVar123._4_4_ = fStack_4bc;
        auVar123._0_4_ = local_4c0;
        auVar123._8_4_ = fStack_4b8;
        auVar123._12_4_ = fStack_4b4;
        auVar123._16_4_ = fStack_4b0;
        auVar123._20_4_ = fStack_4ac;
        auVar123._24_4_ = fStack_4a8;
        auVar123._28_4_ = fStack_4a4;
        auVar25 = vandps_avx(auVar123,auVar236);
        auVar26 = vandps_avx(auVar286,auVar236);
        auVar26 = vmaxps_avx(auVar25,auVar26);
        auVar25 = vandps_avx(auVar236,_local_4e0);
        auVar25 = vmaxps_avx(auVar26,auVar25);
        auVar234 = vpermilps_avx(auVar210,0);
        auVar287._16_16_ = auVar234;
        auVar287._0_16_ = auVar234;
        auVar25 = vcmpps_avx(auVar25,auVar287,1);
        auVar29 = vblendvps_avx(auVar123,auVar27,auVar25);
        auVar30 = vblendvps_avx(auVar286,auVar28,auVar25);
        auVar25 = vandps_avx(auVar299,auVar236);
        auVar26 = vandps_avx(auVar318,auVar236);
        auVar31 = vmaxps_avx(auVar25,auVar26);
        auVar25 = vandps_avx(auVar203,auVar236);
        auVar25 = vmaxps_avx(auVar31,auVar25);
        auVar31 = vcmpps_avx(auVar25,auVar287,1);
        auVar25 = vblendvps_avx(auVar299,auVar27,auVar31);
        auVar27 = vblendvps_avx(auVar318,auVar28,auVar31);
        fVar159 = auVar29._0_4_;
        fVar160 = auVar29._4_4_;
        fVar161 = auVar29._8_4_;
        fVar162 = auVar29._12_4_;
        fVar163 = auVar29._16_4_;
        fVar164 = auVar29._20_4_;
        fVar165 = auVar29._24_4_;
        fVar167 = auVar25._0_4_;
        fVar184 = auVar25._4_4_;
        fVar186 = auVar25._8_4_;
        fVar187 = auVar25._12_4_;
        fVar189 = auVar25._16_4_;
        fVar190 = auVar25._20_4_;
        fVar206 = auVar25._24_4_;
        fVar278 = -auVar25._28_4_;
        fVar229 = auVar30._0_4_;
        fVar246 = auVar30._4_4_;
        fVar258 = auVar30._8_4_;
        fVar262 = auVar30._12_4_;
        fVar307 = auVar30._16_4_;
        fVar310 = auVar30._20_4_;
        fVar312 = auVar30._24_4_;
        auVar146._0_4_ = fVar229 * fVar229 + fVar159 * fVar159;
        auVar146._4_4_ = fVar246 * fVar246 + fVar160 * fVar160;
        auVar146._8_4_ = fVar258 * fVar258 + fVar161 * fVar161;
        auVar146._12_4_ = fVar262 * fVar262 + fVar162 * fVar162;
        auVar146._16_4_ = fVar307 * fVar307 + fVar163 * fVar163;
        auVar146._20_4_ = fVar310 * fVar310 + fVar164 * fVar164;
        auVar146._24_4_ = fVar312 * fVar312 + fVar165 * fVar165;
        auVar146._28_4_ = auVar318._28_4_ + auVar29._28_4_;
        auVar28 = vrsqrtps_avx(auVar146);
        fVar240 = auVar28._0_4_;
        fVar242 = auVar28._4_4_;
        auVar38._4_4_ = fVar242 * 1.5;
        auVar38._0_4_ = fVar240 * 1.5;
        fVar244 = auVar28._8_4_;
        auVar38._8_4_ = fVar244 * 1.5;
        fVar247 = auVar28._12_4_;
        auVar38._12_4_ = fVar247 * 1.5;
        fVar248 = auVar28._16_4_;
        auVar38._16_4_ = fVar248 * 1.5;
        fVar257 = auVar28._20_4_;
        auVar38._20_4_ = fVar257 * 1.5;
        fVar259 = auVar28._24_4_;
        fVar141 = auVar26._28_4_;
        auVar38._24_4_ = fVar259 * 1.5;
        auVar38._28_4_ = fVar141;
        auVar39._4_4_ = fVar242 * fVar242 * fVar242 * auVar146._4_4_ * 0.5;
        auVar39._0_4_ = fVar240 * fVar240 * fVar240 * auVar146._0_4_ * 0.5;
        auVar39._8_4_ = fVar244 * fVar244 * fVar244 * auVar146._8_4_ * 0.5;
        auVar39._12_4_ = fVar247 * fVar247 * fVar247 * auVar146._12_4_ * 0.5;
        auVar39._16_4_ = fVar248 * fVar248 * fVar248 * auVar146._16_4_ * 0.5;
        auVar39._20_4_ = fVar257 * fVar257 * fVar257 * auVar146._20_4_ * 0.5;
        auVar39._24_4_ = fVar259 * fVar259 * fVar259 * auVar146._24_4_ * 0.5;
        auVar39._28_4_ = auVar146._28_4_;
        auVar26 = vsubps_avx(auVar38,auVar39);
        fVar240 = auVar26._0_4_;
        fVar247 = auVar26._4_4_;
        fVar259 = auVar26._8_4_;
        fVar339 = auVar26._12_4_;
        fVar304 = auVar26._16_4_;
        fVar306 = auVar26._20_4_;
        fVar166 = auVar26._24_4_;
        fVar242 = auVar27._0_4_;
        fVar248 = auVar27._4_4_;
        fVar260 = auVar27._8_4_;
        fVar296 = auVar27._12_4_;
        fVar305 = auVar27._16_4_;
        fVar309 = auVar27._20_4_;
        fVar183 = auVar27._24_4_;
        auVar147._0_4_ = fVar242 * fVar242 + fVar167 * fVar167;
        auVar147._4_4_ = fVar248 * fVar248 + fVar184 * fVar184;
        auVar147._8_4_ = fVar260 * fVar260 + fVar186 * fVar186;
        auVar147._12_4_ = fVar296 * fVar296 + fVar187 * fVar187;
        auVar147._16_4_ = fVar305 * fVar305 + fVar189 * fVar189;
        auVar147._20_4_ = fVar309 * fVar309 + fVar190 * fVar190;
        auVar147._24_4_ = fVar183 * fVar183 + fVar206 * fVar206;
        auVar147._28_4_ = auVar25._28_4_ + auVar26._28_4_;
        auVar25 = vrsqrtps_avx(auVar147);
        fVar244 = auVar25._0_4_;
        fVar257 = auVar25._4_4_;
        auVar40._4_4_ = fVar257 * 1.5;
        auVar40._0_4_ = fVar244 * 1.5;
        fVar261 = auVar25._8_4_;
        auVar40._8_4_ = fVar261 * 1.5;
        fVar223 = auVar25._12_4_;
        auVar40._12_4_ = fVar223 * 1.5;
        fVar225 = auVar25._16_4_;
        auVar40._16_4_ = fVar225 * 1.5;
        fVar227 = auVar25._20_4_;
        auVar40._20_4_ = fVar227 * 1.5;
        fVar185 = auVar25._24_4_;
        auVar40._24_4_ = fVar185 * 1.5;
        auVar40._28_4_ = fVar141;
        auVar41._4_4_ = fVar257 * fVar257 * fVar257 * auVar147._4_4_ * 0.5;
        auVar41._0_4_ = fVar244 * fVar244 * fVar244 * auVar147._0_4_ * 0.5;
        auVar41._8_4_ = fVar261 * fVar261 * fVar261 * auVar147._8_4_ * 0.5;
        auVar41._12_4_ = fVar223 * fVar223 * fVar223 * auVar147._12_4_ * 0.5;
        auVar41._16_4_ = fVar225 * fVar225 * fVar225 * auVar147._16_4_ * 0.5;
        auVar41._20_4_ = fVar227 * fVar227 * fVar227 * auVar147._20_4_ * 0.5;
        auVar41._24_4_ = fVar185 * fVar185 * fVar185 * auVar147._24_4_ * 0.5;
        auVar41._28_4_ = auVar147._28_4_;
        auVar25 = vsubps_avx(auVar40,auVar41);
        fVar244 = auVar25._0_4_;
        fVar257 = auVar25._4_4_;
        fVar261 = auVar25._8_4_;
        fVar223 = auVar25._12_4_;
        fVar225 = auVar25._16_4_;
        fVar227 = auVar25._20_4_;
        fVar185 = auVar25._24_4_;
        fVar229 = (float)local_7c0._0_4_ * fVar229 * fVar240;
        fVar246 = (float)local_7c0._4_4_ * fVar246 * fVar247;
        auVar42._4_4_ = fVar246;
        auVar42._0_4_ = fVar229;
        fVar258 = fStack_7b8 * fVar258 * fVar259;
        auVar42._8_4_ = fVar258;
        fVar262 = fStack_7b4 * fVar262 * fVar339;
        auVar42._12_4_ = fVar262;
        fVar307 = fStack_7b0 * fVar307 * fVar304;
        auVar42._16_4_ = fVar307;
        fVar310 = fStack_7ac * fVar310 * fVar306;
        auVar42._20_4_ = fVar310;
        fVar312 = fStack_7a8 * fVar312 * fVar166;
        auVar42._24_4_ = fVar312;
        auVar42._28_4_ = fVar278;
        local_660._4_4_ = fVar246 + auVar337._4_4_;
        local_660._0_4_ = fVar229 + auVar337._0_4_;
        fStack_658 = fVar258 + auVar337._8_4_;
        fStack_654 = fVar262 + auVar337._12_4_;
        fStack_650 = fVar307 + auVar337._16_4_;
        fStack_64c = fVar310 + auVar337._20_4_;
        fStack_648 = fVar312 + auVar337._24_4_;
        fStack_644 = fVar278 + auVar337._28_4_;
        fVar229 = (float)local_7c0._0_4_ * fVar240 * -fVar159;
        fVar246 = (float)local_7c0._4_4_ * fVar247 * -fVar160;
        auVar43._4_4_ = fVar246;
        auVar43._0_4_ = fVar229;
        fVar258 = fStack_7b8 * fVar259 * -fVar161;
        auVar43._8_4_ = fVar258;
        fVar262 = fStack_7b4 * fVar339 * -fVar162;
        auVar43._12_4_ = fVar262;
        fVar307 = fStack_7b0 * fVar304 * -fVar163;
        auVar43._16_4_ = fVar307;
        fVar310 = fStack_7ac * fVar306 * -fVar164;
        auVar43._20_4_ = fVar310;
        fVar312 = fStack_7a8 * fVar166 * -fVar165;
        auVar43._24_4_ = fVar312;
        auVar43._28_4_ = fVar141;
        local_580._4_4_ = fVar246 + auVar269._4_4_;
        local_580._0_4_ = fVar229 + auVar269._0_4_;
        fStack_578 = fVar258 + auVar269._8_4_;
        fStack_574 = fVar262 + auVar269._12_4_;
        fStack_570 = fVar307 + auVar269._16_4_;
        fStack_56c = fVar310 + auVar269._20_4_;
        fStack_568 = fVar312 + auVar269._24_4_;
        fStack_564 = fVar141 + auVar269._28_4_;
        fVar229 = fVar240 * 0.0 * (float)local_7c0._0_4_;
        fVar240 = fVar247 * 0.0 * (float)local_7c0._4_4_;
        auVar44._4_4_ = fVar240;
        auVar44._0_4_ = fVar229;
        fVar246 = fVar259 * 0.0 * fStack_7b8;
        auVar44._8_4_ = fVar246;
        fVar247 = fVar339 * 0.0 * fStack_7b4;
        auVar44._12_4_ = fVar247;
        fVar258 = fVar304 * 0.0 * fStack_7b0;
        auVar44._16_4_ = fVar258;
        fVar259 = fVar306 * 0.0 * fStack_7ac;
        auVar44._20_4_ = fVar259;
        fVar262 = fVar166 * 0.0 * fStack_7a8;
        auVar44._24_4_ = fVar262;
        auVar44._28_4_ = fVar188;
        auVar288._0_4_ = fVar229 + (float)local_5e0._0_4_;
        auVar288._4_4_ = fVar240 + (float)local_5e0._4_4_;
        auVar288._8_4_ = fVar246 + fStack_5d8;
        auVar288._12_4_ = fVar247 + fStack_5d4;
        auVar288._16_4_ = fVar258 + fStack_5d0;
        auVar288._20_4_ = fVar259 + fStack_5cc;
        auVar288._24_4_ = fVar262 + fStack_5c8;
        auVar288._28_4_ = fVar188 + fStack_5c4;
        fVar229 = auVar254._0_4_ * fVar242 * fVar244;
        fVar240 = auVar254._4_4_ * fVar248 * fVar257;
        auVar45._4_4_ = fVar240;
        auVar45._0_4_ = fVar229;
        fVar242 = auVar254._8_4_ * fVar260 * fVar261;
        auVar45._8_4_ = fVar242;
        fVar246 = auVar254._12_4_ * fVar296 * fVar223;
        auVar45._12_4_ = fVar246;
        fVar247 = auVar254._16_4_ * fVar305 * fVar225;
        auVar45._16_4_ = fVar247;
        fVar248 = auVar254._20_4_ * fVar309 * fVar227;
        auVar45._20_4_ = fVar248;
        fVar258 = auVar254._24_4_ * fVar183 * fVar185;
        auVar45._24_4_ = fVar258;
        auVar45._28_4_ = auVar27._28_4_;
        auVar31 = vsubps_avx(auVar337,auVar42);
        auVar319._0_4_ = auVar235._0_4_ + fVar229;
        auVar319._4_4_ = auVar235._4_4_ + fVar240;
        auVar319._8_4_ = auVar235._8_4_ + fVar242;
        auVar319._12_4_ = auVar235._12_4_ + fVar246;
        auVar319._16_4_ = auVar235._16_4_ + fVar247;
        auVar319._20_4_ = auVar235._20_4_ + fVar248;
        auVar319._24_4_ = auVar235._24_4_ + fVar258;
        auVar319._28_4_ = auVar235._28_4_ + auVar27._28_4_;
        fVar229 = auVar254._0_4_ * -fVar167 * fVar244;
        fVar240 = auVar254._4_4_ * -fVar184 * fVar257;
        auVar46._4_4_ = fVar240;
        auVar46._0_4_ = fVar229;
        fVar242 = auVar254._8_4_ * -fVar186 * fVar261;
        auVar46._8_4_ = fVar242;
        fVar246 = auVar254._12_4_ * -fVar187 * fVar223;
        auVar46._12_4_ = fVar246;
        fVar247 = auVar254._16_4_ * -fVar189 * fVar225;
        auVar46._16_4_ = fVar247;
        fVar248 = auVar254._20_4_ * -fVar190 * fVar227;
        auVar46._20_4_ = fVar248;
        fVar258 = auVar254._24_4_ * -fVar206 * fVar185;
        auVar46._24_4_ = fVar258;
        auVar46._28_4_ = fVar329;
        auVar32 = vsubps_avx(auVar269,auVar43);
        auVar332._0_4_ = fVar229 + (float)local_4a0._0_4_;
        auVar332._4_4_ = fVar240 + (float)local_4a0._4_4_;
        auVar332._8_4_ = fVar242 + fStack_498;
        auVar332._12_4_ = fVar246 + fStack_494;
        auVar332._16_4_ = fVar247 + fStack_490;
        auVar332._20_4_ = fVar248 + fStack_48c;
        auVar332._24_4_ = fVar258 + fStack_488;
        auVar332._28_4_ = fVar329 + fStack_484;
        fVar229 = fVar244 * 0.0 * auVar254._0_4_;
        fVar240 = fVar257 * 0.0 * auVar254._4_4_;
        auVar47._4_4_ = fVar240;
        auVar47._0_4_ = fVar229;
        fVar242 = fVar261 * 0.0 * auVar254._8_4_;
        auVar47._8_4_ = fVar242;
        fVar244 = fVar223 * 0.0 * auVar254._12_4_;
        auVar47._12_4_ = fVar244;
        fVar246 = fVar225 * 0.0 * auVar254._16_4_;
        auVar47._16_4_ = fVar246;
        fVar247 = fVar227 * 0.0 * auVar254._20_4_;
        auVar47._20_4_ = fVar247;
        fVar248 = fVar185 * 0.0 * auVar254._24_4_;
        auVar47._24_4_ = fVar248;
        auVar47._28_4_ = fVar354;
        auVar144 = vsubps_avx(_local_5e0,auVar44);
        auVar356._0_4_ = fVar229 + (float)local_500._0_4_;
        auVar356._4_4_ = fVar240 + (float)local_500._4_4_;
        auVar356._8_4_ = fVar242 + fStack_4f8;
        auVar356._12_4_ = fVar244 + fStack_4f4;
        auVar356._16_4_ = fVar246 + fStack_4f0;
        auVar356._20_4_ = fVar247 + fStack_4ec;
        auVar356._24_4_ = fVar248 + fStack_4e8;
        auVar356._28_4_ = fVar354 + fStack_4e4;
        auVar25 = vsubps_avx(auVar235,auVar45);
        auVar26 = vsubps_avx(_local_4a0,auVar46);
        auVar27 = vsubps_avx(_local_500,auVar47);
        auVar28 = vsubps_avx(auVar332,auVar32);
        auVar29 = vsubps_avx(auVar356,auVar144);
        auVar48._4_4_ = auVar144._4_4_ * auVar28._4_4_;
        auVar48._0_4_ = auVar144._0_4_ * auVar28._0_4_;
        auVar48._8_4_ = auVar144._8_4_ * auVar28._8_4_;
        auVar48._12_4_ = auVar144._12_4_ * auVar28._12_4_;
        auVar48._16_4_ = auVar144._16_4_ * auVar28._16_4_;
        auVar48._20_4_ = auVar144._20_4_ * auVar28._20_4_;
        auVar48._24_4_ = auVar144._24_4_ * auVar28._24_4_;
        auVar48._28_4_ = fVar354;
        auVar49._4_4_ = auVar32._4_4_ * auVar29._4_4_;
        auVar49._0_4_ = auVar32._0_4_ * auVar29._0_4_;
        auVar49._8_4_ = auVar32._8_4_ * auVar29._8_4_;
        auVar49._12_4_ = auVar32._12_4_ * auVar29._12_4_;
        auVar49._16_4_ = auVar32._16_4_ * auVar29._16_4_;
        auVar49._20_4_ = auVar32._20_4_ * auVar29._20_4_;
        auVar49._24_4_ = auVar32._24_4_ * auVar29._24_4_;
        auVar49._28_4_ = fStack_484;
        auVar30 = vsubps_avx(auVar49,auVar48);
        auVar50._4_4_ = auVar31._4_4_ * auVar29._4_4_;
        auVar50._0_4_ = auVar31._0_4_ * auVar29._0_4_;
        auVar50._8_4_ = auVar31._8_4_ * auVar29._8_4_;
        auVar50._12_4_ = auVar31._12_4_ * auVar29._12_4_;
        auVar50._16_4_ = auVar31._16_4_ * auVar29._16_4_;
        auVar50._20_4_ = auVar31._20_4_ * auVar29._20_4_;
        auVar50._24_4_ = auVar31._24_4_ * auVar29._24_4_;
        auVar50._28_4_ = auVar29._28_4_;
        auVar24 = vsubps_avx(auVar319,auVar31);
        auVar51._4_4_ = auVar144._4_4_ * auVar24._4_4_;
        auVar51._0_4_ = auVar144._0_4_ * auVar24._0_4_;
        auVar51._8_4_ = auVar144._8_4_ * auVar24._8_4_;
        auVar51._12_4_ = auVar144._12_4_ * auVar24._12_4_;
        auVar51._16_4_ = auVar144._16_4_ * auVar24._16_4_;
        auVar51._20_4_ = auVar144._20_4_ * auVar24._20_4_;
        auVar51._24_4_ = auVar144._24_4_ * auVar24._24_4_;
        auVar51._28_4_ = auVar235._28_4_;
        auVar33 = vsubps_avx(auVar51,auVar50);
        auVar52._4_4_ = auVar24._4_4_ * auVar32._4_4_;
        auVar52._0_4_ = auVar24._0_4_ * auVar32._0_4_;
        auVar52._8_4_ = auVar24._8_4_ * auVar32._8_4_;
        auVar52._12_4_ = auVar24._12_4_ * auVar32._12_4_;
        auVar52._16_4_ = auVar24._16_4_ * auVar32._16_4_;
        auVar52._20_4_ = auVar24._20_4_ * auVar32._20_4_;
        auVar52._24_4_ = auVar24._24_4_ * auVar32._24_4_;
        auVar52._28_4_ = auVar29._28_4_;
        auVar53._4_4_ = auVar31._4_4_ * auVar28._4_4_;
        auVar53._0_4_ = auVar31._0_4_ * auVar28._0_4_;
        auVar53._8_4_ = auVar31._8_4_ * auVar28._8_4_;
        auVar53._12_4_ = auVar31._12_4_ * auVar28._12_4_;
        auVar53._16_4_ = auVar31._16_4_ * auVar28._16_4_;
        auVar53._20_4_ = auVar31._20_4_ * auVar28._20_4_;
        auVar53._24_4_ = auVar31._24_4_ * auVar28._24_4_;
        auVar53._28_4_ = auVar28._28_4_;
        auVar28 = vsubps_avx(auVar53,auVar52);
        auVar148._0_4_ = auVar30._0_4_ * 0.0 + auVar28._0_4_ + auVar33._0_4_ * 0.0;
        auVar148._4_4_ = auVar30._4_4_ * 0.0 + auVar28._4_4_ + auVar33._4_4_ * 0.0;
        auVar148._8_4_ = auVar30._8_4_ * 0.0 + auVar28._8_4_ + auVar33._8_4_ * 0.0;
        auVar148._12_4_ = auVar30._12_4_ * 0.0 + auVar28._12_4_ + auVar33._12_4_ * 0.0;
        auVar148._16_4_ = auVar30._16_4_ * 0.0 + auVar28._16_4_ + auVar33._16_4_ * 0.0;
        auVar148._20_4_ = auVar30._20_4_ * 0.0 + auVar28._20_4_ + auVar33._20_4_ * 0.0;
        auVar148._24_4_ = auVar30._24_4_ * 0.0 + auVar28._24_4_ + auVar33._24_4_ * 0.0;
        auVar148._28_4_ = auVar28._28_4_ + auVar28._28_4_ + auVar33._28_4_;
        auVar33 = vcmpps_avx(auVar148,ZEXT432(0) << 0x20,2);
        auVar25 = vblendvps_avx(auVar25,_local_660,auVar33);
        auVar26 = vblendvps_avx(auVar26,_local_580,auVar33);
        auVar27 = vblendvps_avx(auVar27,auVar288,auVar33);
        auVar28 = vblendvps_avx(auVar31,auVar319,auVar33);
        auVar29 = vblendvps_avx(auVar32,auVar332,auVar33);
        auVar30 = vblendvps_avx(auVar144,auVar356,auVar33);
        auVar31 = vblendvps_avx(auVar319,auVar31,auVar33);
        auVar32 = vblendvps_avx(auVar332,auVar32,auVar33);
        auVar234 = vpackssdw_avx(local_320._0_16_,local_320._16_16_);
        _auStack_6b0 = auVar337._16_16_;
        auVar24 = vblendvps_avx(auVar356,auVar144,auVar33);
        auVar31 = vsubps_avx(auVar31,auVar25);
        auVar145 = vsubps_avx(auVar32,auVar26);
        auVar24 = vsubps_avx(auVar24,auVar27);
        auVar172 = vsubps_avx(auVar26,auVar29);
        fVar229 = auVar145._0_4_;
        fVar165 = auVar27._0_4_;
        fVar247 = auVar145._4_4_;
        fVar167 = auVar27._4_4_;
        auVar54._4_4_ = fVar167 * fVar247;
        auVar54._0_4_ = fVar165 * fVar229;
        fVar260 = auVar145._8_4_;
        fVar184 = auVar27._8_4_;
        auVar54._8_4_ = fVar184 * fVar260;
        fVar223 = auVar145._12_4_;
        fVar186 = auVar27._12_4_;
        auVar54._12_4_ = fVar186 * fVar223;
        fVar310 = auVar145._16_4_;
        fVar187 = auVar27._16_4_;
        auVar54._16_4_ = fVar187 * fVar310;
        fVar166 = auVar145._20_4_;
        fVar188 = auVar27._20_4_;
        auVar54._20_4_ = fVar188 * fVar166;
        fVar160 = auVar145._24_4_;
        fVar189 = auVar27._24_4_;
        auVar54._24_4_ = fVar189 * fVar160;
        auVar54._28_4_ = auVar32._28_4_;
        fVar240 = auVar26._0_4_;
        fVar314 = auVar24._0_4_;
        fVar248 = auVar26._4_4_;
        fVar323 = auVar24._4_4_;
        auVar55._4_4_ = fVar323 * fVar248;
        auVar55._0_4_ = fVar314 * fVar240;
        fVar261 = auVar26._8_4_;
        fVar325 = auVar24._8_4_;
        auVar55._8_4_ = fVar325 * fVar261;
        fVar307 = auVar26._12_4_;
        fVar263 = auVar24._12_4_;
        auVar55._12_4_ = fVar263 * fVar307;
        fVar306 = auVar26._16_4_;
        fVar272 = auVar24._16_4_;
        auVar55._16_4_ = fVar272 * fVar306;
        fVar183 = auVar26._20_4_;
        fVar273 = auVar24._20_4_;
        auVar55._20_4_ = fVar273 * fVar183;
        fVar161 = auVar26._24_4_;
        fVar274 = auVar24._24_4_;
        uVar7 = auVar144._28_4_;
        auVar55._24_4_ = fVar274 * fVar161;
        auVar55._28_4_ = uVar7;
        auVar32 = vsubps_avx(auVar55,auVar54);
        fVar242 = auVar25._0_4_;
        fVar257 = auVar25._4_4_;
        auVar56._4_4_ = fVar323 * fVar257;
        auVar56._0_4_ = fVar314 * fVar242;
        fVar262 = auVar25._8_4_;
        auVar56._8_4_ = fVar325 * fVar262;
        fVar304 = auVar25._12_4_;
        auVar56._12_4_ = fVar263 * fVar304;
        fVar309 = auVar25._16_4_;
        auVar56._16_4_ = fVar272 * fVar309;
        fVar185 = auVar25._20_4_;
        auVar56._20_4_ = fVar273 * fVar185;
        fVar162 = auVar25._24_4_;
        auVar56._24_4_ = fVar274 * fVar162;
        auVar56._28_4_ = uVar7;
        fVar244 = auVar31._0_4_;
        auVar350._0_4_ = fVar165 * fVar244;
        fVar258 = auVar31._4_4_;
        auVar350._4_4_ = fVar167 * fVar258;
        fVar339 = auVar31._8_4_;
        auVar350._8_4_ = fVar184 * fVar339;
        fVar305 = auVar31._12_4_;
        auVar350._12_4_ = fVar186 * fVar305;
        fVar227 = auVar31._16_4_;
        auVar350._16_4_ = fVar187 * fVar227;
        fVar141 = auVar31._20_4_;
        auVar350._20_4_ = fVar188 * fVar141;
        fVar163 = auVar31._24_4_;
        auVar350._24_4_ = fVar189 * fVar163;
        auVar350._28_4_ = 0;
        auVar144 = vsubps_avx(auVar350,auVar56);
        auVar57._4_4_ = fVar248 * fVar258;
        auVar57._0_4_ = fVar240 * fVar244;
        auVar57._8_4_ = fVar261 * fVar339;
        auVar57._12_4_ = fVar307 * fVar305;
        auVar57._16_4_ = fVar306 * fVar227;
        auVar57._20_4_ = fVar183 * fVar141;
        auVar57._24_4_ = fVar161 * fVar163;
        auVar57._28_4_ = uVar7;
        auVar58._4_4_ = fVar257 * fVar247;
        auVar58._0_4_ = fVar242 * fVar229;
        auVar58._8_4_ = fVar262 * fVar260;
        auVar58._12_4_ = fVar304 * fVar223;
        auVar58._16_4_ = fVar309 * fVar310;
        auVar58._20_4_ = fVar185 * fVar166;
        auVar58._24_4_ = fVar162 * fVar160;
        auVar58._28_4_ = auVar356._28_4_;
        auVar173 = vsubps_avx(auVar58,auVar57);
        auVar174 = vsubps_avx(auVar27,auVar30);
        fVar246 = auVar173._28_4_ + auVar144._28_4_;
        auVar289._0_4_ = auVar173._0_4_ + auVar144._0_4_ * 0.0 + auVar32._0_4_ * 0.0;
        auVar289._4_4_ = auVar173._4_4_ + auVar144._4_4_ * 0.0 + auVar32._4_4_ * 0.0;
        auVar289._8_4_ = auVar173._8_4_ + auVar144._8_4_ * 0.0 + auVar32._8_4_ * 0.0;
        auVar289._12_4_ = auVar173._12_4_ + auVar144._12_4_ * 0.0 + auVar32._12_4_ * 0.0;
        auVar289._16_4_ = auVar173._16_4_ + auVar144._16_4_ * 0.0 + auVar32._16_4_ * 0.0;
        auVar289._20_4_ = auVar173._20_4_ + auVar144._20_4_ * 0.0 + auVar32._20_4_ * 0.0;
        auVar289._24_4_ = auVar173._24_4_ + auVar144._24_4_ * 0.0 + auVar32._24_4_ * 0.0;
        auVar289._28_4_ = fVar246 + auVar32._28_4_;
        fVar190 = auVar172._0_4_;
        fVar206 = auVar172._4_4_;
        auVar59._4_4_ = fVar206 * auVar30._4_4_;
        auVar59._0_4_ = fVar190 * auVar30._0_4_;
        fVar278 = auVar172._8_4_;
        auVar59._8_4_ = fVar278 * auVar30._8_4_;
        fVar231 = auVar172._12_4_;
        auVar59._12_4_ = fVar231 * auVar30._12_4_;
        fVar308 = auVar172._16_4_;
        auVar59._16_4_ = fVar308 * auVar30._16_4_;
        fVar311 = auVar172._20_4_;
        auVar59._20_4_ = fVar311 * auVar30._20_4_;
        fVar313 = auVar172._24_4_;
        auVar59._24_4_ = fVar313 * auVar30._24_4_;
        auVar59._28_4_ = fVar246;
        fVar246 = auVar174._0_4_;
        fVar259 = auVar174._4_4_;
        auVar60._4_4_ = auVar29._4_4_ * fVar259;
        auVar60._0_4_ = auVar29._0_4_ * fVar246;
        fVar296 = auVar174._8_4_;
        auVar60._8_4_ = auVar29._8_4_ * fVar296;
        fVar225 = auVar174._12_4_;
        auVar60._12_4_ = auVar29._12_4_ * fVar225;
        fVar312 = auVar174._16_4_;
        auVar60._16_4_ = auVar29._16_4_ * fVar312;
        fVar159 = auVar174._20_4_;
        auVar60._20_4_ = auVar29._20_4_ * fVar159;
        fVar164 = auVar174._24_4_;
        auVar60._24_4_ = auVar29._24_4_ * fVar164;
        auVar60._28_4_ = auVar173._28_4_;
        auVar144 = vsubps_avx(auVar60,auVar59);
        auVar172 = vsubps_avx(auVar25,auVar28);
        fVar275 = auVar172._0_4_;
        fVar276 = auVar172._4_4_;
        auVar61._4_4_ = fVar276 * auVar30._4_4_;
        auVar61._0_4_ = fVar275 * auVar30._0_4_;
        fVar277 = auVar172._8_4_;
        auVar61._8_4_ = fVar277 * auVar30._8_4_;
        fVar279 = auVar172._12_4_;
        auVar61._12_4_ = fVar279 * auVar30._12_4_;
        fVar291 = auVar172._16_4_;
        auVar61._16_4_ = fVar291 * auVar30._16_4_;
        fVar292 = auVar172._20_4_;
        auVar61._20_4_ = fVar292 * auVar30._20_4_;
        fVar293 = auVar172._24_4_;
        auVar61._24_4_ = fVar293 * auVar30._24_4_;
        auVar61._28_4_ = auVar30._28_4_;
        auVar62._4_4_ = auVar28._4_4_ * fVar259;
        auVar62._0_4_ = auVar28._0_4_ * fVar246;
        auVar62._8_4_ = auVar28._8_4_ * fVar296;
        auVar62._12_4_ = auVar28._12_4_ * fVar225;
        auVar62._16_4_ = auVar28._16_4_ * fVar312;
        auVar62._20_4_ = auVar28._20_4_ * fVar159;
        auVar62._24_4_ = auVar28._24_4_ * fVar164;
        auVar62._28_4_ = auVar32._28_4_;
        auVar32 = vsubps_avx(auVar61,auVar62);
        auVar63._4_4_ = auVar29._4_4_ * fVar276;
        auVar63._0_4_ = auVar29._0_4_ * fVar275;
        auVar63._8_4_ = auVar29._8_4_ * fVar277;
        auVar63._12_4_ = auVar29._12_4_ * fVar279;
        auVar63._16_4_ = auVar29._16_4_ * fVar291;
        auVar63._20_4_ = auVar29._20_4_ * fVar292;
        auVar63._24_4_ = auVar29._24_4_ * fVar293;
        auVar63._28_4_ = auVar30._28_4_;
        auVar64._4_4_ = auVar28._4_4_ * fVar206;
        auVar64._0_4_ = auVar28._0_4_ * fVar190;
        auVar64._8_4_ = auVar28._8_4_ * fVar278;
        auVar64._12_4_ = auVar28._12_4_ * fVar231;
        auVar64._16_4_ = auVar28._16_4_ * fVar308;
        auVar64._20_4_ = auVar28._20_4_ * fVar311;
        auVar64._24_4_ = auVar28._24_4_ * fVar313;
        auVar64._28_4_ = auVar28._28_4_;
        auVar28 = vsubps_avx(auVar64,auVar63);
        auVar158 = ZEXT864(0) << 0x20;
        auVar237._0_4_ = auVar144._0_4_ * 0.0 + auVar28._0_4_ + auVar32._0_4_ * 0.0;
        auVar237._4_4_ = auVar144._4_4_ * 0.0 + auVar28._4_4_ + auVar32._4_4_ * 0.0;
        auVar237._8_4_ = auVar144._8_4_ * 0.0 + auVar28._8_4_ + auVar32._8_4_ * 0.0;
        auVar237._12_4_ = auVar144._12_4_ * 0.0 + auVar28._12_4_ + auVar32._12_4_ * 0.0;
        auVar237._16_4_ = auVar144._16_4_ * 0.0 + auVar28._16_4_ + auVar32._16_4_ * 0.0;
        auVar237._20_4_ = auVar144._20_4_ * 0.0 + auVar28._20_4_ + auVar32._20_4_ * 0.0;
        auVar237._24_4_ = auVar144._24_4_ * 0.0 + auVar28._24_4_ + auVar32._24_4_ * 0.0;
        auVar237._28_4_ = auVar28._28_4_ + auVar28._28_4_ + auVar32._28_4_;
        auVar28 = vmaxps_avx(auVar289,auVar237);
        auVar28 = vcmpps_avx(auVar28,ZEXT832(0) << 0x20,2);
        auVar195 = vpackssdw_avx(auVar28._0_16_,auVar28._16_16_);
        auVar234 = vpand_avx(auVar195,auVar234);
        auVar195 = vpmovsxwd_avx(auVar234);
        auVar210 = vpunpckhwd_avx(auVar234,auVar234);
        auVar215._16_16_ = auVar210;
        auVar215._0_16_ = auVar195;
        if ((((((((auVar215 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar215 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar215 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar215 >> 0x7f,0) == '\0') &&
              (auVar215 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar210 >> 0x3f,0) == '\0') &&
            (auVar215 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar210[0xf]) {
LAB_00ff9c36:
          auVar302 = ZEXT3264(auVar150);
          auVar219 = ZEXT3264(auVar215);
          auVar157 = ZEXT3264(CONCAT824(local_560[1]._24_8_,
                                        CONCAT816(local_560[1]._16_8_,
                                                  CONCAT88(local_560[1]._8_8_,local_560[1]._0_8_))))
          ;
        }
        else {
          auVar65._4_4_ = fVar259 * fVar247;
          auVar65._0_4_ = fVar246 * fVar229;
          auVar65._8_4_ = fVar296 * fVar260;
          auVar65._12_4_ = fVar225 * fVar223;
          auVar65._16_4_ = fVar312 * fVar310;
          auVar65._20_4_ = fVar159 * fVar166;
          auVar65._24_4_ = fVar164 * fVar160;
          auVar65._28_4_ = auVar210._12_4_;
          auVar341._0_4_ = fVar190 * fVar314;
          auVar341._4_4_ = fVar206 * fVar323;
          auVar341._8_4_ = fVar278 * fVar325;
          auVar341._12_4_ = fVar231 * fVar263;
          auVar341._16_4_ = fVar308 * fVar272;
          auVar341._20_4_ = fVar311 * fVar273;
          auVar341._24_4_ = fVar313 * fVar274;
          auVar341._28_4_ = 0;
          auVar28 = vsubps_avx(auVar341,auVar65);
          auVar66._4_4_ = fVar276 * fVar323;
          auVar66._0_4_ = fVar275 * fVar314;
          auVar66._8_4_ = fVar277 * fVar325;
          auVar66._12_4_ = fVar279 * fVar263;
          auVar66._16_4_ = fVar291 * fVar272;
          auVar66._20_4_ = fVar292 * fVar273;
          auVar66._24_4_ = fVar293 * fVar274;
          auVar66._28_4_ = auVar24._28_4_;
          auVar67._4_4_ = fVar259 * fVar258;
          auVar67._0_4_ = fVar246 * fVar244;
          auVar67._8_4_ = fVar296 * fVar339;
          auVar67._12_4_ = fVar225 * fVar305;
          auVar67._16_4_ = fVar312 * fVar227;
          auVar67._20_4_ = fVar159 * fVar141;
          auVar67._24_4_ = fVar164 * fVar163;
          auVar67._28_4_ = auVar174._28_4_;
          auVar30 = vsubps_avx(auVar67,auVar66);
          auVar68._4_4_ = fVar206 * fVar258;
          auVar68._0_4_ = fVar190 * fVar244;
          auVar68._8_4_ = fVar278 * fVar339;
          auVar68._12_4_ = fVar231 * fVar305;
          auVar68._16_4_ = fVar308 * fVar227;
          auVar68._20_4_ = fVar311 * fVar141;
          auVar68._24_4_ = fVar313 * fVar163;
          auVar68._28_4_ = auVar31._28_4_;
          auVar69._4_4_ = fVar276 * fVar247;
          auVar69._0_4_ = fVar275 * fVar229;
          auVar69._8_4_ = fVar277 * fVar260;
          auVar69._12_4_ = fVar279 * fVar223;
          auVar69._16_4_ = fVar291 * fVar310;
          auVar69._20_4_ = fVar292 * fVar166;
          auVar69._24_4_ = fVar293 * fVar160;
          auVar69._28_4_ = auVar289._28_4_;
          auVar32 = vsubps_avx(auVar69,auVar68);
          auVar290._0_4_ = auVar28._0_4_ * 0.0 + auVar32._0_4_ + auVar30._0_4_ * 0.0;
          auVar290._4_4_ = auVar28._4_4_ * 0.0 + auVar32._4_4_ + auVar30._4_4_ * 0.0;
          auVar290._8_4_ = auVar28._8_4_ * 0.0 + auVar32._8_4_ + auVar30._8_4_ * 0.0;
          auVar290._12_4_ = auVar28._12_4_ * 0.0 + auVar32._12_4_ + auVar30._12_4_ * 0.0;
          auVar290._16_4_ = auVar28._16_4_ * 0.0 + auVar32._16_4_ + auVar30._16_4_ * 0.0;
          auVar290._20_4_ = auVar28._20_4_ * 0.0 + auVar32._20_4_ + auVar30._20_4_ * 0.0;
          auVar290._24_4_ = auVar28._24_4_ * 0.0 + auVar32._24_4_ + auVar30._24_4_ * 0.0;
          auVar290._28_4_ = auVar289._28_4_ + auVar32._28_4_ + auVar31._28_4_;
          auVar29 = vrcpps_avx(auVar290);
          fVar229 = auVar29._0_4_;
          fVar244 = auVar29._4_4_;
          auVar70._4_4_ = auVar290._4_4_ * fVar244;
          auVar70._0_4_ = auVar290._0_4_ * fVar229;
          fVar246 = auVar29._8_4_;
          auVar70._8_4_ = auVar290._8_4_ * fVar246;
          fVar247 = auVar29._12_4_;
          auVar70._12_4_ = auVar290._12_4_ * fVar247;
          fVar258 = auVar29._16_4_;
          auVar70._16_4_ = auVar290._16_4_ * fVar258;
          fVar259 = auVar29._20_4_;
          auVar70._20_4_ = auVar290._20_4_ * fVar259;
          fVar260 = auVar29._24_4_;
          auVar70._24_4_ = auVar290._24_4_ * fVar260;
          auVar70._28_4_ = auVar174._28_4_;
          auVar342._8_4_ = 0x3f800000;
          auVar342._0_8_ = 0x3f8000003f800000;
          auVar342._12_4_ = 0x3f800000;
          auVar342._16_4_ = 0x3f800000;
          auVar342._20_4_ = 0x3f800000;
          auVar342._24_4_ = 0x3f800000;
          auVar342._28_4_ = 0x3f800000;
          auVar31 = vsubps_avx(auVar342,auVar70);
          fVar229 = auVar31._0_4_ * fVar229 + fVar229;
          fVar244 = auVar31._4_4_ * fVar244 + fVar244;
          fVar246 = auVar31._8_4_ * fVar246 + fVar246;
          fVar247 = auVar31._12_4_ * fVar247 + fVar247;
          fVar258 = auVar31._16_4_ * fVar258 + fVar258;
          fVar259 = auVar31._20_4_ * fVar259 + fVar259;
          fVar260 = auVar31._24_4_ * fVar260 + fVar260;
          auVar71._4_4_ =
               (auVar28._4_4_ * fVar257 + auVar30._4_4_ * fVar248 + auVar32._4_4_ * fVar167) *
               fVar244;
          auVar71._0_4_ =
               (auVar28._0_4_ * fVar242 + auVar30._0_4_ * fVar240 + auVar32._0_4_ * fVar165) *
               fVar229;
          auVar71._8_4_ =
               (auVar28._8_4_ * fVar262 + auVar30._8_4_ * fVar261 + auVar32._8_4_ * fVar184) *
               fVar246;
          auVar71._12_4_ =
               (auVar28._12_4_ * fVar304 + auVar30._12_4_ * fVar307 + auVar32._12_4_ * fVar186) *
               fVar247;
          auVar71._16_4_ =
               (auVar28._16_4_ * fVar309 + auVar30._16_4_ * fVar306 + auVar32._16_4_ * fVar187) *
               fVar258;
          auVar71._20_4_ =
               (auVar28._20_4_ * fVar185 + auVar30._20_4_ * fVar183 + auVar32._20_4_ * fVar188) *
               fVar259;
          auVar71._24_4_ =
               (auVar28._24_4_ * fVar162 + auVar30._24_4_ * fVar161 + auVar32._24_4_ * fVar189) *
               fVar260;
          auVar71._28_4_ = auVar145._28_4_ + auVar27._28_4_;
          auVar195 = vpermilps_avx(ZEXT416(uVar8),0);
          auVar149._16_16_ = auVar195;
          auVar149._0_16_ = auVar195;
          auVar27 = vcmpps_avx(auVar149,auVar71,2);
          uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar216._4_4_ = uVar7;
          auVar216._0_4_ = uVar7;
          auVar216._8_4_ = uVar7;
          auVar216._12_4_ = uVar7;
          auVar216._16_4_ = uVar7;
          auVar216._20_4_ = uVar7;
          auVar216._24_4_ = uVar7;
          auVar216._28_4_ = uVar7;
          auVar28 = vcmpps_avx(auVar71,auVar216,2);
          auVar27 = vandps_avx(auVar28,auVar27);
          auVar195 = vpackssdw_avx(auVar27._0_16_,auVar27._16_16_);
          auVar234 = vpand_avx(auVar234,auVar195);
          auVar195 = vpmovsxwd_avx(auVar234);
          auVar210 = vpshufd_avx(auVar234,0xee);
          auVar210 = vpmovsxwd_avx(auVar210);
          auVar215._16_16_ = auVar210;
          auVar215._0_16_ = auVar195;
          auVar302 = ZEXT3264(auVar150);
          if ((((((((auVar215 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar215 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar215 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar215 >> 0x7f,0) == '\0') &&
                (auVar215 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar210 >> 0x3f,0) == '\0') &&
              (auVar215 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar210[0xf]) goto LAB_00ff9c36;
          auVar150 = vcmpps_avx(ZEXT832(0) << 0x20,auVar290,4);
          auVar195 = vpackssdw_avx(auVar150._0_16_,auVar150._16_16_);
          auVar234 = vpand_avx(auVar234,auVar195);
          auVar195 = vpmovsxwd_avx(auVar234);
          auVar219 = ZEXT1664(auVar195);
          auVar234 = vpunpckhwd_avx(auVar234,auVar234);
          auVar270._16_16_ = auVar234;
          auVar270._0_16_ = auVar195;
          auVar157 = ZEXT3264(CONCAT824(local_560[1]._24_8_,
                                        CONCAT816(local_560[1]._16_8_,
                                                  CONCAT88(local_560[1]._8_8_,local_560[1]._0_8_))))
          ;
          if ((((((((auVar270 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar270 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar270 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar270 >> 0x7f,0) != '\0') ||
                (auVar270 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar234 >> 0x3f,0) != '\0') ||
              (auVar270 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar234[0xf] < '\0') {
            auVar72._4_4_ = auVar289._4_4_ * fVar244;
            auVar72._0_4_ = auVar289._0_4_ * fVar229;
            auVar72._8_4_ = auVar289._8_4_ * fVar246;
            auVar72._12_4_ = auVar289._12_4_ * fVar247;
            auVar72._16_4_ = auVar289._16_4_ * fVar258;
            auVar72._20_4_ = auVar289._20_4_ * fVar259;
            auVar72._24_4_ = auVar289._24_4_ * fVar260;
            auVar72._28_4_ = SUB84(local_560[1]._24_8_,4);
            auVar73._4_4_ = auVar237._4_4_ * fVar244;
            auVar73._0_4_ = auVar237._0_4_ * fVar229;
            auVar73._8_4_ = auVar237._8_4_ * fVar246;
            auVar73._12_4_ = auVar237._12_4_ * fVar247;
            auVar73._16_4_ = auVar237._16_4_ * fVar258;
            auVar73._20_4_ = auVar237._20_4_ * fVar259;
            auVar73._24_4_ = auVar237._24_4_ * fVar260;
            auVar73._28_4_ = auVar31._28_4_ + auVar29._28_4_;
            auVar238._8_4_ = 0x3f800000;
            auVar238._0_8_ = 0x3f8000003f800000;
            auVar238._12_4_ = 0x3f800000;
            auVar238._16_4_ = 0x3f800000;
            auVar238._20_4_ = 0x3f800000;
            auVar238._24_4_ = 0x3f800000;
            auVar238._28_4_ = 0x3f800000;
            auVar150 = vsubps_avx(auVar238,auVar72);
            auVar219 = ZEXT3264(auVar150);
            auVar150 = vblendvps_avx(auVar150,auVar72,auVar33);
            auVar302 = ZEXT3264(auVar150);
            auVar150 = vsubps_avx(auVar238,auVar73);
            _local_340 = vblendvps_avx(auVar150,auVar73,auVar33);
            auVar157 = ZEXT3264(auVar270);
            local_460 = auVar71;
          }
        }
        auVar338 = ZEXT3264(local_720);
        auVar322 = ZEXT3264(auVar317);
        auVar150 = auVar157._0_32_;
        if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar150 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar150 >> 0x7f,0) != '\0') ||
              (auVar157 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar150 >> 0xbf,0) != '\0') ||
            (auVar157 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar157[0x1f] < '\0') {
          auVar27 = vsubps_avx(auVar254,_local_7c0);
          fVar240 = (float)local_7c0._0_4_ + auVar302._0_4_ * auVar27._0_4_;
          fVar242 = (float)local_7c0._4_4_ + auVar302._4_4_ * auVar27._4_4_;
          fVar244 = fStack_7b8 + auVar302._8_4_ * auVar27._8_4_;
          fVar246 = fStack_7b4 + auVar302._12_4_ * auVar27._12_4_;
          fVar247 = fStack_7b0 + auVar302._16_4_ * auVar27._16_4_;
          fVar248 = fStack_7ac + auVar302._20_4_ * auVar27._20_4_;
          fVar257 = fStack_7a8 + auVar302._24_4_ * auVar27._24_4_;
          fVar258 = fStack_7a4 + auVar27._28_4_;
          fVar229 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar74._4_4_ = (fVar242 + fVar242) * fVar229;
          auVar74._0_4_ = (fVar240 + fVar240) * fVar229;
          auVar74._8_4_ = (fVar244 + fVar244) * fVar229;
          auVar74._12_4_ = (fVar246 + fVar246) * fVar229;
          auVar74._16_4_ = (fVar247 + fVar247) * fVar229;
          auVar74._20_4_ = (fVar248 + fVar248) * fVar229;
          auVar74._24_4_ = (fVar257 + fVar257) * fVar229;
          auVar74._28_4_ = fVar258 + fVar258;
          auVar27 = vcmpps_avx(local_460,auVar74,6);
          auVar28 = auVar150 & auVar27;
          if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar28 >> 0x7f,0) != '\0') ||
                (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar28 >> 0xbf,0) != '\0') ||
              (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar28[0x1f] < '\0') {
            auVar219 = ZEXT3264(CONCAT428(0xbf800000,
                                          CONCAT424(0xbf800000,
                                                    CONCAT420(0xbf800000,
                                                              CONCAT416(0xbf800000,
                                                                        CONCAT412(0xbf800000,
                                                                                  CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
            local_340._0_4_ = (float)local_340._0_4_ + (float)local_340._0_4_ + -1.0;
            local_340._4_4_ = (float)local_340._4_4_ + (float)local_340._4_4_ + -1.0;
            uStack_338._0_4_ = (float)uStack_338 + (float)uStack_338 + -1.0;
            uStack_338._4_4_ = uStack_338._4_4_ + uStack_338._4_4_ + -1.0;
            uStack_330._0_4_ = (float)uStack_330 + (float)uStack_330 + -1.0;
            uStack_330._4_4_ = uStack_330._4_4_ + uStack_330._4_4_ + -1.0;
            uStack_328._0_4_ = (float)uStack_328 + (float)uStack_328 + -1.0;
            uStack_328._4_4_ = uStack_328._4_4_ + uStack_328._4_4_ + -1.0;
            local_5c0 = auVar302._0_32_;
            local_2e0 = local_5c0;
            auVar131 = _local_340;
            auVar28 = _local_340;
            local_2c0 = (float)local_340._0_4_;
            fStack_2bc = (float)local_340._4_4_;
            fStack_2b8 = (float)uStack_338;
            fStack_2b4 = uStack_338._4_4_;
            fStack_2b0 = (float)uStack_330;
            fStack_2ac = uStack_330._4_4_;
            fStack_2a8 = (float)uStack_328;
            fStack_2a4 = uStack_328._4_4_;
            local_2a0 = local_460;
            local_280 = 0;
            local_27c = uVar19;
            local_270 = local_850;
            uStack_268 = uStack_848;
            local_260 = local_820;
            uStack_258 = uStack_818;
            local_250 = local_780;
            uStack_248 = uStack_778;
            local_240 = local_790;
            uStack_238 = uStack_788;
            _local_340 = auVar28;
            if ((pGVar21->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              local_560[0] = vandps_avx(auVar27,auVar150);
              auVar192._0_4_ = 1.0 / (float)local_5f0._0_4_;
              auVar192._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar234 = vshufps_avx(auVar192,auVar192,0);
              local_200[0] = auVar234._0_4_ * (auVar302._0_4_ + 0.0);
              local_200[1] = auVar234._4_4_ * (auVar302._4_4_ + 1.0);
              local_200[2] = auVar234._8_4_ * (auVar302._8_4_ + 2.0);
              local_200[3] = auVar234._12_4_ * (auVar302._12_4_ + 3.0);
              fStack_1f0 = auVar234._0_4_ * (auVar302._16_4_ + 4.0);
              fStack_1ec = auVar234._4_4_ * (auVar302._20_4_ + 5.0);
              fStack_1e8 = auVar234._8_4_ * (auVar302._24_4_ + 6.0);
              fStack_1e4 = auVar302._28_4_ + 7.0;
              uStack_330 = auVar131._16_8_;
              uStack_328 = auVar28._24_8_;
              local_1e0 = local_340;
              uStack_1d8 = uStack_338;
              uStack_1d0 = uStack_330;
              uStack_1c8 = uStack_328;
              local_1c0 = local_460;
              auVar176._8_4_ = 0x7f800000;
              auVar176._0_8_ = 0x7f8000007f800000;
              auVar176._12_4_ = 0x7f800000;
              auVar176._16_4_ = 0x7f800000;
              auVar176._20_4_ = 0x7f800000;
              auVar176._24_4_ = 0x7f800000;
              auVar176._28_4_ = 0x7f800000;
              auVar150 = vblendvps_avx(auVar176,local_460,local_560[0]);
              auVar27 = vshufps_avx(auVar150,auVar150,0xb1);
              auVar27 = vminps_avx(auVar150,auVar27);
              auVar28 = vshufpd_avx(auVar27,auVar27,5);
              auVar27 = vminps_avx(auVar27,auVar28);
              auVar28 = vperm2f128_avx(auVar27,auVar27,1);
              auVar27 = vminps_avx(auVar27,auVar28);
              auVar27 = vcmpps_avx(auVar150,auVar27,0);
              auVar28 = local_560[0] & auVar27;
              auVar150 = local_560[0];
              if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar28 >> 0x7f,0) != '\0') ||
                    (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar28 >> 0xbf,0) != '\0') ||
                  (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar28[0x1f] < '\0') {
                auVar150 = vandps_avx(auVar27,local_560[0]);
              }
              uVar132 = vmovmskps_avx(auVar150);
              uVar133 = 0;
              if (uVar132 != 0) {
                for (; (uVar132 >> uVar133 & 1) == 0; uVar133 = uVar133 + 1) {
                }
              }
              uVar135 = (ulong)uVar133;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar229 = local_200[uVar135];
                uVar7 = *(undefined4 *)((long)&local_1e0 + uVar135 * 4);
                fVar242 = 1.0 - fVar229;
                fVar240 = fVar229 * fVar242 + fVar229 * fVar242;
                auVar234 = ZEXT416((uint)(fVar229 * fVar229 * 3.0));
                auVar234 = vshufps_avx(auVar234,auVar234,0);
                auVar195 = ZEXT416((uint)((fVar240 - fVar229 * fVar229) * 3.0));
                auVar195 = vshufps_avx(auVar195,auVar195,0);
                auVar210 = ZEXT416((uint)((fVar242 * fVar242 - fVar240) * 3.0));
                auVar210 = vshufps_avx(auVar210,auVar210,0);
                auVar197 = ZEXT416((uint)(fVar242 * fVar242 * -3.0));
                auVar197 = vshufps_avx(auVar197,auVar197,0);
                auVar193._0_4_ =
                     auVar197._0_4_ * fVar207 +
                     auVar210._0_4_ * fVar224 +
                     auVar234._0_4_ * (float)local_790._0_4_ +
                     auVar195._0_4_ * (float)local_780._0_4_;
                auVar193._4_4_ =
                     auVar197._4_4_ * fVar220 +
                     auVar210._4_4_ * fVar226 +
                     auVar234._4_4_ * (float)local_790._4_4_ +
                     auVar195._4_4_ * (float)local_780._4_4_;
                auVar193._8_4_ =
                     auVar197._8_4_ * fVar221 +
                     auVar210._8_4_ * fVar228 +
                     auVar234._8_4_ * (float)uStack_788 + auVar195._8_4_ * (float)uStack_778;
                auVar193._12_4_ =
                     auVar197._12_4_ * fVar222 +
                     auVar210._12_4_ * fVar249 +
                     auVar234._12_4_ * uStack_788._4_4_ + auVar195._12_4_ * uStack_778._4_4_;
                auVar219 = ZEXT464(*(uint *)(local_1c0 + uVar135 * 4));
                *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_1c0 + uVar135 * 4);
                *(float *)(ray + k * 4 + 0xc0) = auVar193._0_4_;
                uVar20 = vextractps_avx(auVar193,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar20;
                uVar20 = vextractps_avx(auVar193,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar20;
                *(float *)(ray + k * 4 + 0xf0) = fVar229;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar7;
                *(uint *)(ray + k * 4 + 0x110) = uVar134;
                *(uint *)(ray + k * 4 + 0x120) = uVar18;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                _local_6c0 = vshufps_avx(ZEXT416(uVar18),ZEXT416(uVar18),0);
                _local_640 = vshufps_avx(ZEXT416(uVar134),ZEXT416(uVar134),0);
                _auStack_630 = auVar25._16_16_;
                _auStack_6d0 = auVar26._16_16_;
                _local_6e0 = *local_670;
                auStack_690 = auVar254._16_16_;
                local_6a0 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                _local_740 = auVar317;
                local_668 = ray;
                while( true ) {
                  local_3c0 = local_200[uVar135];
                  local_7c0 = (undefined1  [8])uVar135;
                  local_3b0 = *(undefined4 *)((long)&local_1e0 + uVar135 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar135 * 4);
                  fVar240 = 1.0 - local_3c0;
                  fVar229 = local_3c0 * fVar240 + local_3c0 * fVar240;
                  auVar234 = ZEXT416((uint)(local_3c0 * local_3c0 * 3.0));
                  auVar234 = vshufps_avx(auVar234,auVar234,0);
                  auVar195 = ZEXT416((uint)((fVar229 - local_3c0 * local_3c0) * 3.0));
                  auVar195 = vshufps_avx(auVar195,auVar195,0);
                  auVar210 = ZEXT416((uint)((fVar240 * fVar240 - fVar229) * 3.0));
                  auVar210 = vshufps_avx(auVar210,auVar210,0);
                  local_770.context = context->user;
                  auVar197 = ZEXT416((uint)(fVar240 * fVar240 * -3.0));
                  auVar197 = vshufps_avx(auVar197,auVar197,0);
                  auVar199._0_4_ =
                       auVar197._0_4_ * fVar207 +
                       auVar210._0_4_ * fVar224 +
                       auVar234._0_4_ * (float)local_790._0_4_ +
                       auVar195._0_4_ * (float)local_780._0_4_;
                  auVar199._4_4_ =
                       auVar197._4_4_ * fVar220 +
                       auVar210._4_4_ * fVar226 +
                       auVar234._4_4_ * (float)local_790._4_4_ +
                       auVar195._4_4_ * (float)local_780._4_4_;
                  auVar199._8_4_ =
                       auVar197._8_4_ * fVar221 +
                       auVar210._8_4_ * fVar228 +
                       auVar234._8_4_ * (float)uStack_788 + auVar195._8_4_ * (float)uStack_778;
                  auVar199._12_4_ =
                       auVar197._12_4_ * fVar222 +
                       auVar210._12_4_ * fVar249 +
                       auVar234._12_4_ * uStack_788._4_4_ + auVar195._12_4_ * uStack_778._4_4_;
                  auVar234 = vshufps_avx(auVar199,auVar199,0);
                  local_3f0[0] = (RTCHitN)auVar234[0];
                  local_3f0[1] = (RTCHitN)auVar234[1];
                  local_3f0[2] = (RTCHitN)auVar234[2];
                  local_3f0[3] = (RTCHitN)auVar234[3];
                  local_3f0[4] = (RTCHitN)auVar234[4];
                  local_3f0[5] = (RTCHitN)auVar234[5];
                  local_3f0[6] = (RTCHitN)auVar234[6];
                  local_3f0[7] = (RTCHitN)auVar234[7];
                  local_3f0[8] = (RTCHitN)auVar234[8];
                  local_3f0[9] = (RTCHitN)auVar234[9];
                  local_3f0[10] = (RTCHitN)auVar234[10];
                  local_3f0[0xb] = (RTCHitN)auVar234[0xb];
                  local_3f0[0xc] = (RTCHitN)auVar234[0xc];
                  local_3f0[0xd] = (RTCHitN)auVar234[0xd];
                  local_3f0[0xe] = (RTCHitN)auVar234[0xe];
                  local_3f0[0xf] = (RTCHitN)auVar234[0xf];
                  auVar234 = vshufps_avx(auVar199,auVar199,0x55);
                  local_3e0 = auVar234;
                  local_3d0 = vshufps_avx(auVar199,auVar199,0xaa);
                  fStack_3bc = local_3c0;
                  fStack_3b8 = local_3c0;
                  fStack_3b4 = local_3c0;
                  uStack_3ac = local_3b0;
                  uStack_3a8 = local_3b0;
                  uStack_3a4 = local_3b0;
                  local_3a0 = local_640;
                  uStack_398 = uStack_638;
                  local_390 = local_6c0;
                  uStack_388 = uStack_6b8;
                  vcmpps_avx(auVar158._0_32_,auVar158._0_32_,0xf);
                  uStack_37c = (local_770.context)->instID[0];
                  local_380 = uStack_37c;
                  uStack_378 = uStack_37c;
                  uStack_374 = uStack_37c;
                  uStack_370 = (local_770.context)->instPrimID[0];
                  uStack_36c = uStack_370;
                  uStack_368 = uStack_370;
                  uStack_364 = uStack_370;
                  local_810 = _local_6e0;
                  local_770.valid = (int *)local_810;
                  local_770.geometryUserPtr = *(void **)(local_7a0._0_8_ + 0x18);
                  local_770.hit = local_3f0;
                  local_770.N = 4;
                  local_770.ray = (RTCRayN *)ray;
                  if (*(code **)(local_7a0._0_8_ + 0x40) != (code *)0x0) {
                    (**(code **)(local_7a0._0_8_ + 0x40))(&local_770);
                    auVar322 = ZEXT3264(_local_740);
                    auVar338 = ZEXT3264(local_720);
                    auVar302 = ZEXT3264(local_5c0);
                    auVar158 = ZEXT1664(ZEXT816(0) << 0x40);
                    ray = local_668;
                    pre = local_7f0;
                    pPVar137 = local_7e8;
                    pLVar139 = local_7f8;
                    fVar230 = (float)local_700._0_4_;
                    fVar241 = (float)local_700._4_4_;
                    fVar243 = fStack_6f8;
                    fVar245 = fStack_6f4;
                    fVar205 = fStack_6f0;
                    fVar295 = fStack_6ec;
                    fVar303 = fStack_6e8;
                  }
                  if (local_810 == (undefined1  [16])0x0) {
                    auVar234 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar234 = auVar234 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var22 = context->args->filter;
                    if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_7a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                      (*p_Var22)(&local_770);
                      auVar322 = ZEXT3264(_local_740);
                      auVar338 = ZEXT3264(local_720);
                      auVar302 = ZEXT3264(local_5c0);
                      auVar158 = ZEXT1664(ZEXT816(0) << 0x40);
                      ray = local_668;
                      pre = local_7f0;
                      pPVar137 = local_7e8;
                      pLVar139 = local_7f8;
                      fVar230 = (float)local_700._0_4_;
                      fVar241 = (float)local_700._4_4_;
                      fVar243 = fStack_6f8;
                      fVar245 = fStack_6f4;
                      fVar205 = fStack_6f0;
                      fVar295 = fStack_6ec;
                      fVar303 = fStack_6e8;
                    }
                    auVar195 = vpcmpeqd_avx(local_810,_DAT_01f7aa10);
                    auVar210 = vpcmpeqd_avx(auVar234,auVar234);
                    auVar234 = auVar195 ^ auVar210;
                    if (local_810 != (undefined1  [16])0x0) {
                      auVar195 = auVar195 ^ auVar210;
                      auVar210 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])local_770.hit);
                      *(undefined1 (*) [16])(local_770.ray + 0xc0) = auVar210;
                      auVar210 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])
                                                          (local_770.hit + 0x10));
                      *(undefined1 (*) [16])(local_770.ray + 0xd0) = auVar210;
                      auVar210 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])
                                                          (local_770.hit + 0x20));
                      *(undefined1 (*) [16])(local_770.ray + 0xe0) = auVar210;
                      auVar210 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])
                                                          (local_770.hit + 0x30));
                      *(undefined1 (*) [16])(local_770.ray + 0xf0) = auVar210;
                      auVar210 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])
                                                          (local_770.hit + 0x40));
                      *(undefined1 (*) [16])(local_770.ray + 0x100) = auVar210;
                      auVar210 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])
                                                          (local_770.hit + 0x50));
                      *(undefined1 (*) [16])(local_770.ray + 0x110) = auVar210;
                      auVar210 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])
                                                          (local_770.hit + 0x60));
                      *(undefined1 (*) [16])(local_770.ray + 0x120) = auVar210;
                      auVar210 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])
                                                          (local_770.hit + 0x70));
                      *(undefined1 (*) [16])(local_770.ray + 0x130) = auVar210;
                      auVar195 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])
                                                          (local_770.hit + 0x80));
                      *(undefined1 (*) [16])(local_770.ray + 0x140) = auVar195;
                    }
                  }
                  auVar150 = local_460;
                  auVar317 = auVar322._0_32_;
                  auVar171._8_8_ = 0x100000001;
                  auVar171._0_8_ = 0x100000001;
                  if ((auVar171 & auVar234) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = local_6a0._0_4_;
                    auVar234 = local_6a0;
                  }
                  else {
                    auVar234 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  }
                  auVar219 = ZEXT3264(local_460);
                  *(undefined4 *)(local_560[0] + (long)local_7c0 * 4) = 0;
                  local_6a0 = auVar234;
                  auVar234 = vshufps_avx(auVar234,auVar234,0);
                  auVar156._16_16_ = auVar234;
                  auVar156._0_16_ = auVar234;
                  auVar26 = vcmpps_avx(auVar150,auVar156,2);
                  auVar25 = vandps_avx(auVar26,local_560[0]);
                  local_560[0] = local_560[0] & auVar26;
                  if ((((((((local_560[0] >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                           && (local_560[0] >> 0x3f & (undefined1  [32])0x1) ==
                              (undefined1  [32])0x0) &&
                          (local_560[0] >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                         && SUB321(local_560[0] >> 0x7f,0) == '\0') &&
                        (local_560[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_560[0] >> 0xbf,0) == '\0') &&
                      (local_560[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_560[0][0x1f]) break;
                  auVar182._8_4_ = 0x7f800000;
                  auVar182._0_8_ = 0x7f8000007f800000;
                  auVar182._12_4_ = 0x7f800000;
                  auVar182._16_4_ = 0x7f800000;
                  auVar182._20_4_ = 0x7f800000;
                  auVar182._24_4_ = 0x7f800000;
                  auVar182._28_4_ = 0x7f800000;
                  auVar150 = vblendvps_avx(auVar182,auVar150,auVar25);
                  auVar26 = vshufps_avx(auVar150,auVar150,0xb1);
                  auVar26 = vminps_avx(auVar150,auVar26);
                  auVar27 = vshufpd_avx(auVar26,auVar26,5);
                  auVar26 = vminps_avx(auVar26,auVar27);
                  auVar27 = vperm2f128_avx(auVar26,auVar26,1);
                  auVar26 = vminps_avx(auVar26,auVar27);
                  auVar26 = vcmpps_avx(auVar150,auVar26,0);
                  auVar27 = auVar25 & auVar26;
                  auVar150 = auVar25;
                  if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar27 >> 0x7f,0) != '\0') ||
                        (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar27 >> 0xbf,0) != '\0') ||
                      (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar27[0x1f] < '\0') {
                    auVar150 = vandps_avx(auVar26,auVar25);
                  }
                  uVar132 = vmovmskps_avx(auVar150);
                  uVar133 = 0;
                  if (uVar132 != 0) {
                    for (; (uVar132 >> uVar133 & 1) == 0; uVar133 = uVar133 + 1) {
                    }
                  }
                  uVar135 = (ulong)uVar133;
                  local_560[0] = auVar25;
                }
              }
            }
          }
        }
      }
      if (8 < (int)uVar19) {
        auVar234 = vpshufd_avx(ZEXT416(uVar19),0);
        local_4c0 = auVar234._0_4_;
        fStack_4bc = auVar234._4_4_;
        fStack_4b8 = auVar234._8_4_;
        fStack_4b4 = auVar234._12_4_;
        auVar234 = vshufps_avx(local_620._0_16_,local_620._0_16_,0);
        register0x00001210 = auVar234;
        _local_500 = auVar234;
        auVar234 = vpermilps_avx(ZEXT416(uVar8),0);
        local_320._16_16_ = auVar234;
        local_320._0_16_ = auVar234;
        auVar143._0_4_ = 1.0 / (float)local_5f0._0_4_;
        auVar143._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar234 = vshufps_avx(auVar143,auVar143,0);
        register0x00001210 = auVar234;
        _local_140 = auVar234;
        local_5f0 = vshufps_avx(ZEXT416(uVar18),ZEXT416(uVar18),0);
        local_7a0 = vshufps_avx(ZEXT416(uVar134),ZEXT416(uVar134),0);
        auVar158 = ZEXT1664(local_7a0);
        auVar138 = (undefined1  [8])0x8;
        local_5c0 = auVar302._0_32_;
        _local_740 = auVar317;
        do {
          pauVar1 = (undefined1 (*) [28])(bezier_basis0 + (long)auVar138 * 4 + lVar136);
          fVar229 = *(float *)*pauVar1;
          fVar240 = *(float *)(*pauVar1 + 4);
          fVar242 = *(float *)(*pauVar1 + 8);
          fVar244 = *(float *)(*pauVar1 + 0xc);
          fVar246 = *(float *)(*pauVar1 + 0x10);
          fVar247 = *(float *)(*pauVar1 + 0x14);
          fVar248 = *(float *)(*pauVar1 + 0x18);
          auVar127 = *pauVar1;
          pauVar3 = (undefined1 (*) [28])(lVar136 + 0x21aa768 + (long)auVar138 * 4);
          fVar257 = *(float *)*pauVar3;
          fVar258 = *(float *)(*pauVar3 + 4);
          fVar259 = *(float *)(*pauVar3 + 8);
          fVar260 = *(float *)(*pauVar3 + 0xc);
          fVar261 = *(float *)(*pauVar3 + 0x10);
          fVar262 = *(float *)(*pauVar3 + 0x14);
          fVar339 = *(float *)(*pauVar3 + 0x18);
          auVar126 = *pauVar3;
          pauVar3 = (undefined1 (*) [28])(lVar136 + 0x21aabec + (long)auVar138 * 4);
          fVar296 = *(float *)*pauVar3;
          fVar223 = *(float *)(*pauVar3 + 4);
          fVar307 = *(float *)(*pauVar3 + 8);
          fVar304 = *(float *)(*pauVar3 + 0xc);
          fVar305 = *(float *)(*pauVar3 + 0x10);
          fVar225 = *(float *)(*pauVar3 + 0x14);
          fVar310 = *(float *)(*pauVar3 + 0x18);
          auVar125 = *pauVar3;
          pauVar3 = (undefined1 (*) [28])(lVar136 + 0x21ab070 + (long)auVar138 * 4);
          fVar306 = *(float *)*pauVar3;
          fVar309 = *(float *)(*pauVar3 + 4);
          fVar227 = *(float *)(*pauVar3 + 8);
          fVar312 = *(float *)(*pauVar3 + 0xc);
          fVar166 = *(float *)(*pauVar3 + 0x10);
          fVar183 = *(float *)(*pauVar3 + 0x14);
          fVar185 = *(float *)(*pauVar3 + 0x18);
          auVar124 = *pauVar3;
          fVar231 = auVar338._0_4_;
          fVar308 = auVar338._4_4_;
          fVar311 = auVar338._8_4_;
          fVar313 = auVar338._12_4_;
          fVar314 = auVar338._16_4_;
          fVar323 = auVar338._20_4_;
          fVar325 = auVar338._24_4_;
          fVar278 = auVar219._28_4_;
          fVar206 = fVar278 + *(float *)pauVar3[1];
          fVar165 = fVar278 + fVar278 + auVar158._28_4_;
          local_620._0_4_ =
               (float)local_420._0_4_ * fVar229 +
               (float)local_a0._0_4_ * fVar257 +
               fVar231 * fVar296 + (float)local_440._0_4_ * fVar306;
          local_620._4_4_ =
               (float)local_420._4_4_ * fVar240 +
               (float)local_a0._4_4_ * fVar258 +
               fVar308 * fVar223 + (float)local_440._4_4_ * fVar309;
          local_620._8_4_ =
               fStack_418 * fVar242 + fStack_98 * fVar259 + fVar311 * fVar307 + fStack_438 * fVar227
          ;
          local_620._12_4_ =
               fStack_414 * fVar244 + fStack_94 * fVar260 + fVar313 * fVar304 + fStack_434 * fVar312
          ;
          local_620._16_4_ =
               fStack_410 * fVar246 + fStack_90 * fVar261 + fVar314 * fVar305 + fStack_430 * fVar166
          ;
          local_620._20_4_ =
               fStack_40c * fVar247 + fStack_8c * fVar262 + fVar323 * fVar225 + fStack_42c * fVar183
          ;
          local_620._24_4_ =
               fStack_408 * fVar248 + fStack_88 * fVar339 + fVar325 * fVar310 + fStack_428 * fVar185
          ;
          local_620._28_4_ = fVar206 + fVar165;
          fVar167 = local_300._0_4_;
          fVar184 = local_300._4_4_;
          fVar186 = local_300._8_4_;
          fVar187 = local_300._12_4_;
          fVar188 = local_300._16_4_;
          fVar189 = local_300._20_4_;
          fVar190 = local_300._24_4_;
          auVar217._0_4_ =
               (float)local_c0._0_4_ * fVar257 +
               fVar230 * fVar296 + (float)local_5a0._0_4_ * fVar306 + fVar167 * fVar229;
          auVar217._4_4_ =
               (float)local_c0._4_4_ * fVar258 +
               fVar241 * fVar223 + (float)local_5a0._4_4_ * fVar309 + fVar184 * fVar240;
          auVar217._8_4_ =
               fStack_b8 * fVar259 + fVar243 * fVar307 + fStack_598 * fVar227 + fVar186 * fVar242;
          auVar217._12_4_ =
               fStack_b4 * fVar260 + fVar245 * fVar304 + fStack_594 * fVar312 + fVar187 * fVar244;
          auVar217._16_4_ =
               fStack_b0 * fVar261 + fVar205 * fVar305 + fStack_590 * fVar166 + fVar188 * fVar246;
          auVar217._20_4_ =
               fStack_ac * fVar262 + fVar295 * fVar225 + fStack_58c * fVar183 + fVar189 * fVar247;
          auVar217._24_4_ =
               fStack_a8 * fVar339 + fVar303 * fVar310 + fStack_588 * fVar185 + fVar190 * fVar248;
          auVar217._28_4_ = fVar278 + fVar278 + fStack_584 + fVar165;
          fVar141 = fVar229 * (float)local_1a0._0_4_ +
                    (float)local_e0._0_4_ * fVar257 +
                    fVar296 * (float)local_160._0_4_ + fVar306 * (float)local_180._0_4_;
          fVar159 = fVar240 * (float)local_1a0._4_4_ +
                    (float)local_e0._4_4_ * fVar258 +
                    fVar223 * (float)local_160._4_4_ + fVar309 * (float)local_180._4_4_;
          fVar160 = fVar242 * fStack_198 +
                    fStack_d8 * fVar259 + fVar307 * fStack_158 + fVar227 * fStack_178;
          fVar161 = fVar244 * fStack_194 +
                    fStack_d4 * fVar260 + fVar304 * fStack_154 + fVar312 * fStack_174;
          fVar162 = fVar246 * fStack_190 +
                    fStack_d0 * fVar261 + fVar305 * fStack_150 + fVar166 * fStack_170;
          fVar163 = fVar247 * fStack_18c +
                    fStack_cc * fVar262 + fVar225 * fStack_14c + fVar183 * fStack_16c;
          fVar164 = fVar248 * fStack_188 +
                    fStack_c8 * fVar339 + fVar310 * fStack_148 + fVar185 * fStack_168;
          fVar165 = fVar165 + fVar278 + fVar206;
          pfVar2 = (float *)(bezier_basis1 + (long)auVar138 * 4 + lVar136);
          fVar257 = *pfVar2;
          fVar258 = pfVar2[1];
          fVar259 = pfVar2[2];
          fVar260 = pfVar2[3];
          fVar261 = pfVar2[4];
          fVar262 = pfVar2[5];
          fVar339 = pfVar2[6];
          pauVar3 = (undefined1 (*) [28])(lVar136 + 0x21acb88 + (long)auVar138 * 4);
          fVar229 = *(float *)*pauVar3;
          fVar240 = *(float *)(*pauVar3 + 4);
          fVar242 = *(float *)(*pauVar3 + 8);
          fVar244 = *(float *)(*pauVar3 + 0xc);
          fVar246 = *(float *)(*pauVar3 + 0x10);
          fVar247 = *(float *)(*pauVar3 + 0x14);
          fVar248 = *(float *)(*pauVar3 + 0x18);
          auVar130 = *pauVar3;
          pauVar3 = (undefined1 (*) [28])(lVar136 + 0x21ad00c + (long)auVar138 * 4);
          fVar296 = *(float *)*pauVar3;
          fVar223 = *(float *)(*pauVar3 + 4);
          fVar307 = *(float *)(*pauVar3 + 8);
          fVar304 = *(float *)(*pauVar3 + 0xc);
          fVar305 = *(float *)(*pauVar3 + 0x10);
          fVar225 = *(float *)(*pauVar3 + 0x14);
          fVar310 = *(float *)(*pauVar3 + 0x18);
          auVar129 = *pauVar3;
          pauVar3 = (undefined1 (*) [28])(lVar136 + 0x21ad490 + (long)auVar138 * 4);
          fVar306 = *(float *)*pauVar3;
          fVar309 = *(float *)(*pauVar3 + 4);
          fVar227 = *(float *)(*pauVar3 + 8);
          fVar312 = *(float *)(*pauVar3 + 0xc);
          fVar166 = *(float *)(*pauVar3 + 0x10);
          fVar183 = *(float *)(*pauVar3 + 0x14);
          fVar185 = *(float *)(*pauVar3 + 0x18);
          auVar128 = *pauVar3;
          auVar158 = ZEXT3264(local_300);
          fVar278 = fStack_584 + *(float *)pauVar3[1];
          fVar206 = fStack_584 + fStack_584 + fStack_424;
          auVar351._0_4_ =
               (float)local_420._0_4_ * fVar257 +
               (float)local_a0._0_4_ * fVar229 +
               fVar231 * fVar296 + (float)local_440._0_4_ * fVar306;
          auVar351._4_4_ =
               (float)local_420._4_4_ * fVar258 +
               (float)local_a0._4_4_ * fVar240 +
               fVar308 * fVar223 + (float)local_440._4_4_ * fVar309;
          auVar351._8_4_ =
               fStack_418 * fVar259 + fStack_98 * fVar242 + fVar311 * fVar307 + fStack_438 * fVar227
          ;
          auVar351._12_4_ =
               fStack_414 * fVar260 + fStack_94 * fVar244 + fVar313 * fVar304 + fStack_434 * fVar312
          ;
          auVar351._16_4_ =
               fStack_410 * fVar261 + fStack_90 * fVar246 + fVar314 * fVar305 + fStack_430 * fVar166
          ;
          auVar351._20_4_ =
               fStack_40c * fVar262 + fStack_8c * fVar247 + fVar323 * fVar225 + fStack_42c * fVar183
          ;
          auVar351._24_4_ =
               fStack_408 * fVar339 + fStack_88 * fVar248 + fVar325 * fVar310 + fStack_428 * fVar185
          ;
          auVar351._28_4_ = fVar278 + fVar206;
          auVar255._0_4_ =
               fVar167 * fVar257 +
               (float)local_c0._0_4_ * fVar229 +
               fVar230 * fVar296 + (float)local_5a0._0_4_ * fVar306;
          auVar255._4_4_ =
               fVar184 * fVar258 +
               (float)local_c0._4_4_ * fVar240 +
               fVar241 * fVar223 + (float)local_5a0._4_4_ * fVar309;
          auVar255._8_4_ =
               fVar186 * fVar259 + fStack_b8 * fVar242 + fVar243 * fVar307 + fStack_598 * fVar227;
          auVar255._12_4_ =
               fVar187 * fVar260 + fStack_b4 * fVar244 + fVar245 * fVar304 + fStack_594 * fVar312;
          auVar255._16_4_ =
               fVar188 * fVar261 + fStack_b0 * fVar246 + fVar205 * fVar305 + fStack_590 * fVar166;
          auVar255._20_4_ =
               fVar189 * fVar262 + fStack_ac * fVar247 + fVar295 * fVar225 + fStack_58c * fVar183;
          auVar255._24_4_ =
               fVar190 * fVar339 + fStack_a8 * fVar248 + fVar303 * fVar310 + fStack_588 * fVar185;
          auVar255._28_4_ = fVar206 + fStack_584 + fStack_584 + *(float *)pauVar1[1];
          auVar204._0_4_ =
               (float)local_e0._0_4_ * fVar229 +
               fVar296 * (float)local_160._0_4_ + fVar306 * (float)local_180._0_4_ +
               fVar257 * (float)local_1a0._0_4_;
          auVar204._4_4_ =
               (float)local_e0._4_4_ * fVar240 +
               fVar223 * (float)local_160._4_4_ + fVar309 * (float)local_180._4_4_ +
               fVar258 * (float)local_1a0._4_4_;
          auVar204._8_4_ =
               fStack_d8 * fVar242 + fVar307 * fStack_158 + fVar227 * fStack_178 +
               fVar259 * fStack_198;
          auVar204._12_4_ =
               fStack_d4 * fVar244 + fVar304 * fStack_154 + fVar312 * fStack_174 +
               fVar260 * fStack_194;
          auVar204._16_4_ =
               fStack_d0 * fVar246 + fVar305 * fStack_150 + fVar166 * fStack_170 +
               fVar261 * fStack_190;
          auVar204._20_4_ =
               fStack_cc * fVar247 + fVar225 * fStack_14c + fVar183 * fStack_16c +
               fVar262 * fStack_18c;
          auVar204._24_4_ =
               fStack_c8 * fVar248 + fVar310 * fStack_148 + fVar185 * fStack_168 +
               fVar339 * fStack_188;
          auVar204._28_4_ = fStack_584 + fVar278 + fVar206;
          auVar25 = vsubps_avx(auVar351,local_620._0_32_);
          auVar26 = vsubps_avx(auVar255,auVar217);
          fVar296 = auVar25._0_4_;
          fVar223 = auVar25._4_4_;
          auVar75._4_4_ = fVar223 * auVar217._4_4_;
          auVar75._0_4_ = fVar296 * auVar217._0_4_;
          fVar307 = auVar25._8_4_;
          auVar75._8_4_ = fVar307 * auVar217._8_4_;
          fVar304 = auVar25._12_4_;
          auVar75._12_4_ = fVar304 * auVar217._12_4_;
          fVar305 = auVar25._16_4_;
          auVar75._16_4_ = fVar305 * auVar217._16_4_;
          fVar225 = auVar25._20_4_;
          auVar75._20_4_ = fVar225 * auVar217._20_4_;
          fVar310 = auVar25._24_4_;
          auVar75._24_4_ = fVar310 * auVar217._24_4_;
          auVar75._28_4_ = fVar206;
          fVar229 = auVar26._0_4_;
          fVar240 = auVar26._4_4_;
          auVar76._4_4_ = local_620._4_4_ * fVar240;
          auVar76._0_4_ = local_620._0_4_ * fVar229;
          fVar242 = auVar26._8_4_;
          auVar76._8_4_ = local_620._8_4_ * fVar242;
          fVar244 = auVar26._12_4_;
          auVar76._12_4_ = local_620._12_4_ * fVar244;
          fVar246 = auVar26._16_4_;
          auVar76._16_4_ = local_620._16_4_ * fVar246;
          fVar247 = auVar26._20_4_;
          auVar76._20_4_ = local_620._20_4_ * fVar247;
          fVar248 = auVar26._24_4_;
          auVar76._24_4_ = local_620._24_4_ * fVar248;
          auVar76._28_4_ = auVar255._28_4_;
          auVar27 = vsubps_avx(auVar75,auVar76);
          auVar121._4_4_ = fVar159;
          auVar121._0_4_ = fVar141;
          auVar121._8_4_ = fVar160;
          auVar121._12_4_ = fVar161;
          auVar121._16_4_ = fVar162;
          auVar121._20_4_ = fVar163;
          auVar121._24_4_ = fVar164;
          auVar121._28_4_ = fVar165;
          auVar150 = vmaxps_avx(auVar121,auVar204);
          auVar77._4_4_ = auVar150._4_4_ * auVar150._4_4_ * (fVar223 * fVar223 + fVar240 * fVar240);
          auVar77._0_4_ = auVar150._0_4_ * auVar150._0_4_ * (fVar296 * fVar296 + fVar229 * fVar229);
          auVar77._8_4_ = auVar150._8_4_ * auVar150._8_4_ * (fVar307 * fVar307 + fVar242 * fVar242);
          auVar77._12_4_ =
               auVar150._12_4_ * auVar150._12_4_ * (fVar304 * fVar304 + fVar244 * fVar244);
          auVar77._16_4_ =
               auVar150._16_4_ * auVar150._16_4_ * (fVar305 * fVar305 + fVar246 * fVar246);
          auVar77._20_4_ =
               auVar150._20_4_ * auVar150._20_4_ * (fVar225 * fVar225 + fVar247 * fVar247);
          auVar77._24_4_ =
               auVar150._24_4_ * auVar150._24_4_ * (fVar310 * fVar310 + fVar248 * fVar248);
          auVar77._28_4_ = fVar278 + auVar255._28_4_;
          auVar78._4_4_ = auVar27._4_4_ * auVar27._4_4_;
          auVar78._0_4_ = auVar27._0_4_ * auVar27._0_4_;
          auVar78._8_4_ = auVar27._8_4_ * auVar27._8_4_;
          auVar78._12_4_ = auVar27._12_4_ * auVar27._12_4_;
          auVar78._16_4_ = auVar27._16_4_ * auVar27._16_4_;
          auVar78._20_4_ = auVar27._20_4_ * auVar27._20_4_;
          auVar78._24_4_ = auVar27._24_4_ * auVar27._24_4_;
          auVar78._28_4_ = auVar27._28_4_;
          _local_4e0 = vcmpps_avx(auVar78,auVar77,2);
          auVar219 = ZEXT3264(_local_4e0);
          local_280 = SUB84(auVar138,0);
          auVar195 = vpshufd_avx(ZEXT416(local_280),0);
          auVar234 = vpor_avx(auVar195,_DAT_01f7fcf0);
          auVar195 = vpor_avx(auVar195,_DAT_01fafea0);
          auVar122._4_4_ = fStack_4bc;
          auVar122._0_4_ = local_4c0;
          auVar122._8_4_ = fStack_4b8;
          auVar122._12_4_ = fStack_4b4;
          auVar234 = vpcmpgtd_avx(auVar122,auVar234);
          auVar195 = vpcmpgtd_avx(auVar122,auVar195);
          auVar177._16_16_ = auVar195;
          auVar177._0_16_ = auVar234;
          auVar150 = auVar177 & _local_4e0;
          fVar230 = (float)local_700._0_4_;
          fVar241 = (float)local_700._4_4_;
          fVar243 = fStack_6f8;
          fVar245 = fStack_6f4;
          fVar205 = fStack_6f0;
          fVar295 = fStack_6ec;
          fVar303 = fStack_6e8;
          if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar150 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar150 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar150 >> 0x7f,0) == '\0') &&
                (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar150 >> 0xbf,0) == '\0') &&
              (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar150[0x1f]) {
            auVar338 = ZEXT3264(auVar338._0_32_);
          }
          else {
            local_5e0._0_4_ = auVar130._0_4_;
            local_5e0._4_4_ = auVar130._4_4_;
            fStack_5d8 = auVar130._8_4_;
            fStack_5d4 = auVar130._12_4_;
            fStack_5d0 = auVar130._16_4_;
            fStack_5cc = auVar130._20_4_;
            fStack_5c8 = auVar130._24_4_;
            local_580._0_4_ = auVar129._0_4_;
            local_580._4_4_ = auVar129._4_4_;
            fStack_578 = auVar129._8_4_;
            fStack_574 = auVar129._12_4_;
            fStack_570 = auVar129._16_4_;
            fStack_56c = auVar129._20_4_;
            fStack_568 = auVar129._24_4_;
            local_660._0_4_ = auVar128._0_4_;
            local_660._4_4_ = auVar128._4_4_;
            fStack_658 = auVar128._8_4_;
            fStack_654 = auVar128._12_4_;
            fStack_650 = auVar128._16_4_;
            fStack_64c = auVar128._20_4_;
            fStack_648 = auVar128._24_4_;
            local_660._0_4_ =
                 fVar257 * (float)local_740._0_4_ +
                 (float)local_480._0_4_ * (float)local_5e0._0_4_ +
                 (float)local_100._0_4_ * (float)local_580._0_4_ +
                 (float)local_7e0._0_4_ * (float)local_660._0_4_;
            local_660._4_4_ =
                 fVar258 * (float)local_740._4_4_ +
                 (float)local_480._4_4_ * (float)local_5e0._4_4_ +
                 (float)local_100._4_4_ * (float)local_580._4_4_ +
                 (float)local_7e0._4_4_ * (float)local_660._4_4_;
            fStack_658 = fVar259 * fStack_738 +
                         fStack_478 * fStack_5d8 + fStack_f8 * fStack_578 + fStack_7d8 * fStack_658;
            fStack_654 = fVar260 * fStack_734 +
                         fStack_474 * fStack_5d4 + fStack_f4 * fStack_574 + fStack_7d4 * fStack_654;
            fStack_650 = fVar261 * fStack_730 +
                         fStack_470 * fStack_5d0 + fStack_f0 * fStack_570 + fStack_7d0 * fStack_650;
            fStack_64c = fVar262 * fStack_72c +
                         fStack_46c * fStack_5cc + fStack_ec * fStack_56c + fStack_7cc * fStack_64c;
            fStack_648 = fVar339 * fStack_728 +
                         fStack_468 * fStack_5c8 + fStack_e8 * fStack_568 + fStack_7c8 * fStack_648;
            fStack_644 = fStack_84 + local_300._28_4_ + auVar195._12_4_ + 0.0;
            local_640._0_4_ = auVar126._0_4_;
            local_640._4_4_ = auVar126._4_4_;
            uStack_638._0_4_ = auVar126._8_4_;
            uStack_638._4_4_ = auVar126._12_4_;
            auStack_630._0_4_ = auVar126._16_4_;
            auStack_630._4_4_ = auVar126._20_4_;
            fStack_628 = auVar126._24_4_;
            local_6e0._0_4_ = auVar125._0_4_;
            local_6e0._4_4_ = auVar125._4_4_;
            fStack_6d8 = auVar125._8_4_;
            fStack_6d4 = auVar125._12_4_;
            auStack_6d0._0_4_ = auVar125._16_4_;
            auStack_6d0._4_4_ = auVar125._20_4_;
            fStack_6c8 = auVar125._24_4_;
            local_4a0._0_4_ = auVar124._0_4_;
            local_4a0._4_4_ = auVar124._4_4_;
            fStack_498 = auVar124._8_4_;
            fStack_494 = auVar124._12_4_;
            fStack_490 = auVar124._16_4_;
            fStack_48c = auVar124._20_4_;
            fStack_488 = auVar124._24_4_;
            fVar263 = (float)local_7e0._0_4_ * (float)local_4a0._0_4_;
            fVar272 = (float)local_7e0._4_4_ * (float)local_4a0._4_4_;
            fVar273 = fStack_7d8 * fStack_498;
            fVar274 = fStack_7d4 * fStack_494;
            fVar275 = fStack_7d0 * fStack_490;
            fVar276 = fStack_7cc * fStack_48c;
            fVar277 = fStack_7c8 * fStack_488;
            pfVar4 = (float *)(lVar136 + 0x21abdfc + (long)auVar138 * 4);
            fVar229 = *pfVar4;
            fVar240 = pfVar4[1];
            fVar242 = pfVar4[2];
            fVar244 = pfVar4[3];
            fVar246 = pfVar4[4];
            fVar247 = pfVar4[5];
            fVar248 = pfVar4[6];
            pfVar5 = (float *)(lVar136 + 0x21ac280 + (long)auVar138 * 4);
            fVar257 = *pfVar5;
            fVar258 = pfVar5[1];
            fVar259 = pfVar5[2];
            fVar260 = pfVar5[3];
            fVar261 = pfVar5[4];
            fVar262 = pfVar5[5];
            fVar339 = pfVar5[6];
            pfVar6 = (float *)(lVar136 + 0x21ab978 + (long)auVar138 * 4);
            fVar296 = *pfVar6;
            fVar223 = pfVar6[1];
            fVar307 = pfVar6[2];
            fVar304 = pfVar6[3];
            fVar305 = pfVar6[4];
            fVar225 = pfVar6[5];
            fVar310 = pfVar6[6];
            fVar206 = pfVar4[7] + pfVar5[7];
            fVar278 = pfVar5[7] + auVar351._28_4_ + 0.0;
            fVar279 = auVar351._28_4_ + pfVar2[7] + auVar351._28_4_ + 0.0;
            pfVar2 = (float *)(lVar136 + 0x21ab4f4 + (long)auVar138 * 4);
            fVar306 = *pfVar2;
            fVar309 = pfVar2[1];
            fVar227 = pfVar2[2];
            fVar312 = pfVar2[3];
            fVar166 = pfVar2[4];
            fVar183 = pfVar2[5];
            fVar185 = pfVar2[6];
            local_4a0._4_4_ =
                 fVar309 * (float)local_420._4_4_ +
                 (float)local_a0._4_4_ * fVar223 +
                 fVar308 * fVar240 + (float)local_440._4_4_ * fVar258;
            local_4a0._0_4_ =
                 fVar306 * (float)local_420._0_4_ +
                 (float)local_a0._0_4_ * fVar296 +
                 fVar231 * fVar229 + (float)local_440._0_4_ * fVar257;
            fStack_498 = fVar227 * fStack_418 +
                         fStack_98 * fVar307 + fVar311 * fVar242 + fStack_438 * fVar259;
            fStack_494 = fVar312 * fStack_414 +
                         fStack_94 * fVar304 + fVar313 * fVar244 + fStack_434 * fVar260;
            fStack_490 = fVar166 * fStack_410 +
                         fStack_90 * fVar305 + fVar314 * fVar246 + fStack_430 * fVar261;
            fStack_48c = fVar183 * fStack_40c +
                         fStack_8c * fVar225 + fVar323 * fVar247 + fStack_42c * fVar262;
            fStack_488 = fVar185 * fStack_408 +
                         fStack_88 * fVar310 + fVar325 * fVar248 + fStack_428 * fVar339;
            fStack_484 = fVar206 + fVar278;
            auVar178._0_4_ =
                 fVar306 * fVar167 +
                 (float)local_700._0_4_ * fVar229 + (float)local_5a0._0_4_ * fVar257 +
                 (float)local_c0._0_4_ * fVar296;
            auVar178._4_4_ =
                 fVar309 * fVar184 +
                 (float)local_700._4_4_ * fVar240 + (float)local_5a0._4_4_ * fVar258 +
                 (float)local_c0._4_4_ * fVar223;
            auVar178._8_4_ =
                 fVar227 * fVar186 +
                 fStack_6f8 * fVar242 + fStack_598 * fVar259 + fStack_b8 * fVar307;
            auVar178._12_4_ =
                 fVar312 * fVar187 +
                 fStack_6f4 * fVar244 + fStack_594 * fVar260 + fStack_b4 * fVar304;
            auVar178._16_4_ =
                 fVar166 * fVar188 +
                 fStack_6f0 * fVar246 + fStack_590 * fVar261 + fStack_b0 * fVar305;
            auVar178._20_4_ =
                 fVar183 * fVar189 +
                 fStack_6ec * fVar247 + fStack_58c * fVar262 + fStack_ac * fVar225;
            auVar178._24_4_ =
                 fVar185 * fVar190 +
                 fStack_6e8 * fVar248 + fStack_588 * fVar339 + fStack_a8 * fVar310;
            auVar178._28_4_ = fVar278 + fVar279;
            auVar347._0_4_ =
                 fVar296 * (float)local_480._0_4_ +
                 (float)local_100._0_4_ * fVar229 + (float)local_7e0._0_4_ * fVar257 +
                 fVar306 * (float)local_740._0_4_;
            auVar347._4_4_ =
                 fVar223 * (float)local_480._4_4_ +
                 (float)local_100._4_4_ * fVar240 + (float)local_7e0._4_4_ * fVar258 +
                 fVar309 * (float)local_740._4_4_;
            auVar347._8_4_ =
                 fVar307 * fStack_478 + fStack_f8 * fVar242 + fStack_7d8 * fVar259 +
                 fVar227 * fStack_738;
            auVar347._12_4_ =
                 fVar304 * fStack_474 + fStack_f4 * fVar244 + fStack_7d4 * fVar260 +
                 fVar312 * fStack_734;
            auVar347._16_4_ =
                 fVar305 * fStack_470 + fStack_f0 * fVar246 + fStack_7d0 * fVar261 +
                 fVar166 * fStack_730;
            auVar347._20_4_ =
                 fVar225 * fStack_46c + fStack_ec * fVar247 + fStack_7cc * fVar262 +
                 fVar183 * fStack_72c;
            auVar347._24_4_ =
                 fVar310 * fStack_468 + fStack_e8 * fVar248 + fStack_7c8 * fVar339 +
                 fVar185 * fStack_728;
            auVar347._28_4_ = pfVar6[7] + fVar206 + fVar279;
            pfVar2 = (float *)(lVar136 + 0x21ae21c + (long)auVar138 * 4);
            fVar229 = *pfVar2;
            fVar240 = pfVar2[1];
            fVar242 = pfVar2[2];
            fVar244 = pfVar2[3];
            fVar246 = pfVar2[4];
            fVar247 = pfVar2[5];
            fVar248 = pfVar2[6];
            pfVar4 = (float *)(lVar136 + 0x21ae6a0 + (long)auVar138 * 4);
            fVar257 = *pfVar4;
            fVar258 = pfVar4[1];
            fVar259 = pfVar4[2];
            fVar260 = pfVar4[3];
            fVar261 = pfVar4[4];
            fVar262 = pfVar4[5];
            fVar339 = pfVar4[6];
            pfVar5 = (float *)(lVar136 + 0x21add98 + (long)auVar138 * 4);
            fVar296 = *pfVar5;
            fVar223 = pfVar5[1];
            fVar307 = pfVar5[2];
            fVar304 = pfVar5[3];
            fVar305 = pfVar5[4];
            fVar225 = pfVar5[5];
            fVar310 = pfVar5[6];
            pfVar6 = (float *)(lVar136 + 0x21ad914 + (long)auVar138 * 4);
            fVar306 = *pfVar6;
            fVar309 = pfVar6[1];
            fVar227 = pfVar6[2];
            fVar312 = pfVar6[3];
            fVar166 = pfVar6[4];
            fVar183 = pfVar6[5];
            fVar185 = pfVar6[6];
            auVar320._0_4_ =
                 fVar306 * (float)local_420._0_4_ +
                 (float)local_a0._0_4_ * fVar296 +
                 fVar231 * fVar229 + (float)local_440._0_4_ * fVar257;
            auVar320._4_4_ =
                 fVar309 * (float)local_420._4_4_ +
                 (float)local_a0._4_4_ * fVar223 +
                 fVar308 * fVar240 + (float)local_440._4_4_ * fVar258;
            auVar320._8_4_ =
                 fVar227 * fStack_418 +
                 fStack_98 * fVar307 + fVar311 * fVar242 + fStack_438 * fVar259;
            auVar320._12_4_ =
                 fVar312 * fStack_414 +
                 fStack_94 * fVar304 + fVar313 * fVar244 + fStack_434 * fVar260;
            auVar320._16_4_ =
                 fVar166 * fStack_410 +
                 fStack_90 * fVar305 + fVar314 * fVar246 + fStack_430 * fVar261;
            auVar320._20_4_ =
                 fVar183 * fStack_40c +
                 fStack_8c * fVar225 + fVar323 * fVar247 + fStack_42c * fVar262;
            auVar320._24_4_ =
                 fVar185 * fStack_408 +
                 fStack_88 * fVar310 + fVar325 * fVar248 + fStack_428 * fVar339;
            auVar320._28_4_ = local_620._28_4_ + local_620._28_4_ + fStack_424 + local_620._28_4_;
            auVar343._0_4_ =
                 fVar306 * fVar167 +
                 fVar296 * (float)local_c0._0_4_ +
                 (float)local_700._0_4_ * fVar229 + fVar257 * (float)local_5a0._0_4_;
            auVar343._4_4_ =
                 fVar309 * fVar184 +
                 fVar223 * (float)local_c0._4_4_ +
                 (float)local_700._4_4_ * fVar240 + fVar258 * (float)local_5a0._4_4_;
            auVar343._8_4_ =
                 fVar227 * fVar186 +
                 fVar307 * fStack_b8 + fStack_6f8 * fVar242 + fVar259 * fStack_598;
            auVar343._12_4_ =
                 fVar312 * fVar187 +
                 fVar304 * fStack_b4 + fStack_6f4 * fVar244 + fVar260 * fStack_594;
            auVar343._16_4_ =
                 fVar166 * fVar188 +
                 fVar305 * fStack_b0 + fStack_6f0 * fVar246 + fVar261 * fStack_590;
            auVar343._20_4_ =
                 fVar183 * fVar189 +
                 fVar225 * fStack_ac + fStack_6ec * fVar247 + fVar262 * fStack_58c;
            auVar343._24_4_ =
                 fVar185 * fVar190 +
                 fVar310 * fStack_a8 + fStack_6e8 * fVar248 + fVar339 * fStack_588;
            auVar343._28_4_ = local_620._28_4_ + local_620._28_4_ + fStack_a4 + local_620._28_4_;
            auVar256._8_4_ = 0x7fffffff;
            auVar256._0_8_ = 0x7fffffff7fffffff;
            auVar256._12_4_ = 0x7fffffff;
            auVar256._16_4_ = 0x7fffffff;
            auVar256._20_4_ = 0x7fffffff;
            auVar256._24_4_ = 0x7fffffff;
            auVar256._28_4_ = 0x7fffffff;
            auVar150 = vandps_avx(_local_4a0,auVar256);
            auVar27 = vandps_avx(auVar178,auVar256);
            auVar27 = vmaxps_avx(auVar150,auVar27);
            auVar150 = vandps_avx(auVar347,auVar256);
            auVar27 = vmaxps_avx(auVar27,auVar150);
            auVar27 = vcmpps_avx(auVar27,_local_500,1);
            auVar28 = vblendvps_avx(_local_4a0,auVar25,auVar27);
            auVar152._0_4_ =
                 fVar306 * (float)local_740._0_4_ +
                 fVar296 * (float)local_480._0_4_ +
                 fVar257 * (float)local_7e0._0_4_ + (float)local_100._0_4_ * fVar229;
            auVar152._4_4_ =
                 fVar309 * (float)local_740._4_4_ +
                 fVar223 * (float)local_480._4_4_ +
                 fVar258 * (float)local_7e0._4_4_ + (float)local_100._4_4_ * fVar240;
            auVar152._8_4_ =
                 fVar227 * fStack_738 +
                 fVar307 * fStack_478 + fVar259 * fStack_7d8 + fStack_f8 * fVar242;
            auVar152._12_4_ =
                 fVar312 * fStack_734 +
                 fVar304 * fStack_474 + fVar260 * fStack_7d4 + fStack_f4 * fVar244;
            auVar152._16_4_ =
                 fVar166 * fStack_730 +
                 fVar305 * fStack_470 + fVar261 * fStack_7d0 + fStack_f0 * fVar246;
            auVar152._20_4_ =
                 fVar183 * fStack_72c +
                 fVar225 * fStack_46c + fVar262 * fStack_7cc + fStack_ec * fVar247;
            auVar152._24_4_ =
                 fVar185 * fStack_728 +
                 fVar310 * fStack_468 + fVar339 * fStack_7c8 + fStack_e8 * fVar248;
            auVar152._28_4_ = auVar150._28_4_ + pfVar5[7] + pfVar4[7] + pfVar2[7];
            auVar29 = vblendvps_avx(auVar178,auVar26,auVar27);
            auVar150 = vandps_avx(auVar320,auVar256);
            auVar27 = vandps_avx(auVar343,auVar256);
            auVar30 = vmaxps_avx(auVar150,auVar27);
            auVar150 = vandps_avx(auVar152,auVar256);
            auVar150 = vmaxps_avx(auVar30,auVar150);
            local_6c0._0_4_ = auVar127._0_4_;
            local_6c0._4_4_ = auVar127._4_4_;
            uStack_6b8._0_4_ = auVar127._8_4_;
            uStack_6b8._4_4_ = auVar127._12_4_;
            auStack_6b0._0_4_ = auVar127._16_4_;
            auStack_6b0._4_4_ = auVar127._20_4_;
            fStack_6a8 = auVar127._24_4_;
            auVar27 = vcmpps_avx(auVar150,_local_500,1);
            auVar150 = vblendvps_avx(auVar320,auVar25,auVar27);
            auVar153._0_4_ =
                 (float)local_740._0_4_ * (float)local_6c0._0_4_ +
                 (float)local_480._0_4_ * (float)local_640._0_4_ +
                 (float)local_100._0_4_ * (float)local_6e0._0_4_ + fVar263;
            auVar153._4_4_ =
                 (float)local_740._4_4_ * (float)local_6c0._4_4_ +
                 (float)local_480._4_4_ * (float)local_640._4_4_ +
                 (float)local_100._4_4_ * (float)local_6e0._4_4_ + fVar272;
            auVar153._8_4_ =
                 fStack_738 * (float)uStack_6b8 +
                 fStack_478 * (float)uStack_638 + fStack_f8 * fStack_6d8 + fVar273;
            auVar153._12_4_ =
                 fStack_734 * uStack_6b8._4_4_ +
                 fStack_474 * uStack_638._4_4_ + fStack_f4 * fStack_6d4 + fVar274;
            auVar153._16_4_ =
                 fStack_730 * (float)auStack_6b0._0_4_ +
                 fStack_470 * (float)auStack_630._0_4_ +
                 fStack_f0 * (float)auStack_6d0._0_4_ + fVar275;
            auVar153._20_4_ =
                 fStack_72c * (float)auStack_6b0._4_4_ +
                 fStack_46c * (float)auStack_630._4_4_ +
                 fStack_ec * (float)auStack_6d0._4_4_ + fVar276;
            auVar153._24_4_ =
                 fStack_728 * fStack_6a8 +
                 fStack_468 * fStack_628 + fStack_e8 * fStack_6c8 + fVar277;
            auVar153._28_4_ = auVar30._28_4_ + fStack_644 + auVar195._12_4_ + 0.0;
            auVar27 = vblendvps_avx(auVar343,auVar26,auVar27);
            fVar206 = auVar28._0_4_;
            fVar278 = auVar28._4_4_;
            fVar231 = auVar28._8_4_;
            fVar308 = auVar28._12_4_;
            fVar311 = auVar28._16_4_;
            fVar313 = auVar28._20_4_;
            fVar314 = auVar28._24_4_;
            fVar323 = auVar28._28_4_;
            fVar296 = auVar150._0_4_;
            fVar307 = auVar150._4_4_;
            fVar305 = auVar150._8_4_;
            fVar310 = auVar150._12_4_;
            fVar309 = auVar150._16_4_;
            fVar312 = auVar150._20_4_;
            fVar183 = auVar150._24_4_;
            fVar229 = auVar29._0_4_;
            fVar242 = auVar29._4_4_;
            fVar246 = auVar29._8_4_;
            fVar248 = auVar29._12_4_;
            fVar258 = auVar29._16_4_;
            fVar260 = auVar29._20_4_;
            fVar262 = auVar29._24_4_;
            auVar333._0_4_ = fVar229 * fVar229 + fVar206 * fVar206;
            auVar333._4_4_ = fVar242 * fVar242 + fVar278 * fVar278;
            auVar333._8_4_ = fVar246 * fVar246 + fVar231 * fVar231;
            auVar333._12_4_ = fVar248 * fVar248 + fVar308 * fVar308;
            auVar333._16_4_ = fVar258 * fVar258 + fVar311 * fVar311;
            auVar333._20_4_ = fVar260 * fVar260 + fVar313 * fVar313;
            auVar333._24_4_ = fVar262 * fVar262 + fVar314 * fVar314;
            auVar333._28_4_ = auVar25._28_4_ + auVar26._28_4_;
            auVar25 = vrsqrtps_avx(auVar333);
            fVar240 = auVar25._0_4_;
            fVar244 = auVar25._4_4_;
            auVar79._4_4_ = fVar244 * 1.5;
            auVar79._0_4_ = fVar240 * 1.5;
            fVar247 = auVar25._8_4_;
            auVar79._8_4_ = fVar247 * 1.5;
            fVar257 = auVar25._12_4_;
            auVar79._12_4_ = fVar257 * 1.5;
            fVar259 = auVar25._16_4_;
            auVar79._16_4_ = fVar259 * 1.5;
            fVar261 = auVar25._20_4_;
            auVar79._20_4_ = fVar261 * 1.5;
            fVar339 = auVar25._24_4_;
            auVar79._24_4_ = fVar339 * 1.5;
            auVar79._28_4_ = auVar343._28_4_;
            auVar80._4_4_ = fVar244 * fVar244 * fVar244 * auVar333._4_4_ * 0.5;
            auVar80._0_4_ = fVar240 * fVar240 * fVar240 * auVar333._0_4_ * 0.5;
            auVar80._8_4_ = fVar247 * fVar247 * fVar247 * auVar333._8_4_ * 0.5;
            auVar80._12_4_ = fVar257 * fVar257 * fVar257 * auVar333._12_4_ * 0.5;
            auVar80._16_4_ = fVar259 * fVar259 * fVar259 * auVar333._16_4_ * 0.5;
            auVar80._20_4_ = fVar261 * fVar261 * fVar261 * auVar333._20_4_ * 0.5;
            auVar80._24_4_ = fVar339 * fVar339 * fVar339 * auVar333._24_4_ * 0.5;
            auVar80._28_4_ = auVar333._28_4_;
            auVar26 = vsubps_avx(auVar79,auVar80);
            fVar167 = auVar26._0_4_;
            fVar184 = auVar26._4_4_;
            fVar186 = auVar26._8_4_;
            fVar187 = auVar26._12_4_;
            fVar188 = auVar26._16_4_;
            fVar189 = auVar26._20_4_;
            fVar190 = auVar26._24_4_;
            fVar240 = auVar27._0_4_;
            fVar244 = auVar27._4_4_;
            fVar247 = auVar27._8_4_;
            fVar257 = auVar27._12_4_;
            fVar259 = auVar27._16_4_;
            fVar261 = auVar27._20_4_;
            fVar339 = auVar27._24_4_;
            auVar300._0_4_ = fVar240 * fVar240 + fVar296 * fVar296;
            auVar300._4_4_ = fVar244 * fVar244 + fVar307 * fVar307;
            auVar300._8_4_ = fVar247 * fVar247 + fVar305 * fVar305;
            auVar300._12_4_ = fVar257 * fVar257 + fVar310 * fVar310;
            auVar300._16_4_ = fVar259 * fVar259 + fVar309 * fVar309;
            auVar300._20_4_ = fVar261 * fVar261 + fVar312 * fVar312;
            auVar300._24_4_ = fVar339 * fVar339 + fVar183 * fVar183;
            auVar300._28_4_ = auVar25._28_4_ + auVar150._28_4_;
            auVar150 = vrsqrtps_avx(auVar300);
            fVar223 = auVar150._0_4_;
            fVar304 = auVar150._4_4_;
            auVar81._4_4_ = fVar304 * 1.5;
            auVar81._0_4_ = fVar223 * 1.5;
            fVar225 = auVar150._8_4_;
            auVar81._8_4_ = fVar225 * 1.5;
            fVar306 = auVar150._12_4_;
            auVar81._12_4_ = fVar306 * 1.5;
            fVar227 = auVar150._16_4_;
            auVar81._16_4_ = fVar227 * 1.5;
            fVar166 = auVar150._20_4_;
            auVar81._20_4_ = fVar166 * 1.5;
            fVar185 = auVar150._24_4_;
            auVar81._24_4_ = fVar185 * 1.5;
            auVar81._28_4_ = auVar343._28_4_;
            auVar82._4_4_ = fVar304 * fVar304 * fVar304 * auVar300._4_4_ * 0.5;
            auVar82._0_4_ = fVar223 * fVar223 * fVar223 * auVar300._0_4_ * 0.5;
            auVar82._8_4_ = fVar225 * fVar225 * fVar225 * auVar300._8_4_ * 0.5;
            auVar82._12_4_ = fVar306 * fVar306 * fVar306 * auVar300._12_4_ * 0.5;
            auVar82._16_4_ = fVar227 * fVar227 * fVar227 * auVar300._16_4_ * 0.5;
            auVar82._20_4_ = fVar166 * fVar166 * fVar166 * auVar300._20_4_ * 0.5;
            auVar82._24_4_ = fVar185 * fVar185 * fVar185 * auVar300._24_4_ * 0.5;
            auVar82._28_4_ = auVar300._28_4_;
            auVar25 = vsubps_avx(auVar81,auVar82);
            fVar223 = auVar25._0_4_;
            fVar304 = auVar25._4_4_;
            fVar225 = auVar25._8_4_;
            fVar306 = auVar25._12_4_;
            fVar227 = auVar25._16_4_;
            fVar166 = auVar25._20_4_;
            fVar185 = auVar25._24_4_;
            fVar229 = fVar141 * fVar167 * fVar229;
            fVar242 = fVar159 * fVar184 * fVar242;
            auVar83._4_4_ = fVar242;
            auVar83._0_4_ = fVar229;
            fVar246 = fVar160 * fVar186 * fVar246;
            auVar83._8_4_ = fVar246;
            fVar248 = fVar161 * fVar187 * fVar248;
            auVar83._12_4_ = fVar248;
            fVar258 = fVar162 * fVar188 * fVar258;
            auVar83._16_4_ = fVar258;
            fVar260 = fVar163 * fVar189 * fVar260;
            auVar83._20_4_ = fVar260;
            fVar262 = fVar164 * fVar190 * fVar262;
            auVar83._24_4_ = fVar262;
            auVar83._28_4_ = auVar150._28_4_;
            local_6c0._4_4_ = fVar242 + local_620._4_4_;
            local_6c0._0_4_ = fVar229 + local_620._0_4_;
            uStack_6b8._0_4_ = fVar246 + local_620._8_4_;
            uStack_6b8._4_4_ = fVar248 + local_620._12_4_;
            auStack_6b0._0_4_ = fVar258 + local_620._16_4_;
            auStack_6b0._4_4_ = fVar260 + local_620._20_4_;
            fStack_6a8 = fVar262 + local_620._24_4_;
            fStack_6a4 = auVar150._28_4_ + local_620._28_4_;
            fVar229 = fVar141 * fVar167 * -fVar206;
            fVar242 = fVar159 * fVar184 * -fVar278;
            auVar84._4_4_ = fVar242;
            auVar84._0_4_ = fVar229;
            fVar246 = fVar160 * fVar186 * -fVar231;
            auVar84._8_4_ = fVar246;
            fVar248 = fVar161 * fVar187 * -fVar308;
            auVar84._12_4_ = fVar248;
            fVar258 = fVar162 * fVar188 * -fVar311;
            auVar84._16_4_ = fVar258;
            fVar260 = fVar163 * fVar189 * -fVar313;
            auVar84._20_4_ = fVar260;
            fVar262 = fVar164 * fVar190 * -fVar314;
            auVar84._24_4_ = fVar262;
            auVar84._28_4_ = -fVar323;
            local_6e0._4_4_ = auVar217._4_4_ + fVar242;
            local_6e0._0_4_ = auVar217._0_4_ + fVar229;
            fStack_6d8 = auVar217._8_4_ + fVar246;
            fStack_6d4 = auVar217._12_4_ + fVar248;
            auStack_6d0._0_4_ = auVar217._16_4_ + fVar258;
            auStack_6d0._4_4_ = auVar217._20_4_ + fVar260;
            fStack_6c8 = auVar217._24_4_ + fVar262;
            fStack_6c4 = auVar217._28_4_ + -fVar323;
            fVar229 = fVar167 * 0.0 * fVar141;
            fVar242 = fVar184 * 0.0 * fVar159;
            auVar85._4_4_ = fVar242;
            auVar85._0_4_ = fVar229;
            fVar246 = fVar186 * 0.0 * fVar160;
            auVar85._8_4_ = fVar246;
            fVar248 = fVar187 * 0.0 * fVar161;
            auVar85._12_4_ = fVar248;
            fVar258 = fVar188 * 0.0 * fVar162;
            auVar85._16_4_ = fVar258;
            fVar260 = fVar189 * 0.0 * fVar163;
            auVar85._20_4_ = fVar260;
            fVar262 = fVar190 * 0.0 * fVar164;
            auVar85._24_4_ = fVar262;
            auVar85._28_4_ = fVar323;
            auVar30 = vsubps_avx(local_620._0_32_,auVar83);
            auVar357._0_4_ = fVar229 + auVar153._0_4_;
            auVar357._4_4_ = fVar242 + auVar153._4_4_;
            auVar357._8_4_ = fVar246 + auVar153._8_4_;
            auVar357._12_4_ = fVar248 + auVar153._12_4_;
            auVar357._16_4_ = fVar258 + auVar153._16_4_;
            auVar357._20_4_ = fVar260 + auVar153._20_4_;
            auVar357._24_4_ = fVar262 + auVar153._24_4_;
            auVar357._28_4_ = fVar323 + auVar153._28_4_;
            fVar229 = auVar204._0_4_ * fVar223 * fVar240;
            fVar240 = auVar204._4_4_ * fVar304 * fVar244;
            auVar86._4_4_ = fVar240;
            auVar86._0_4_ = fVar229;
            fVar242 = auVar204._8_4_ * fVar225 * fVar247;
            auVar86._8_4_ = fVar242;
            fVar244 = auVar204._12_4_ * fVar306 * fVar257;
            auVar86._12_4_ = fVar244;
            fVar246 = auVar204._16_4_ * fVar227 * fVar259;
            auVar86._16_4_ = fVar246;
            fVar247 = auVar204._20_4_ * fVar166 * fVar261;
            auVar86._20_4_ = fVar247;
            fVar248 = auVar204._24_4_ * fVar185 * fVar339;
            auVar86._24_4_ = fVar248;
            auVar86._28_4_ = fVar165;
            auVar33 = vsubps_avx(auVar217,auVar84);
            auVar348._0_4_ = auVar351._0_4_ + fVar229;
            auVar348._4_4_ = auVar351._4_4_ + fVar240;
            auVar348._8_4_ = auVar351._8_4_ + fVar242;
            auVar348._12_4_ = auVar351._12_4_ + fVar244;
            auVar348._16_4_ = auVar351._16_4_ + fVar246;
            auVar348._20_4_ = auVar351._20_4_ + fVar247;
            auVar348._24_4_ = auVar351._24_4_ + fVar248;
            auVar348._28_4_ = auVar351._28_4_ + fVar165;
            fVar229 = fVar223 * -fVar296 * auVar204._0_4_;
            fVar240 = fVar304 * -fVar307 * auVar204._4_4_;
            auVar87._4_4_ = fVar240;
            auVar87._0_4_ = fVar229;
            fVar242 = fVar225 * -fVar305 * auVar204._8_4_;
            auVar87._8_4_ = fVar242;
            fVar244 = fVar306 * -fVar310 * auVar204._12_4_;
            auVar87._12_4_ = fVar244;
            fVar246 = fVar227 * -fVar309 * auVar204._16_4_;
            auVar87._16_4_ = fVar246;
            fVar247 = fVar166 * -fVar312 * auVar204._20_4_;
            auVar87._20_4_ = fVar247;
            fVar248 = fVar185 * -fVar183 * auVar204._24_4_;
            auVar87._24_4_ = fVar248;
            auVar87._28_4_ = local_620._28_4_;
            auVar144 = vsubps_avx(auVar153,auVar85);
            auVar239._0_4_ = auVar255._0_4_ + fVar229;
            auVar239._4_4_ = auVar255._4_4_ + fVar240;
            auVar239._8_4_ = auVar255._8_4_ + fVar242;
            auVar239._12_4_ = auVar255._12_4_ + fVar244;
            auVar239._16_4_ = auVar255._16_4_ + fVar246;
            auVar239._20_4_ = auVar255._20_4_ + fVar247;
            auVar239._24_4_ = auVar255._24_4_ + fVar248;
            auVar239._28_4_ = auVar255._28_4_ + local_620._28_4_;
            fVar229 = fVar223 * 0.0 * auVar204._0_4_;
            fVar240 = fVar304 * 0.0 * auVar204._4_4_;
            auVar88._4_4_ = fVar240;
            auVar88._0_4_ = fVar229;
            fVar242 = fVar225 * 0.0 * auVar204._8_4_;
            auVar88._8_4_ = fVar242;
            fVar244 = fVar306 * 0.0 * auVar204._12_4_;
            auVar88._12_4_ = fVar244;
            fVar246 = fVar227 * 0.0 * auVar204._16_4_;
            auVar88._16_4_ = fVar246;
            fVar247 = fVar166 * 0.0 * auVar204._20_4_;
            auVar88._20_4_ = fVar247;
            fVar248 = fVar185 * 0.0 * auVar204._24_4_;
            auVar88._24_4_ = fVar248;
            auVar88._28_4_ = auVar153._28_4_;
            auVar150 = vsubps_avx(auVar351,auVar86);
            auVar321._0_4_ = (float)local_660._0_4_ + fVar229;
            auVar321._4_4_ = (float)local_660._4_4_ + fVar240;
            auVar321._8_4_ = fStack_658 + fVar242;
            auVar321._12_4_ = fStack_654 + fVar244;
            auVar321._16_4_ = fStack_650 + fVar246;
            auVar321._20_4_ = fStack_64c + fVar247;
            auVar321._24_4_ = fStack_648 + fVar248;
            auVar321._28_4_ = fStack_644 + auVar153._28_4_;
            auVar26 = vsubps_avx(auVar255,auVar87);
            auVar27 = vsubps_avx(_local_660,auVar88);
            auVar28 = vsubps_avx(auVar239,auVar33);
            auVar29 = vsubps_avx(auVar321,auVar144);
            auVar89._4_4_ = auVar144._4_4_ * auVar28._4_4_;
            auVar89._0_4_ = auVar144._0_4_ * auVar28._0_4_;
            auVar89._8_4_ = auVar144._8_4_ * auVar28._8_4_;
            auVar89._12_4_ = auVar144._12_4_ * auVar28._12_4_;
            auVar89._16_4_ = auVar144._16_4_ * auVar28._16_4_;
            auVar89._20_4_ = auVar144._20_4_ * auVar28._20_4_;
            auVar89._24_4_ = auVar144._24_4_ * auVar28._24_4_;
            auVar89._28_4_ = auVar343._28_4_;
            auVar90._4_4_ = auVar33._4_4_ * auVar29._4_4_;
            auVar90._0_4_ = auVar33._0_4_ * auVar29._0_4_;
            auVar90._8_4_ = auVar33._8_4_ * auVar29._8_4_;
            auVar90._12_4_ = auVar33._12_4_ * auVar29._12_4_;
            auVar90._16_4_ = auVar33._16_4_ * auVar29._16_4_;
            auVar90._20_4_ = auVar33._20_4_ * auVar29._20_4_;
            auVar90._24_4_ = auVar33._24_4_ * auVar29._24_4_;
            auVar90._28_4_ = auVar255._28_4_;
            auVar31 = vsubps_avx(auVar90,auVar89);
            auVar91._4_4_ = auVar30._4_4_ * auVar29._4_4_;
            auVar91._0_4_ = auVar30._0_4_ * auVar29._0_4_;
            auVar91._8_4_ = auVar30._8_4_ * auVar29._8_4_;
            auVar91._12_4_ = auVar30._12_4_ * auVar29._12_4_;
            auVar91._16_4_ = auVar30._16_4_ * auVar29._16_4_;
            auVar91._20_4_ = auVar30._20_4_ * auVar29._20_4_;
            auVar91._24_4_ = auVar30._24_4_ * auVar29._24_4_;
            auVar91._28_4_ = auVar29._28_4_;
            auVar29 = vsubps_avx(auVar348,auVar30);
            auVar92._4_4_ = auVar144._4_4_ * auVar29._4_4_;
            auVar92._0_4_ = auVar144._0_4_ * auVar29._0_4_;
            auVar92._8_4_ = auVar144._8_4_ * auVar29._8_4_;
            auVar92._12_4_ = auVar144._12_4_ * auVar29._12_4_;
            auVar92._16_4_ = auVar144._16_4_ * auVar29._16_4_;
            auVar92._20_4_ = auVar144._20_4_ * auVar29._20_4_;
            auVar92._24_4_ = auVar144._24_4_ * auVar29._24_4_;
            auVar92._28_4_ = auVar25._28_4_;
            auVar32 = vsubps_avx(auVar92,auVar91);
            auVar93._4_4_ = auVar33._4_4_ * auVar29._4_4_;
            auVar93._0_4_ = auVar33._0_4_ * auVar29._0_4_;
            auVar93._8_4_ = auVar33._8_4_ * auVar29._8_4_;
            auVar93._12_4_ = auVar33._12_4_ * auVar29._12_4_;
            auVar93._16_4_ = auVar33._16_4_ * auVar29._16_4_;
            auVar93._20_4_ = auVar33._20_4_ * auVar29._20_4_;
            auVar93._24_4_ = auVar33._24_4_ * auVar29._24_4_;
            auVar93._28_4_ = auVar25._28_4_;
            auVar94._4_4_ = auVar30._4_4_ * auVar28._4_4_;
            auVar94._0_4_ = auVar30._0_4_ * auVar28._0_4_;
            auVar94._8_4_ = auVar30._8_4_ * auVar28._8_4_;
            auVar94._12_4_ = auVar30._12_4_ * auVar28._12_4_;
            auVar94._16_4_ = auVar30._16_4_ * auVar28._16_4_;
            auVar94._20_4_ = auVar30._20_4_ * auVar28._20_4_;
            auVar94._24_4_ = auVar30._24_4_ * auVar28._24_4_;
            auVar94._28_4_ = auVar28._28_4_;
            auVar25 = vsubps_avx(auVar94,auVar93);
            auVar179._0_4_ = auVar31._0_4_ * 0.0 + auVar25._0_4_ + auVar32._0_4_ * 0.0;
            auVar179._4_4_ = auVar31._4_4_ * 0.0 + auVar25._4_4_ + auVar32._4_4_ * 0.0;
            auVar179._8_4_ = auVar31._8_4_ * 0.0 + auVar25._8_4_ + auVar32._8_4_ * 0.0;
            auVar179._12_4_ = auVar31._12_4_ * 0.0 + auVar25._12_4_ + auVar32._12_4_ * 0.0;
            auVar179._16_4_ = auVar31._16_4_ * 0.0 + auVar25._16_4_ + auVar32._16_4_ * 0.0;
            auVar179._20_4_ = auVar31._20_4_ * 0.0 + auVar25._20_4_ + auVar32._20_4_ * 0.0;
            auVar179._24_4_ = auVar31._24_4_ * 0.0 + auVar25._24_4_ + auVar32._24_4_ * 0.0;
            auVar179._28_4_ = auVar31._28_4_ + auVar25._28_4_ + auVar32._28_4_;
            auVar24 = vcmpps_avx(auVar179,ZEXT832(0) << 0x20,2);
            auVar150 = vblendvps_avx(auVar150,_local_6c0,auVar24);
            auVar25 = vblendvps_avx(auVar26,_local_6e0,auVar24);
            auVar26 = vblendvps_avx(auVar27,auVar357,auVar24);
            auVar27 = vblendvps_avx(auVar30,auVar348,auVar24);
            auVar28 = vblendvps_avx(auVar33,auVar239,auVar24);
            auVar29 = vblendvps_avx(auVar144,auVar321,auVar24);
            auVar30 = vblendvps_avx(auVar348,auVar30,auVar24);
            auVar31 = vblendvps_avx(auVar239,auVar33,auVar24);
            auVar32 = vblendvps_avx(auVar321,auVar144,auVar24);
            _local_7c0 = vandps_avx(auVar177,_local_4e0);
            auVar30 = vsubps_avx(auVar30,auVar150);
            auVar145 = vsubps_avx(auVar31,auVar25);
            auVar32 = vsubps_avx(auVar32,auVar26);
            auVar172 = vsubps_avx(auVar25,auVar28);
            fVar229 = auVar145._0_4_;
            fVar276 = auVar26._0_4_;
            fVar257 = auVar145._4_4_;
            fVar277 = auVar26._4_4_;
            auVar95._4_4_ = fVar277 * fVar257;
            auVar95._0_4_ = fVar276 * fVar229;
            fVar296 = auVar145._8_4_;
            fVar279 = auVar26._8_4_;
            auVar95._8_4_ = fVar279 * fVar296;
            fVar306 = auVar145._12_4_;
            fVar291 = auVar26._12_4_;
            auVar95._12_4_ = fVar291 * fVar306;
            fVar167 = auVar145._16_4_;
            fVar292 = auVar26._16_4_;
            auVar95._16_4_ = fVar292 * fVar167;
            fVar206 = auVar145._20_4_;
            fVar293 = auVar26._20_4_;
            auVar95._20_4_ = fVar293 * fVar206;
            fVar323 = auVar145._24_4_;
            fVar294 = auVar26._24_4_;
            auVar95._24_4_ = fVar294 * fVar323;
            auVar95._28_4_ = auVar31._28_4_;
            fVar240 = auVar25._0_4_;
            fVar315 = auVar32._0_4_;
            fVar258 = auVar25._4_4_;
            fVar324 = auVar32._4_4_;
            auVar96._4_4_ = fVar324 * fVar258;
            auVar96._0_4_ = fVar315 * fVar240;
            fVar223 = auVar25._8_4_;
            fVar326 = auVar32._8_4_;
            auVar96._8_4_ = fVar326 * fVar223;
            fVar309 = auVar25._12_4_;
            fVar327 = auVar32._12_4_;
            auVar96._12_4_ = fVar327 * fVar309;
            fVar184 = auVar25._16_4_;
            fVar328 = auVar32._16_4_;
            auVar96._16_4_ = fVar328 * fVar184;
            fVar278 = auVar25._20_4_;
            fVar329 = auVar32._20_4_;
            auVar96._20_4_ = fVar329 * fVar278;
            fVar325 = auVar25._24_4_;
            fVar330 = auVar32._24_4_;
            uVar7 = auVar33._28_4_;
            auVar96._24_4_ = fVar330 * fVar325;
            auVar96._28_4_ = uVar7;
            auVar31 = vsubps_avx(auVar96,auVar95);
            fVar242 = auVar150._0_4_;
            fVar259 = auVar150._4_4_;
            auVar97._4_4_ = fVar324 * fVar259;
            auVar97._0_4_ = fVar315 * fVar242;
            fVar307 = auVar150._8_4_;
            auVar97._8_4_ = fVar326 * fVar307;
            fVar227 = auVar150._12_4_;
            auVar97._12_4_ = fVar327 * fVar227;
            fVar186 = auVar150._16_4_;
            auVar97._16_4_ = fVar328 * fVar186;
            fVar231 = auVar150._20_4_;
            auVar97._20_4_ = fVar329 * fVar231;
            fVar263 = auVar150._24_4_;
            auVar97._24_4_ = fVar330 * fVar263;
            auVar97._28_4_ = uVar7;
            fVar244 = auVar30._0_4_;
            fVar260 = auVar30._4_4_;
            auVar98._4_4_ = fVar277 * fVar260;
            auVar98._0_4_ = fVar276 * fVar244;
            fVar304 = auVar30._8_4_;
            auVar98._8_4_ = fVar279 * fVar304;
            fVar312 = auVar30._12_4_;
            auVar98._12_4_ = fVar291 * fVar312;
            fVar187 = auVar30._16_4_;
            auVar98._16_4_ = fVar292 * fVar187;
            fVar308 = auVar30._20_4_;
            auVar98._20_4_ = fVar293 * fVar308;
            fVar272 = auVar30._24_4_;
            auVar98._24_4_ = fVar294 * fVar272;
            auVar98._28_4_ = auVar348._28_4_;
            auVar33 = vsubps_avx(auVar98,auVar97);
            auVar99._4_4_ = fVar258 * fVar260;
            auVar99._0_4_ = fVar240 * fVar244;
            auVar99._8_4_ = fVar223 * fVar304;
            auVar99._12_4_ = fVar309 * fVar312;
            auVar99._16_4_ = fVar184 * fVar187;
            auVar99._20_4_ = fVar278 * fVar308;
            auVar99._24_4_ = fVar325 * fVar272;
            auVar99._28_4_ = uVar7;
            auVar100._4_4_ = fVar259 * fVar257;
            auVar100._0_4_ = fVar242 * fVar229;
            auVar100._8_4_ = fVar307 * fVar296;
            auVar100._12_4_ = fVar227 * fVar306;
            auVar100._16_4_ = fVar186 * fVar167;
            auVar100._20_4_ = fVar231 * fVar206;
            auVar100._24_4_ = fVar263 * fVar323;
            auVar100._28_4_ = auVar144._28_4_;
            auVar144 = vsubps_avx(auVar100,auVar99);
            auVar26 = vsubps_avx(auVar26,auVar29);
            fVar247 = auVar144._28_4_ + auVar33._28_4_;
            auVar334._0_4_ = auVar144._0_4_ + auVar33._0_4_ * 0.0 + auVar31._0_4_ * 0.0;
            auVar334._4_4_ = auVar144._4_4_ + auVar33._4_4_ * 0.0 + auVar31._4_4_ * 0.0;
            auVar334._8_4_ = auVar144._8_4_ + auVar33._8_4_ * 0.0 + auVar31._8_4_ * 0.0;
            auVar334._12_4_ = auVar144._12_4_ + auVar33._12_4_ * 0.0 + auVar31._12_4_ * 0.0;
            auVar334._16_4_ = auVar144._16_4_ + auVar33._16_4_ * 0.0 + auVar31._16_4_ * 0.0;
            auVar334._20_4_ = auVar144._20_4_ + auVar33._20_4_ * 0.0 + auVar31._20_4_ * 0.0;
            auVar334._24_4_ = auVar144._24_4_ + auVar33._24_4_ * 0.0 + auVar31._24_4_ * 0.0;
            auVar334._28_4_ = fVar247 + auVar31._28_4_;
            fVar246 = auVar172._0_4_;
            fVar261 = auVar172._4_4_;
            auVar101._4_4_ = auVar29._4_4_ * fVar261;
            auVar101._0_4_ = auVar29._0_4_ * fVar246;
            fVar305 = auVar172._8_4_;
            auVar101._8_4_ = auVar29._8_4_ * fVar305;
            fVar166 = auVar172._12_4_;
            auVar101._12_4_ = auVar29._12_4_ * fVar166;
            fVar188 = auVar172._16_4_;
            auVar101._16_4_ = auVar29._16_4_ * fVar188;
            fVar311 = auVar172._20_4_;
            auVar101._20_4_ = auVar29._20_4_ * fVar311;
            fVar273 = auVar172._24_4_;
            auVar101._24_4_ = auVar29._24_4_ * fVar273;
            auVar101._28_4_ = fVar247;
            fVar247 = auVar26._0_4_;
            fVar262 = auVar26._4_4_;
            auVar102._4_4_ = auVar28._4_4_ * fVar262;
            auVar102._0_4_ = auVar28._0_4_ * fVar247;
            fVar225 = auVar26._8_4_;
            auVar102._8_4_ = auVar28._8_4_ * fVar225;
            fVar183 = auVar26._12_4_;
            auVar102._12_4_ = auVar28._12_4_ * fVar183;
            fVar189 = auVar26._16_4_;
            auVar102._16_4_ = auVar28._16_4_ * fVar189;
            fVar313 = auVar26._20_4_;
            auVar102._20_4_ = auVar28._20_4_ * fVar313;
            fVar274 = auVar26._24_4_;
            auVar102._24_4_ = auVar28._24_4_ * fVar274;
            auVar102._28_4_ = auVar144._28_4_;
            auVar33 = vsubps_avx(auVar102,auVar101);
            auVar150 = vsubps_avx(auVar150,auVar27);
            fVar248 = auVar150._0_4_;
            fVar339 = auVar150._4_4_;
            auVar103._4_4_ = auVar29._4_4_ * fVar339;
            auVar103._0_4_ = auVar29._0_4_ * fVar248;
            fVar310 = auVar150._8_4_;
            auVar103._8_4_ = auVar29._8_4_ * fVar310;
            fVar185 = auVar150._12_4_;
            auVar103._12_4_ = auVar29._12_4_ * fVar185;
            fVar190 = auVar150._16_4_;
            auVar103._16_4_ = auVar29._16_4_ * fVar190;
            fVar314 = auVar150._20_4_;
            auVar103._20_4_ = auVar29._20_4_ * fVar314;
            fVar275 = auVar150._24_4_;
            auVar103._24_4_ = auVar29._24_4_ * fVar275;
            auVar103._28_4_ = auVar29._28_4_;
            auVar104._4_4_ = fVar262 * auVar27._4_4_;
            auVar104._0_4_ = fVar247 * auVar27._0_4_;
            auVar104._8_4_ = fVar225 * auVar27._8_4_;
            auVar104._12_4_ = fVar183 * auVar27._12_4_;
            auVar104._16_4_ = fVar189 * auVar27._16_4_;
            auVar104._20_4_ = fVar313 * auVar27._20_4_;
            auVar104._24_4_ = fVar274 * auVar27._24_4_;
            auVar104._28_4_ = auVar31._28_4_;
            auVar150 = vsubps_avx(auVar103,auVar104);
            auVar105._4_4_ = auVar28._4_4_ * fVar339;
            auVar105._0_4_ = auVar28._0_4_ * fVar248;
            auVar105._8_4_ = auVar28._8_4_ * fVar310;
            auVar105._12_4_ = auVar28._12_4_ * fVar185;
            auVar105._16_4_ = auVar28._16_4_ * fVar190;
            auVar105._20_4_ = auVar28._20_4_ * fVar314;
            auVar105._24_4_ = auVar28._24_4_ * fVar275;
            auVar105._28_4_ = auVar28._28_4_;
            auVar106._4_4_ = fVar261 * auVar27._4_4_;
            auVar106._0_4_ = fVar246 * auVar27._0_4_;
            auVar106._8_4_ = fVar305 * auVar27._8_4_;
            auVar106._12_4_ = fVar166 * auVar27._12_4_;
            auVar106._16_4_ = fVar188 * auVar27._16_4_;
            auVar106._20_4_ = fVar311 * auVar27._20_4_;
            auVar106._24_4_ = fVar273 * auVar27._24_4_;
            auVar106._28_4_ = auVar27._28_4_;
            auVar27 = vsubps_avx(auVar106,auVar105);
            auVar154._0_4_ = auVar33._0_4_ * 0.0 + auVar27._0_4_ + auVar150._0_4_ * 0.0;
            auVar154._4_4_ = auVar33._4_4_ * 0.0 + auVar27._4_4_ + auVar150._4_4_ * 0.0;
            auVar154._8_4_ = auVar33._8_4_ * 0.0 + auVar27._8_4_ + auVar150._8_4_ * 0.0;
            auVar154._12_4_ = auVar33._12_4_ * 0.0 + auVar27._12_4_ + auVar150._12_4_ * 0.0;
            auVar154._16_4_ = auVar33._16_4_ * 0.0 + auVar27._16_4_ + auVar150._16_4_ * 0.0;
            auVar154._20_4_ = auVar33._20_4_ * 0.0 + auVar27._20_4_ + auVar150._20_4_ * 0.0;
            auVar154._24_4_ = auVar33._24_4_ * 0.0 + auVar27._24_4_ + auVar150._24_4_ * 0.0;
            auVar154._28_4_ = auVar150._28_4_ + auVar27._28_4_ + auVar150._28_4_;
            auVar158 = ZEXT3264(auVar154);
            auVar150 = vmaxps_avx(auVar334,auVar154);
            auVar150 = vcmpps_avx(auVar150,ZEXT832(0) << 0x20,2);
            auVar27 = _local_7c0 & auVar150;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar27 >> 0x7f,0) == '\0') &&
                  (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0xbf,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar27[0x1f]) {
LAB_00ff97d3:
              auVar219 = ZEXT3264(CONCAT824(local_560[1]._24_8_,
                                            CONCAT816(local_560[1]._16_8_,
                                                      CONCAT88(local_560[1]._8_8_,local_560[1]._0_8_
                                                              ))));
              auVar345._4_4_ = fVar159;
              auVar345._0_4_ = fVar141;
              auVar345._8_4_ = fVar160;
              auVar345._12_4_ = fVar161;
              auVar345._16_4_ = fVar162;
              auVar345._20_4_ = fVar163;
              auVar345._24_4_ = fVar164;
              auVar345._28_4_ = fVar165;
            }
            else {
              auVar27 = vandps_avx(auVar150,_local_7c0);
              auVar107._4_4_ = fVar262 * fVar257;
              auVar107._0_4_ = fVar247 * fVar229;
              auVar107._8_4_ = fVar225 * fVar296;
              auVar107._12_4_ = fVar183 * fVar306;
              auVar107._16_4_ = fVar189 * fVar167;
              auVar107._20_4_ = fVar313 * fVar206;
              auVar107._24_4_ = fVar274 * fVar323;
              auVar107._28_4_ = local_7c0._28_4_;
              auVar108._4_4_ = fVar261 * fVar324;
              auVar108._0_4_ = fVar246 * fVar315;
              auVar108._8_4_ = fVar305 * fVar326;
              auVar108._12_4_ = fVar166 * fVar327;
              auVar108._16_4_ = fVar188 * fVar328;
              auVar108._20_4_ = fVar311 * fVar329;
              auVar108._24_4_ = fVar273 * fVar330;
              auVar108._28_4_ = auVar150._28_4_;
              auVar28 = vsubps_avx(auVar108,auVar107);
              auVar109._4_4_ = fVar339 * fVar324;
              auVar109._0_4_ = fVar248 * fVar315;
              auVar109._8_4_ = fVar310 * fVar326;
              auVar109._12_4_ = fVar185 * fVar327;
              auVar109._16_4_ = fVar190 * fVar328;
              auVar109._20_4_ = fVar314 * fVar329;
              auVar109._24_4_ = fVar275 * fVar330;
              auVar109._28_4_ = auVar32._28_4_;
              auVar110._4_4_ = fVar262 * fVar260;
              auVar110._0_4_ = fVar247 * fVar244;
              auVar110._8_4_ = fVar225 * fVar304;
              auVar110._12_4_ = fVar183 * fVar312;
              auVar110._16_4_ = fVar189 * fVar187;
              auVar110._20_4_ = fVar313 * fVar308;
              auVar110._24_4_ = fVar274 * fVar272;
              auVar110._28_4_ = auVar26._28_4_;
              auVar29 = vsubps_avx(auVar110,auVar109);
              auVar111._4_4_ = fVar261 * fVar260;
              auVar111._0_4_ = fVar246 * fVar244;
              auVar111._8_4_ = fVar305 * fVar304;
              auVar111._12_4_ = fVar166 * fVar312;
              auVar111._16_4_ = fVar188 * fVar187;
              auVar111._20_4_ = fVar311 * fVar308;
              auVar111._24_4_ = fVar273 * fVar272;
              auVar111._28_4_ = auVar30._28_4_;
              auVar112._4_4_ = fVar339 * fVar257;
              auVar112._0_4_ = fVar248 * fVar229;
              auVar112._8_4_ = fVar310 * fVar296;
              auVar112._12_4_ = fVar185 * fVar306;
              auVar112._16_4_ = fVar190 * fVar167;
              auVar112._20_4_ = fVar314 * fVar206;
              auVar112._24_4_ = fVar275 * fVar323;
              auVar112._28_4_ = auVar145._28_4_;
              auVar31 = vsubps_avx(auVar112,auVar111);
              auVar301._0_4_ = auVar28._0_4_ * 0.0 + auVar31._0_4_ + auVar29._0_4_ * 0.0;
              auVar301._4_4_ = auVar28._4_4_ * 0.0 + auVar31._4_4_ + auVar29._4_4_ * 0.0;
              auVar301._8_4_ = auVar28._8_4_ * 0.0 + auVar31._8_4_ + auVar29._8_4_ * 0.0;
              auVar301._12_4_ = auVar28._12_4_ * 0.0 + auVar31._12_4_ + auVar29._12_4_ * 0.0;
              auVar301._16_4_ = auVar28._16_4_ * 0.0 + auVar31._16_4_ + auVar29._16_4_ * 0.0;
              auVar301._20_4_ = auVar28._20_4_ * 0.0 + auVar31._20_4_ + auVar29._20_4_ * 0.0;
              auVar301._24_4_ = auVar28._24_4_ * 0.0 + auVar31._24_4_ + auVar29._24_4_ * 0.0;
              auVar301._28_4_ = auVar172._28_4_ + auVar31._28_4_ + auVar30._28_4_;
              auVar150 = vrcpps_avx(auVar301);
              fVar229 = auVar150._0_4_;
              fVar244 = auVar150._4_4_;
              auVar113._4_4_ = auVar301._4_4_ * fVar244;
              auVar113._0_4_ = auVar301._0_4_ * fVar229;
              fVar246 = auVar150._8_4_;
              auVar113._8_4_ = auVar301._8_4_ * fVar246;
              fVar247 = auVar150._12_4_;
              auVar113._12_4_ = auVar301._12_4_ * fVar247;
              fVar248 = auVar150._16_4_;
              auVar113._16_4_ = auVar301._16_4_ * fVar248;
              fVar257 = auVar150._20_4_;
              auVar113._20_4_ = auVar301._20_4_ * fVar257;
              fVar260 = auVar150._24_4_;
              auVar113._24_4_ = auVar301._24_4_ * fVar260;
              auVar113._28_4_ = auVar26._28_4_;
              auVar344._8_4_ = 0x3f800000;
              auVar344._0_8_ = 0x3f8000003f800000;
              auVar344._12_4_ = 0x3f800000;
              auVar344._16_4_ = 0x3f800000;
              auVar344._20_4_ = 0x3f800000;
              auVar344._24_4_ = 0x3f800000;
              auVar344._28_4_ = 0x3f800000;
              auVar150 = vsubps_avx(auVar344,auVar113);
              fVar229 = auVar150._0_4_ * fVar229 + fVar229;
              fVar244 = auVar150._4_4_ * fVar244 + fVar244;
              fVar246 = auVar150._8_4_ * fVar246 + fVar246;
              fVar247 = auVar150._12_4_ * fVar247 + fVar247;
              fVar248 = auVar150._16_4_ * fVar248 + fVar248;
              fVar257 = auVar150._20_4_ * fVar257 + fVar257;
              fVar260 = auVar150._24_4_ * fVar260 + fVar260;
              auVar114._4_4_ =
                   (fVar259 * auVar28._4_4_ + auVar29._4_4_ * fVar258 + fVar277 * auVar31._4_4_) *
                   fVar244;
              auVar114._0_4_ =
                   (fVar242 * auVar28._0_4_ + auVar29._0_4_ * fVar240 + fVar276 * auVar31._0_4_) *
                   fVar229;
              auVar114._8_4_ =
                   (fVar307 * auVar28._8_4_ + auVar29._8_4_ * fVar223 + fVar279 * auVar31._8_4_) *
                   fVar246;
              auVar114._12_4_ =
                   (fVar227 * auVar28._12_4_ + auVar29._12_4_ * fVar309 + fVar291 * auVar31._12_4_)
                   * fVar247;
              auVar114._16_4_ =
                   (fVar186 * auVar28._16_4_ + auVar29._16_4_ * fVar184 + fVar292 * auVar31._16_4_)
                   * fVar248;
              auVar114._20_4_ =
                   (fVar231 * auVar28._20_4_ + auVar29._20_4_ * fVar278 + fVar293 * auVar31._20_4_)
                   * fVar257;
              auVar114._24_4_ =
                   (fVar263 * auVar28._24_4_ + auVar29._24_4_ * fVar325 + fVar294 * auVar31._24_4_)
                   * fVar260;
              auVar114._28_4_ = auVar25._28_4_ + auVar31._28_4_;
              uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar218._4_4_ = uVar7;
              auVar218._0_4_ = uVar7;
              auVar218._8_4_ = uVar7;
              auVar218._12_4_ = uVar7;
              auVar218._16_4_ = uVar7;
              auVar218._20_4_ = uVar7;
              auVar218._24_4_ = uVar7;
              auVar218._28_4_ = uVar7;
              auVar25 = vcmpps_avx(local_320,auVar114,2);
              auVar150 = vcmpps_avx(auVar114,auVar218,2);
              auVar150 = vandps_avx(auVar25,auVar150);
              auVar26 = auVar27 & auVar150;
              if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar26 >> 0x7f,0) == '\0') &&
                    (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar26 >> 0xbf,0) == '\0') &&
                  (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar26[0x1f]) goto LAB_00ff97d3;
              auVar150 = vandps_avx(auVar27,auVar150);
              auVar26 = vcmpps_avx(auVar301,ZEXT832(0) << 0x20,4);
              auVar27 = auVar150 & auVar26;
              auVar219 = ZEXT3264(CONCAT824(local_560[1]._24_8_,
                                            CONCAT816(local_560[1]._16_8_,
                                                      CONCAT88(local_560[1]._8_8_,local_560[1]._0_8_
                                                              ))));
              auVar345._4_4_ = fVar159;
              auVar345._0_4_ = fVar141;
              auVar345._8_4_ = fVar160;
              auVar345._12_4_ = fVar161;
              auVar345._16_4_ = fVar162;
              auVar345._20_4_ = fVar163;
              auVar345._24_4_ = fVar164;
              auVar345._28_4_ = fVar165;
              if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar27 >> 0x7f,0) != '\0') ||
                    (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0xbf,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar27[0x1f] < '\0') {
                auVar150 = vandps_avx(auVar26,auVar150);
                auVar219 = ZEXT3264(auVar150);
                auVar115._4_4_ = auVar334._4_4_ * fVar244;
                auVar115._0_4_ = auVar334._0_4_ * fVar229;
                auVar115._8_4_ = auVar334._8_4_ * fVar246;
                auVar115._12_4_ = auVar334._12_4_ * fVar247;
                auVar115._16_4_ = auVar334._16_4_ * fVar248;
                auVar115._20_4_ = auVar334._20_4_ * fVar257;
                auVar115._24_4_ = auVar334._24_4_ * fVar260;
                auVar115._28_4_ = auVar25._28_4_;
                auVar116._4_4_ = auVar154._4_4_ * fVar244;
                auVar116._0_4_ = auVar154._0_4_ * fVar229;
                auVar116._8_4_ = auVar154._8_4_ * fVar246;
                auVar116._12_4_ = auVar154._12_4_ * fVar247;
                auVar116._16_4_ = auVar154._16_4_ * fVar248;
                auVar116._20_4_ = auVar154._20_4_ * fVar257;
                auVar116._24_4_ = auVar154._24_4_ * fVar260;
                auVar116._28_4_ = auVar154._28_4_;
                auVar271._8_4_ = 0x3f800000;
                auVar271._0_8_ = 0x3f8000003f800000;
                auVar271._12_4_ = 0x3f800000;
                auVar271._16_4_ = 0x3f800000;
                auVar271._20_4_ = 0x3f800000;
                auVar271._24_4_ = 0x3f800000;
                auVar271._28_4_ = 0x3f800000;
                auVar150 = vsubps_avx(auVar271,auVar115);
                _local_120 = vblendvps_avx(auVar150,auVar115,auVar24);
                auVar150 = vsubps_avx(auVar271,auVar116);
                _local_360 = vblendvps_avx(auVar150,auVar116,auVar24);
                auVar158 = ZEXT3264(_local_360);
                local_520 = auVar114;
              }
            }
            auVar338 = ZEXT3264(local_720);
            auVar150 = auVar219._0_32_;
            if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar150 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar150 >> 0x7f,0) != '\0') ||
                  (auVar219 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar150 >> 0xbf,0) != '\0') ||
                (auVar219 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar219[0x1f] < '\0') {
              auVar25 = vsubps_avx(auVar204,auVar345);
              fVar240 = auVar345._0_4_ + auVar25._0_4_ * (float)local_120._0_4_;
              fVar242 = auVar345._4_4_ + auVar25._4_4_ * (float)local_120._4_4_;
              fVar244 = auVar345._8_4_ + auVar25._8_4_ * fStack_118;
              fVar246 = auVar345._12_4_ + auVar25._12_4_ * fStack_114;
              fVar247 = auVar345._16_4_ + auVar25._16_4_ * fStack_110;
              fVar248 = auVar345._20_4_ + auVar25._20_4_ * fStack_10c;
              fVar257 = auVar345._24_4_ + auVar25._24_4_ * fStack_108;
              fVar258 = auVar345._28_4_ + auVar25._28_4_;
              fVar229 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar117._4_4_ = (fVar242 + fVar242) * fVar229;
              auVar117._0_4_ = (fVar240 + fVar240) * fVar229;
              auVar117._8_4_ = (fVar244 + fVar244) * fVar229;
              auVar117._12_4_ = (fVar246 + fVar246) * fVar229;
              auVar117._16_4_ = (fVar247 + fVar247) * fVar229;
              auVar117._20_4_ = (fVar248 + fVar248) * fVar229;
              auVar117._24_4_ = (fVar257 + fVar257) * fVar229;
              auVar117._28_4_ = fVar258 + fVar258;
              auVar25 = vcmpps_avx(local_520,auVar117,6);
              auVar158 = ZEXT3264(auVar25);
              auVar26 = auVar150 & auVar25;
              if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar26 >> 0x7f,0) != '\0') ||
                    (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0xbf,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar26[0x1f] < '\0') {
                local_360._0_4_ = (float)local_360._0_4_ + (float)local_360._0_4_ + -1.0;
                local_360._4_4_ = (float)local_360._4_4_ + (float)local_360._4_4_ + -1.0;
                uStack_358._0_4_ = (float)uStack_358 + (float)uStack_358 + -1.0;
                uStack_358._4_4_ = uStack_358._4_4_ + uStack_358._4_4_ + -1.0;
                uStack_350._0_4_ = (float)uStack_350 + (float)uStack_350 + -1.0;
                uStack_350._4_4_ = uStack_350._4_4_ + uStack_350._4_4_ + -1.0;
                uStack_348._0_4_ = (float)uStack_348 + (float)uStack_348 + -1.0;
                uStack_348._4_4_ = uStack_348._4_4_ + uStack_348._4_4_ + -1.0;
                local_2e0 = _local_120;
                auVar131 = _local_360;
                auVar26 = _local_360;
                local_2c0 = (float)local_360._0_4_;
                fStack_2bc = (float)local_360._4_4_;
                fStack_2b8 = (float)uStack_358;
                fStack_2b4 = uStack_358._4_4_;
                fStack_2b0 = (float)uStack_350;
                fStack_2ac = uStack_350._4_4_;
                fStack_2a8 = (float)uStack_348;
                fStack_2a4 = uStack_348._4_4_;
                local_2a0 = local_520;
                local_27c = uVar19;
                local_260 = local_820;
                uStack_258 = uStack_818;
                local_250 = local_780;
                uStack_248 = uStack_778;
                local_240 = local_790;
                uStack_238 = uStack_788;
                pGVar21 = (context->scene->geometries).items[uVar18].ptr;
                _local_360 = auVar26;
                if ((pGVar21->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_560[0] = vandps_avx(auVar25,auVar150);
                  auVar194._0_4_ = (float)(int)local_280;
                  auVar194._4_8_ = SUB128(ZEXT812(0),4);
                  auVar194._12_4_ = 0;
                  auVar234 = vshufps_avx(auVar194,auVar194,0);
                  local_200[0] = (auVar234._0_4_ + (float)local_120._0_4_ + 0.0) *
                                 (float)local_140._0_4_;
                  local_200[1] = (auVar234._4_4_ + (float)local_120._4_4_ + 1.0) *
                                 (float)local_140._4_4_;
                  local_200[2] = (auVar234._8_4_ + fStack_118 + 2.0) * fStack_138;
                  local_200[3] = (auVar234._12_4_ + fStack_114 + 3.0) * fStack_134;
                  fStack_1f0 = (auVar234._0_4_ + fStack_110 + 4.0) * fStack_130;
                  fStack_1ec = (auVar234._4_4_ + fStack_10c + 5.0) * fStack_12c;
                  fStack_1e8 = (auVar234._8_4_ + fStack_108 + 6.0) * fStack_128;
                  fStack_1e4 = auVar234._12_4_ + fStack_104 + 7.0;
                  uStack_350 = auVar131._16_8_;
                  uStack_348 = auVar26._24_8_;
                  local_1e0 = local_360;
                  uStack_1d8 = uStack_358;
                  uStack_1d0 = uStack_350;
                  uStack_1c8 = uStack_348;
                  local_1c0 = local_520;
                  auVar180._8_4_ = 0x7f800000;
                  auVar180._0_8_ = 0x7f8000007f800000;
                  auVar180._12_4_ = 0x7f800000;
                  auVar180._16_4_ = 0x7f800000;
                  auVar180._20_4_ = 0x7f800000;
                  auVar180._24_4_ = 0x7f800000;
                  auVar180._28_4_ = 0x7f800000;
                  auVar150 = vblendvps_avx(auVar180,local_520,local_560[0]);
                  auVar25 = vshufps_avx(auVar150,auVar150,0xb1);
                  auVar25 = vminps_avx(auVar150,auVar25);
                  auVar26 = vshufpd_avx(auVar25,auVar25,5);
                  auVar25 = vminps_avx(auVar25,auVar26);
                  auVar26 = vperm2f128_avx(auVar25,auVar25,1);
                  auVar25 = vminps_avx(auVar25,auVar26);
                  auVar25 = vcmpps_avx(auVar150,auVar25,0);
                  auVar26 = local_560[0] & auVar25;
                  auVar150 = local_560[0];
                  if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar26 >> 0x7f,0) != '\0') ||
                        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar26 >> 0xbf,0) != '\0') ||
                      (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar26[0x1f] < '\0') {
                    auVar150 = vandps_avx(auVar25,local_560[0]);
                  }
                  uVar133 = vmovmskps_avx(auVar150);
                  uVar8 = 0;
                  if (uVar133 != 0) {
                    for (; (uVar133 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                    }
                  }
                  uVar135 = (ulong)uVar8;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar229 = local_200[uVar135];
                    auVar158 = ZEXT464((uint)fVar229);
                    uVar7 = *(undefined4 *)((long)&local_1e0 + uVar135 * 4);
                    fVar242 = 1.0 - fVar229;
                    fVar240 = fVar229 * fVar242 + fVar229 * fVar242;
                    auVar234 = ZEXT416((uint)(fVar229 * fVar229 * 3.0));
                    auVar234 = vshufps_avx(auVar234,auVar234,0);
                    auVar195 = ZEXT416((uint)((fVar240 - fVar229 * fVar229) * 3.0));
                    auVar195 = vshufps_avx(auVar195,auVar195,0);
                    auVar210 = ZEXT416((uint)((fVar242 * fVar242 - fVar240) * 3.0));
                    auVar210 = vshufps_avx(auVar210,auVar210,0);
                    auVar197 = ZEXT416((uint)(fVar242 * fVar242 * -3.0));
                    auVar197 = vshufps_avx(auVar197,auVar197,0);
                    auVar196._0_4_ =
                         fVar207 * auVar197._0_4_ +
                         auVar210._0_4_ * fVar224 +
                         auVar234._0_4_ * (float)local_790._0_4_ +
                         auVar195._0_4_ * (float)local_780._0_4_;
                    auVar196._4_4_ =
                         fVar220 * auVar197._4_4_ +
                         auVar210._4_4_ * fVar226 +
                         auVar234._4_4_ * (float)local_790._4_4_ +
                         auVar195._4_4_ * (float)local_780._4_4_;
                    auVar196._8_4_ =
                         fVar221 * auVar197._8_4_ +
                         auVar210._8_4_ * fVar228 +
                         auVar234._8_4_ * (float)uStack_788 + auVar195._8_4_ * (float)uStack_778;
                    auVar196._12_4_ =
                         fVar222 * auVar197._12_4_ +
                         auVar210._12_4_ * fVar249 +
                         auVar234._12_4_ * uStack_788._4_4_ + auVar195._12_4_ * uStack_778._4_4_;
                    auVar219 = ZEXT464(*(uint *)(local_1c0 + uVar135 * 4));
                    *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_1c0 + uVar135 * 4);
                    *(float *)(ray + k * 4 + 0xc0) = auVar196._0_4_;
                    uVar20 = vextractps_avx(auVar196,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar20;
                    uVar20 = vextractps_avx(auVar196,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar20;
                    *(float *)(ray + k * 4 + 0xf0) = fVar229;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar7;
                    *(uint *)(ray + k * 4 + 0x110) = uVar134;
                    *(uint *)(ray + k * 4 + 0x120) = uVar18;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_6c0 = auVar138;
                    auStack_690 = auVar255._16_16_;
                    local_6a0 = *local_670;
                    local_620._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    auVar302 = ZEXT1664(ZEXT816(0) << 0x40);
                    _local_640 = auVar351;
                    _local_5e0 = auVar204;
                    _local_580 = auVar177;
                    local_270 = local_850;
                    uStack_268 = uStack_848;
                    while( true ) {
                      local_3c0 = local_200[uVar135];
                      local_7c0 = (undefined1  [8])uVar135;
                      local_3b0 = *(undefined4 *)((long)&local_1e0 + uVar135 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar135 * 4)
                      ;
                      fVar240 = 1.0 - local_3c0;
                      fVar229 = local_3c0 * fVar240 + local_3c0 * fVar240;
                      auVar234 = ZEXT416((uint)(local_3c0 * local_3c0 * 3.0));
                      auVar234 = vshufps_avx(auVar234,auVar234,0);
                      auVar195 = ZEXT416((uint)((fVar229 - local_3c0 * local_3c0) * 3.0));
                      auVar195 = vshufps_avx(auVar195,auVar195,0);
                      auVar210 = ZEXT416((uint)((fVar240 * fVar240 - fVar229) * 3.0));
                      auVar210 = vshufps_avx(auVar210,auVar210,0);
                      local_770.context = context->user;
                      auVar197 = ZEXT416((uint)(fVar240 * fVar240 * -3.0));
                      auVar197 = vshufps_avx(auVar197,auVar197,0);
                      auVar198._0_4_ =
                           fVar207 * auVar197._0_4_ +
                           auVar210._0_4_ * fVar224 +
                           auVar234._0_4_ * (float)local_790._0_4_ +
                           auVar195._0_4_ * (float)local_780._0_4_;
                      auVar198._4_4_ =
                           fVar220 * auVar197._4_4_ +
                           auVar210._4_4_ * fVar226 +
                           auVar234._4_4_ * (float)local_790._4_4_ +
                           auVar195._4_4_ * (float)local_780._4_4_;
                      auVar198._8_4_ =
                           fVar221 * auVar197._8_4_ +
                           auVar210._8_4_ * fVar228 +
                           auVar234._8_4_ * (float)uStack_788 + auVar195._8_4_ * (float)uStack_778;
                      auVar198._12_4_ =
                           fVar222 * auVar197._12_4_ +
                           auVar210._12_4_ * fVar249 +
                           auVar234._12_4_ * uStack_788._4_4_ + auVar195._12_4_ * uStack_778._4_4_;
                      auVar234 = vshufps_avx(auVar198,auVar198,0);
                      local_3f0[0] = (RTCHitN)auVar234[0];
                      local_3f0[1] = (RTCHitN)auVar234[1];
                      local_3f0[2] = (RTCHitN)auVar234[2];
                      local_3f0[3] = (RTCHitN)auVar234[3];
                      local_3f0[4] = (RTCHitN)auVar234[4];
                      local_3f0[5] = (RTCHitN)auVar234[5];
                      local_3f0[6] = (RTCHitN)auVar234[6];
                      local_3f0[7] = (RTCHitN)auVar234[7];
                      local_3f0[8] = (RTCHitN)auVar234[8];
                      local_3f0[9] = (RTCHitN)auVar234[9];
                      local_3f0[10] = (RTCHitN)auVar234[10];
                      local_3f0[0xb] = (RTCHitN)auVar234[0xb];
                      local_3f0[0xc] = (RTCHitN)auVar234[0xc];
                      local_3f0[0xd] = (RTCHitN)auVar234[0xd];
                      local_3f0[0xe] = (RTCHitN)auVar234[0xe];
                      local_3f0[0xf] = (RTCHitN)auVar234[0xf];
                      auVar234 = vshufps_avx(auVar198,auVar198,0x55);
                      local_3e0 = auVar234;
                      local_3d0 = vshufps_avx(auVar198,auVar198,0xaa);
                      fStack_3bc = local_3c0;
                      fStack_3b8 = local_3c0;
                      fStack_3b4 = local_3c0;
                      uStack_3ac = local_3b0;
                      uStack_3a8 = local_3b0;
                      uStack_3a4 = local_3b0;
                      local_3a0 = local_7a0._0_8_;
                      uStack_398 = local_7a0._8_8_;
                      local_390 = local_5f0._0_8_;
                      uStack_388 = local_5f0._8_8_;
                      vcmpps_avx(auVar302._0_32_,auVar302._0_32_,0xf);
                      uStack_37c = (local_770.context)->instID[0];
                      local_380 = uStack_37c;
                      uStack_378 = uStack_37c;
                      uStack_374 = uStack_37c;
                      uStack_370 = (local_770.context)->instPrimID[0];
                      uStack_36c = uStack_370;
                      uStack_368 = uStack_370;
                      uStack_364 = uStack_370;
                      local_810 = local_6a0;
                      local_770.valid = (int *)local_810;
                      local_770.geometryUserPtr = pGVar21->userPtr;
                      local_770.hit = local_3f0;
                      local_770.N = 4;
                      local_770.ray = (RTCRayN *)ray;
                      if (pGVar21->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar21->intersectionFilterN)(&local_770);
                        auVar302 = ZEXT1664(ZEXT816(0) << 0x40);
                      }
                      if (local_810 == (undefined1  [16])0x0) {
                        auVar234 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                        auVar234 = auVar234 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var22 = context->args->filter;
                        if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var22)(&local_770);
                          auVar302 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        auVar195 = vpcmpeqd_avx(local_810,_DAT_01f7aa10);
                        auVar210 = vpcmpeqd_avx(auVar234,auVar234);
                        auVar234 = auVar195 ^ auVar210;
                        if (local_810 != (undefined1  [16])0x0) {
                          auVar195 = auVar195 ^ auVar210;
                          auVar210 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])local_770.hit);
                          *(undefined1 (*) [16])(local_770.ray + 0xc0) = auVar210;
                          auVar210 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])
                                                              (local_770.hit + 0x10));
                          *(undefined1 (*) [16])(local_770.ray + 0xd0) = auVar210;
                          auVar210 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])
                                                              (local_770.hit + 0x20));
                          *(undefined1 (*) [16])(local_770.ray + 0xe0) = auVar210;
                          auVar210 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])
                                                              (local_770.hit + 0x30));
                          *(undefined1 (*) [16])(local_770.ray + 0xf0) = auVar210;
                          auVar210 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])
                                                              (local_770.hit + 0x40));
                          *(undefined1 (*) [16])(local_770.ray + 0x100) = auVar210;
                          auVar210 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])
                                                              (local_770.hit + 0x50));
                          *(undefined1 (*) [16])(local_770.ray + 0x110) = auVar210;
                          auVar210 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])
                                                              (local_770.hit + 0x60));
                          *(undefined1 (*) [16])(local_770.ray + 0x120) = auVar210;
                          auVar210 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])
                                                              (local_770.hit + 0x70));
                          *(undefined1 (*) [16])(local_770.ray + 0x130) = auVar210;
                          auVar195 = vmaskmovps_avx(auVar195,*(undefined1 (*) [16])
                                                              (local_770.hit + 0x80));
                          *(undefined1 (*) [16])(local_770.ray + 0x140) = auVar195;
                        }
                      }
                      auVar150 = local_520;
                      auVar219 = ZEXT3264(local_520);
                      auVar170._8_8_ = 0x100000001;
                      auVar170._0_8_ = 0x100000001;
                      if ((auVar170 & auVar234) == (undefined1  [16])0x0) {
                        *(int *)(ray + k * 4 + 0x80) = local_620._0_4_;
                        auVar234 = local_620._0_16_;
                      }
                      else {
                        auVar234 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                      }
                      *(undefined4 *)(local_560[0] + (long)local_7c0 * 4) = 0;
                      local_620._0_16_ = auVar234;
                      auVar234 = vshufps_avx(auVar234,auVar234,0);
                      auVar155._16_16_ = auVar234;
                      auVar155._0_16_ = auVar234;
                      auVar26 = vcmpps_avx(auVar150,auVar155,2);
                      auVar25 = vandps_avx(auVar26,local_560[0]);
                      auVar158 = ZEXT3264(auVar25);
                      local_560[0] = local_560[0] & auVar26;
                      if ((((((((local_560[0] >> 0x1f & (undefined1  [32])0x1) ==
                                (undefined1  [32])0x0 &&
                               (local_560[0] >> 0x3f & (undefined1  [32])0x1) ==
                               (undefined1  [32])0x0) &&
                              (local_560[0] >> 0x5f & (undefined1  [32])0x1) ==
                              (undefined1  [32])0x0) && SUB321(local_560[0] >> 0x7f,0) == '\0') &&
                            (local_560[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                           && SUB321(local_560[0] >> 0xbf,0) == '\0') &&
                          (local_560[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                          && -1 < local_560[0][0x1f]) break;
                      auVar181._8_4_ = 0x7f800000;
                      auVar181._0_8_ = 0x7f8000007f800000;
                      auVar181._12_4_ = 0x7f800000;
                      auVar181._16_4_ = 0x7f800000;
                      auVar181._20_4_ = 0x7f800000;
                      auVar181._24_4_ = 0x7f800000;
                      auVar181._28_4_ = 0x7f800000;
                      auVar150 = vblendvps_avx(auVar181,auVar150,auVar25);
                      auVar26 = vshufps_avx(auVar150,auVar150,0xb1);
                      auVar26 = vminps_avx(auVar150,auVar26);
                      auVar27 = vshufpd_avx(auVar26,auVar26,5);
                      auVar26 = vminps_avx(auVar26,auVar27);
                      auVar27 = vperm2f128_avx(auVar26,auVar26,1);
                      auVar26 = vminps_avx(auVar26,auVar27);
                      auVar26 = vcmpps_avx(auVar150,auVar26,0);
                      auVar27 = auVar25 & auVar26;
                      auVar150 = auVar25;
                      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar27 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar27 >> 0x7f,0) != '\0') ||
                            (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar27 >> 0xbf,0) != '\0') ||
                          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar27[0x1f] < '\0') {
                        auVar150 = vandps_avx(auVar26,auVar25);
                      }
                      uVar133 = vmovmskps_avx(auVar150);
                      uVar8 = 0;
                      if (uVar133 != 0) {
                        for (; (uVar133 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                        }
                      }
                      uVar135 = (ulong)uVar8;
                      local_560[0] = auVar25;
                    }
                    auVar338 = ZEXT3264(local_720);
                    pre = local_7f0;
                    pPVar137 = local_7e8;
                    auVar138 = local_6c0;
                    pLVar139 = local_7f8;
                    fVar230 = (float)local_700._0_4_;
                    fVar241 = (float)local_700._4_4_;
                    fVar243 = fStack_6f8;
                    fVar245 = fStack_6f4;
                    fVar205 = fStack_6f0;
                    fVar295 = fStack_6ec;
                    fVar303 = fStack_6e8;
                  }
                }
              }
            }
          }
          auVar138 = (undefined1  [8])((long)auVar138 + 8);
          auVar302 = ZEXT3264(local_5c0);
        } while (SUB84(auVar138,0) < (int)uVar19);
      }
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar151._4_4_ = uVar7;
      auVar151._0_4_ = uVar7;
      auVar151._8_4_ = uVar7;
      auVar151._12_4_ = uVar7;
      auVar151._16_4_ = uVar7;
      auVar151._20_4_ = uVar7;
      auVar151._24_4_ = uVar7;
      auVar151._28_4_ = uVar7;
      auVar150 = vcmpps_avx(local_80,auVar151,2);
      uVar134 = vmovmskps_avx(auVar150);
      uVar134 = (uint)uVar140 & uVar134;
    } while (uVar134 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }